

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O3

void __thiscall
Tagliatelle<TTA>::PerformLabelingMem
          (Tagliatelle<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Mat1b *pMVar5;
  pointer puVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  pointer puVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong *puVar24;
  char cVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong *puVar30;
  ulong *puVar31;
  uint v;
  long lVar32;
  ulong *puVar33;
  char cVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long *plVar39;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  int iVar43;
  long lVar44;
  undefined4 *puVar45;
  ulong uVar46;
  long lVar47;
  long *plVar48;
  long lVar49;
  ulong *puVar50;
  ulong *puVar51;
  long lVar52;
  double dVar53;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  ulong *local_308;
  undefined1 local_2f8 [80];
  ulong *local_2a8;
  Mat local_290 [16];
  ulong *local_280;
  ulong *local_248;
  long *local_230;
  ulong *local_228;
  ulong *local_220;
  ulong *local_218;
  ulong *local_210;
  undefined1 local_208 [104];
  Mat local_1a0 [16];
  long local_190;
  ulong *local_158;
  ulong *local_140;
  ulong *local_138;
  pointer local_130;
  ulong *local_128;
  long local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  uVar26 = (ulong)iVar3;
  iVar4 = *(int *)&pMVar5->field_0xc;
  lVar44 = (long)iVar4;
  local_118 = accesses;
  TTA::MemAlloc(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) * ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1)
                + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_208,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2f8,&local_110,0);
  uVar42 = lVar44 - 2;
  iVar29 = (int)uVar42;
  if (iVar3 != 1) {
    if (iVar4 < 3) {
      uVar10 = 0;
      lVar47 = 1;
    }
    else {
      lVar47 = local_190;
      plVar39 = (long *)0xfffffffe;
      puVar40 = local_158;
      lVar15 = local_208._24_8_;
      plVar48 = (long *)0x0;
      do {
        lVar27 = (long)(int)plVar48;
        piVar1 = (int *)(lVar47 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = (long)(int)plVar39;
        if (*(char *)(lVar15 + lVar27) != '\0') {
          piVar1 = (int *)(lVar47 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar15 + 3 + lVar38);
LAB_0030257e:
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar27 * 4) = uVar10;
          puVar40 = (ulong *)local_2f8._24_8_;
          puVar50 = local_280;
          if (cVar25 == '\0') goto LAB_00302796;
LAB_003025ea:
          iVar11 = (int)plVar48 + 2;
          if (iVar11 < iVar29) {
            lVar15 = (long)(int)plVar48;
            local_130 = (pointer)(lVar15 + 2);
            lVar38 = lVar15 << 0x20;
            lVar47 = lVar15 * 4;
            lVar41 = 8;
            lVar27 = 0;
            local_230 = plVar48;
            do {
              lVar36 = local_190 + lVar47;
              piVar1 = (int *)(lVar36 + 8 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)local_130 + lVar27 + local_208._24_8_) == '\0') {
                uVar19 = *local_158;
                piVar1 = (int *)(uVar19 + 8 + lVar36 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar28 = *(long *)local_208._80_8_;
                cVar25 = *(char *)((long)local_130 + lVar27 + lVar28 + local_208._24_8_);
                piVar1 = (int *)(lVar36 + 0xc + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                cVar34 = *(char *)((long)local_130 + lVar27 + 1 + local_208._24_8_);
                if (cVar25 == '\0') {
                  if ((cVar34 == '\0') &&
                     (piVar1 = (int *)(uVar19 + local_190 + lVar47 + 0xc + lVar27 * 4),
                     *piVar1 = *piVar1 + 1,
                     *(char *)((long)local_130 + lVar27 + 1 + lVar28 + local_208._24_8_) == '\0')) {
                    piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar15 * 4 + 8);
                    *piVar1 = *piVar1 + 1;
                    plVar48 = (long *)(ulong)(uint)((int)local_130 + (int)lVar27);
                    puVar45 = (undefined4 *)((long)puVar40 + lVar41 + lVar15 * 4);
                    lVar47 = local_190;
                    puVar40 = local_158;
                    lVar15 = local_208._24_8_;
                    goto LAB_00302b1c;
                  }
                  uVar10 = TTA::MemNewLabel();
                  piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar40 = (ulong *)local_2f8._24_8_;
                  puVar50 = local_280;
                }
                else {
                  if (cVar34 == '\0') goto LAB_00302768;
                  piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar47);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = *(uint *)((long)puVar40 + lVar27 * 4 + lVar47);
                  piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                }
              }
              else {
                piVar1 = (int *)(lVar36 + 0xc + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_130 + lVar27 + 1 + local_208._24_8_) == '\0')
                goto LAB_00302768;
                piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar47);
                *piVar1 = *piVar1 + 1;
                uVar10 = *(uint *)((long)puVar40 + lVar27 * 4 + lVar47);
                piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar47 + 8);
                *piVar1 = *piVar1 + 1;
              }
              *(uint *)((long)puVar40 + lVar27 * 4 + lVar47 + 8) = uVar10;
              lVar38 = lVar38 + 0x200000000;
              lVar41 = lVar41 + 8;
              lVar36 = lVar27 + 2;
              lVar27 = lVar27 + 2;
              if ((long)(uVar42 & 0xffffffff) <= (long)local_130 + lVar36) {
                iVar11 = (int)local_230 + (int)lVar27 + 2;
                plVar48 = (long *)(ulong)(uint)((int)local_230 + (int)lVar27);
                break;
              }
            } while( true );
          }
          lVar15 = (long)iVar11;
          piVar1 = (int *)(local_190 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          iVar20 = (int)plVar48;
          if (iVar29 < iVar11) {
            if ((*(char *)(local_208._24_8_ + lVar15) != '\0') ||
               (piVar1 = (int *)(local_190 + *local_158 + lVar15 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar15 + local_208._24_8_ + *(long *)local_208._80_8_) != '\0')) {
              piVar1 = (int *)((long)puVar50 + (long)iVar20 * 4);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar40 + (long)iVar20 * 4);
              goto LAB_00302d9b;
            }
            piVar1 = (int *)((long)puVar50 + lVar15 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_0031b312;
          }
          if (*(char *)(local_208._24_8_ + lVar15) != '\0') {
            lVar47 = (long)iVar20;
            piVar1 = (int *)(local_190 + 0xc + lVar47 * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)puVar50 + lVar47 * 4);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar40 + lVar47 * 4);
LAB_00302d9b:
            piVar1 = (int *)((long)puVar50 + lVar15 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_00302ef7;
          }
          uVar19 = *local_158;
          piVar1 = (int *)(uVar19 + local_190 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          lVar47 = *(long *)local_208._80_8_;
          cVar25 = *(char *)(lVar15 + lVar47 + local_208._24_8_);
          lVar38 = (long)iVar20;
          piVar1 = (int *)(local_190 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (cVar25 == '\0') {
            if ((*(char *)(local_208._24_8_ + 3 + lVar38) != '\0') ||
               (piVar1 = (int *)(uVar19 + local_190 + 0xc + lVar38 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar47 + local_208._24_8_ + 3 + lVar38) != '\0')) goto LAB_00302f92;
            piVar1 = (int *)((long)puVar50 + lVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar40 + lVar15 * 4) = 0;
          }
          else {
            piVar1 = (int *)((long)puVar50 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar40 + lVar38 * 4);
            piVar1 = (int *)((long)puVar50 + lVar15 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar40 + lVar15 * 4) = uVar12;
          }
          goto LAB_00302faa;
        }
        uVar19 = *puVar40;
        piVar1 = (int *)(uVar19 + lVar47 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_208._80_8_;
        cVar34 = *(char *)(lVar27 + lVar41 + lVar15);
        piVar1 = (int *)(lVar47 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar15 + 3 + lVar38);
        if (cVar34 != '\0') goto LAB_0030257e;
        if ((cVar25 != '\0') ||
           (piVar1 = (int *)(uVar19 + lVar47 + 0xc + lVar38 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar41 + lVar15 + 3 + lVar38) != '\0')) {
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar27 * 4) = uVar10;
          puVar40 = (ulong *)local_2f8._24_8_;
          puVar50 = local_280;
          goto LAB_003025ea;
        }
        piVar1 = (int *)((long)local_280 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        puVar45 = (undefined4 *)(lVar27 * 4 + local_2f8._24_8_);
LAB_00302b1c:
        *puVar45 = 0;
        iVar11 = (int)plVar48;
        uVar10 = iVar11 + 2;
        plVar39 = plVar48;
        plVar48 = (long *)(ulong)uVar10;
      } while ((int)uVar10 < iVar29);
      lVar47 = (long)(iVar11 + 3);
    }
    lVar15 = (long)(int)uVar10;
    piVar1 = (int *)(local_190 + lVar15 * 4);
    *piVar1 = *piVar1 + 1;
    if (iVar29 < (int)uVar10) {
      if ((*(char *)(local_208._24_8_ + lVar15) != '\0') ||
         (piVar1 = (int *)(local_190 + *local_158 + lVar15 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar15 + local_208._24_8_ + *(long *)local_208._80_8_) != '\0'))
      goto LAB_00302f92;
LAB_00302bca:
      piVar1 = (int *)((long)local_280 + lVar15 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4) = 0;
    }
    else {
      if (*(char *)(local_208._24_8_ + lVar15) == '\0') {
        uVar19 = *local_158;
        piVar1 = (int *)(uVar19 + local_190 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        cVar25 = *(char *)(lVar15 + lVar38 + local_208._24_8_);
        piVar1 = (int *)(local_190 + lVar47 * 4);
        *piVar1 = *piVar1 + 1;
        if (((cVar25 == '\0') && (*(char *)(local_208._24_8_ + lVar47) == '\0')) &&
           (piVar1 = (int *)(uVar19 + local_190 + lVar47 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar38 + local_208._24_8_ + lVar47) == '\0')) goto LAB_00302bca;
      }
      else {
        piVar1 = (int *)(local_190 + lVar47 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_00302f92:
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + lVar15 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar15 * 4) = uVar10;
    }
LAB_00302faa:
    if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
      uVar19 = 2;
      plVar39 = (long *)0x3;
      lVar47 = 1;
      puVar18 = (pointer)0x0;
      do {
        uVar17 = *local_158;
        lVar38 = uVar17 * uVar19;
        *(int *)(local_190 + lVar38) = *(int *)(local_190 + lVar38) + 1;
        lVar15 = *(long *)local_208._80_8_;
        lVar27 = lVar15 * uVar19;
        cVar25 = *(char *)(local_208._24_8_ + lVar27);
        local_130 = puVar18;
        if (2 < iVar4) {
          local_230 = plVar39;
          if (cVar25 == '\0') {
            lVar36 = uVar17 * (uVar19 | 1);
            piVar1 = (int *)(local_190 + lVar36);
            *piVar1 = *piVar1 + 1;
            lVar41 = (uVar19 | 1) * lVar15;
            cVar25 = *(char *)(local_208._24_8_ + lVar41);
            piVar1 = (int *)(local_190 + 4 + lVar38);
            *piVar1 = *piVar1 + 1;
            cVar34 = *(char *)(local_208._24_8_ + 1 + lVar27);
            if (cVar25 == '\0') {
              if (cVar34 == '\0') {
                piVar1 = (int *)(local_190 + 4 + lVar36);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_208._24_8_ + 1 + lVar41) == '\0') {
                  puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
                  *(int *)puVar40 = (int)*puVar40 + 1;
                  puVar40 = (ulong *)(*local_2a8 * uVar19 + local_2f8._24_8_);
                  local_308 = (ulong *)0x0;
                  goto LAB_003080de;
                }
                uVar10 = TTA::MemNewLabel();
                puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
                *(int *)puVar40 = (int)*puVar40 + 1;
                *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
                local_308 = (ulong *)0x0;
                goto LAB_00308812;
              }
            }
            else if (cVar34 == '\0') {
              uVar10 = TTA::MemNewLabel();
              puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
              local_308 = (ulong *)0x0;
              goto LAB_0030b131;
            }
            lVar27 = uVar17 * (uVar19 - 1);
            piVar1 = (int *)(local_190 + 4 + lVar27);
            *piVar1 = *piVar1 + 1;
            lVar38 = (uVar19 - 1) * lVar15;
            if (*(char *)(local_208._24_8_ + 1 + lVar38) != '\0') {
              uVar17 = *local_248;
              puVar40 = (ulong *)((long)local_280 + uVar17 * (uVar19 - 2));
              *(int *)puVar40 = (int)*puVar40 + 1;
              uVar46 = *local_2a8;
              uVar21 = *(ulong *)(local_2f8._24_8_ + (uVar19 - 2) * uVar46);
              puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(int *)(local_2f8._24_8_ + uVar46 * uVar19) = (int)uVar21;
              local_308 = (ulong *)0x0;
              goto LAB_0030a8be;
            }
            piVar1 = (int *)(local_190 + 8 + lVar27);
            *piVar1 = *piVar1 + 1;
            cVar34 = *(char *)(local_208._24_8_ + 2 + lVar38);
            *(int *)(local_190 + lVar27) = *(int *)(local_190 + lVar27) + 1;
            cVar25 = *(char *)(local_208._24_8_ + lVar38);
          }
          else {
            lVar36 = uVar17 * (uVar19 - 1);
            piVar1 = (int *)(local_190 + 4 + lVar36);
            *piVar1 = *piVar1 + 1;
            lVar41 = (uVar19 - 1) * lVar15;
            if (*(char *)(local_208._24_8_ + 1 + lVar41) != '\0') {
              uVar17 = *local_248;
              puVar40 = (ulong *)((long)local_280 + uVar17 * (uVar19 - 2));
              *(int *)puVar40 = (int)*puVar40 + 1;
              uVar46 = *local_2a8;
              uVar21 = *(ulong *)(local_2f8._24_8_ + (uVar19 - 2) * uVar46);
              puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(int *)(local_2f8._24_8_ + uVar46 * uVar19) = (int)uVar21;
              local_308 = (ulong *)0x0;
              goto LAB_00303119;
            }
            piVar1 = (int *)(local_190 + 4 + lVar38);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_208._24_8_ + 1 + lVar27) == '\0') {
              *(int *)(local_190 + lVar36) = *(int *)(local_190 + lVar36) + 1;
              if (*(char *)(local_208._24_8_ + lVar41) == '\0') {
                uVar10 = TTA::MemNewLabel();
                puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
                *(int *)puVar40 = (int)*puVar40 + 1;
                *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
                local_308 = (ulong *)0x0;
                goto LAB_00311b9e;
              }
              uVar17 = *local_248;
              puVar40 = (ulong *)((long)local_280 + uVar17 * (uVar19 - 2));
              *(int *)puVar40 = (int)*puVar40 + 1;
              uVar46 = *local_2a8;
              uVar21 = *(ulong *)(local_2f8._24_8_ + (uVar19 - 2) * uVar46);
              puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(int *)(local_2f8._24_8_ + uVar46 * uVar19) = (int)uVar21;
              local_308 = (ulong *)0x0;
              goto LAB_003126fa;
            }
            piVar1 = (int *)(local_190 + 8 + lVar36);
            *piVar1 = *piVar1 + 1;
            cVar34 = *(char *)(local_208._24_8_ + 2 + lVar41);
            *(int *)(local_190 + lVar36) = *(int *)(local_190 + lVar36) + 1;
            cVar25 = *(char *)(local_208._24_8_ + lVar41);
          }
          if (cVar34 == '\0') {
            if (cVar25 == '\0') {
              uVar10 = TTA::MemNewLabel();
              puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
              local_308 = (ulong *)0x0;
              goto LAB_00303dda;
            }
            uVar17 = *local_248;
            puVar40 = (ulong *)((long)local_280 + uVar17 * (uVar19 - 2));
            *(int *)puVar40 = (int)*puVar40 + 1;
            uVar46 = *local_2a8;
            uVar21 = *(ulong *)(local_2f8._24_8_ + (uVar19 - 2) * uVar46);
            puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
            *(int *)puVar40 = (int)*puVar40 + 1;
            *(int *)(local_2f8._24_8_ + uVar46 * uVar19) = (int)uVar21;
            local_308 = (ulong *)0x0;
            goto LAB_003039a7;
          }
          lVar38 = uVar19 - 2;
          if (cVar25 == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + uVar17 * lVar38 + 8);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * uVar46 + 8);
            puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
            *(int *)puVar40 = (int)*puVar40 + 1;
            *(undefined4 *)(local_2f8._24_8_ + uVar46 * uVar19) = uVar12;
          }
          else {
            piVar1 = (int *)(local_190 + 4 + uVar17 * lVar38);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(local_208._24_8_ + 1 + lVar15 * lVar38);
            uVar17 = *local_248;
            lVar15 = uVar17 * lVar38;
            puVar40 = (ulong *)((long)local_280 + lVar15);
            *(int *)puVar40 = (int)*puVar40 + 1;
            uVar46 = *local_2a8;
            lVar38 = lVar38 * uVar46;
            uVar10 = (uint)*(ulong *)(local_2f8._24_8_ + lVar38);
            if (cVar25 == '\0') {
              piVar1 = (int *)((long)local_280 + lVar15 + 8);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 + 8));
              puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
            }
            else {
              puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(uint *)(local_2f8._24_8_ + uVar46 * uVar19) = uVar10;
            }
          }
          local_308 = (ulong *)0x0;
LAB_00305084:
          iVar11 = (int)local_308;
          uVar10 = iVar11 + 2;
          if ((int)uVar10 < iVar29) {
            lVar27 = (long)iVar11;
            lVar28 = lVar27 << 0x20;
            lVar38 = lVar27 * 4;
            lVar41 = 8;
            lVar36 = 0;
LAB_003050b7:
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 + 8 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            lVar37 = local_208._24_8_ + lVar27;
            iVar43 = (int)lVar36;
            lVar32 = lVar28 >> 0x1e;
            iVar20 = (int)(lVar27 + 2);
            plVar39 = local_230;
            if (*(char *)(lVar36 + 2 + uVar19 * lVar15 + lVar37) == '\0') {
              piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar38 + 8 + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar36 + 2 + lVar37 + lVar15 * (long)local_230);
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 + 0xc + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              lVar37 = local_208._24_8_ + lVar27;
              cVar34 = *(char *)(lVar36 + 3 + uVar19 * lVar15 + lVar37);
              if (cVar25 != '\0') {
                if (cVar34 == '\0') {
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
                  piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                  *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8)
                       = uVar12;
                  goto LAB_0030b131;
                }
                piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0xc + lVar36 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar36 + 3 + lVar37 + lVar15 * lVar47) != '\0') goto LAB_00305b0e;
                piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0x10 + lVar36 * 4);
                *piVar1 = *piVar1 + 1;
                lVar15 = *(long *)local_208._80_8_;
                if (*(char *)(lVar36 + 4 + lVar47 * lVar15 + local_208._24_8_ + lVar27) != '\0') {
                  piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + lVar38 + 0xc +
                                  lVar36 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar36 + 3 +
                                    local_208._24_8_ + lVar27 + lVar15 * (long)local_130);
                  goto LAB_00305346;
                }
LAB_00305751:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8) =
                     uVar12;
                plVar48 = local_230;
LAB_0030d1a8:
                plVar39 = local_230;
                iVar11 = (int)local_308;
                uVar10 = iVar11 + 2;
                if ((int)uVar10 < iVar29) {
                  uVar17 = *local_158;
                  lVar15 = *(long *)local_208._80_8_;
                  local_218 = (ulong *)(uVar19 - 1);
                  local_140 = local_280;
                  local_138 = (ulong *)(uVar19 | 1);
                  puVar40 = (ulong *)(long)iVar11;
                  lVar38 = (long)puVar40 + 2;
                  local_220 = (ulong *)(uVar17 * (long)plVar48 + (long)puVar40 * 4 + local_190 + 8);
                  local_228 = (ulong *)((long)puVar40 +
                                       local_208._24_8_ + lVar15 * (long)plVar48 + 2);
                  lVar41 = local_208._24_8_ + lVar15 * uVar19;
                  lVar36 = lVar41 + 3;
                  lVar28 = local_208._24_8_ + lVar15 * lVar47;
                  lVar15 = local_190 + uVar17 * uVar19 + (long)puVar40 * 4;
                  lVar52 = lVar15 + 0xc;
                  lVar27 = local_190 + (long)puVar40 * 4 + uVar17 * lVar47;
                  lVar37 = (long)puVar40 << 0x20;
                  lVar32 = 8;
                  lVar49 = 0;
                  do {
                    piVar1 = (int *)(lVar15 + 8 + lVar49 * 4);
                    *piVar1 = *piVar1 + 1;
                    iVar20 = (int)lVar38;
                    lVar35 = lVar37 >> 0x1e;
                    lVar14 = lVar37 >> 0x20;
                    local_210 = puVar40;
                    if (*(char *)((long)puVar40 + lVar49 + lVar41 + 2) == '\0') {
                      piVar1 = (int *)((long)local_220 + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)local_228 + lVar49) == '\0') {
                        local_308 = (ulong *)(lVar38 + lVar49);
                        lVar27 = lVar37 + 0x300000000 >> 0x20;
                        piVar1 = (int *)((lVar37 + 0x300000000 >> 0x1e) +
                                        *local_158 * uVar19 + local_190);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        uVar17 = *local_158;
                        if (*(char *)(lVar27 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
                          piVar1 = (int *)(uVar17 * (long)local_138 + local_190 + lVar27 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar27 + (long)local_138 * lVar15 + local_208._24_8_) ==
                              '\0') {
                            piVar1 = (int *)((long)local_280 +
                                            lVar49 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8
                                            );
                            *piVar1 = *piVar1 + 1;
                            puVar40 = (ulong *)(local_2f8._24_8_ +
                                               lVar32 + (long)puVar40 * 4 + *local_2a8 * uVar19);
                            local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
                            goto LAB_003080de;
                          }
                          uVar10 = TTA::MemNewLabel();
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 + (long)local_210 * 4 + *local_248 * uVar19 + 8
                                          );
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(local_2f8._24_8_ +
                                   lVar49 * 4 + (long)local_210 * 4 + *local_2a8 * uVar19 + 8) =
                               uVar10;
                          local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
                          goto LAB_00308812;
                        }
                        piVar1 = (int *)(local_190 + uVar17 * (long)local_218 + lVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar27 + local_208._24_8_ + lVar15 * (long)local_218) != '\0')
                        {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar12 = *(undefined4 *)
                                    (local_2f8._24_8_ +
                                    lVar49 * 4 + (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8)
                               = uVar12;
LAB_00311220:
                          local_308 = (ulong *)(lVar38 + lVar49);
                          goto LAB_0030a8be;
                        }
                        piVar1 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                                        *local_158 * (long)local_218 + local_190);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = lVar37 + 0x400000000 >> 0x20;
                        if (*(char *)(lVar15 + (long)local_218 * *(long *)local_208._80_8_ +
                                               local_208._24_8_) == '\0') {
                          uVar10 = TTA::MemNewLabel();
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 + (long)local_210 * 4 + *local_248 * uVar19 + 8
                                          );
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(local_2f8._24_8_ +
                                   lVar49 * 4 + (long)local_210 * 4 + *local_2a8 * uVar19 + 8) =
                               uVar10;
                          goto LAB_00303dda;
                        }
                        uVar17 = *local_248;
                        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar12 = *(undefined4 *)
                                  (local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)
                         (local_2f8._24_8_ + lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) =
                             uVar12;
                        goto LAB_00305084;
                      }
                      piVar1 = (int *)(lVar52 + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)puVar40 + lVar49 + lVar36) == '\0') {
                        uVar17 = *local_248;
                        piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar35 + uVar46 * uVar19);
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)
                         (local_2f8._24_8_ + lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) =
                             uVar12;
                        local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar49);
                        goto LAB_0030b131;
                      }
                      piVar1 = (int *)(lVar27 + 0xc + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)puVar40 + lVar49 + lVar28 + 3) != '\0') {
                        piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                         (long)puVar40 * 4 + 8 + lVar49 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)(lVar38 + lVar49 + lVar15 * (long)local_130 + local_208._24_8_)
                            == '\0') {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                                 lVar35 + uVar46 * uVar19));
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(local_2f8._24_8_ +
                                   lVar49 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
                               uVar10;
                          local_308 = (ulong *)(lVar38 + lVar49 & 0xffffffff);
                          plVar39 = local_230;
                          goto LAB_0030a8be;
                        }
                        piVar1 = (int *)(lVar35 + (long)local_218 * *local_158 + local_190);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar14 + local_208._24_8_ + lVar15 * (long)local_218) == '\0')
                        {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + uVar46 * uVar19);
                        }
                        else {
                          lVar15 = uVar19 - 2;
                          piVar1 = (int *)((lVar37 + 0x100000000 >> 0x1e) +
                                          *local_158 * lVar15 + local_190);
                          *piVar1 = *piVar1 + 1;
                          cVar25 = *(char *)((lVar37 + 0x100000000 >> 0x20) +
                                            *(long *)local_208._80_8_ * lVar15 + local_208._24_8_);
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * lVar15);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + lVar15 * uVar46);
                          if (cVar25 != '\0') {
                            piVar1 = (int *)((long)local_280 +
                                            lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                            *piVar1 = *piVar1 + 1;
                            *(uint *)(local_2f8._24_8_ +
                                     lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                            goto LAB_00311220;
                          }
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                        }
                        uVar10 = TTA::MemMerge(uVar10,uVar13);
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 + (long)local_210 * 4 + *local_248 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(local_2f8._24_8_ +
                                 lVar49 * 4 + (long)local_210 * 4 + *local_2a8 * uVar19 + 8) =
                             uVar10;
                        goto LAB_00311220;
                      }
                    }
                    else {
                      piVar1 = (int *)(lVar27 + 0xc + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)puVar40 + lVar49 + lVar28 + 3) != '\0') {
                        local_308 = (ulong *)(lVar38 + lVar49);
                        piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                         (long)puVar40 * 4 + 8 + lVar49 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)((long)local_308 + lVar15 * (long)local_130 + local_208._24_8_)
                            == '\0') {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                                 lVar35 + uVar46 * uVar19));
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(local_2f8._24_8_ +
                                   lVar49 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
                               uVar10;
                          local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
                          plVar39 = local_230;
                          goto LAB_00303119;
                        }
                        piVar1 = (int *)(lVar35 + (long)local_218 * *local_158 + local_190);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar14 + local_208._24_8_ + lVar15 * (long)local_218) == '\0')
                        {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + uVar46 * uVar19);
                        }
                        else {
                          lVar15 = uVar19 - 2;
                          piVar1 = (int *)((lVar37 + 0x100000000 >> 0x1e) +
                                          *local_158 * lVar15 + local_190);
                          *piVar1 = *piVar1 + 1;
                          cVar25 = *(char *)((lVar37 + 0x100000000 >> 0x20) +
                                            *(long *)local_208._80_8_ * lVar15 + local_208._24_8_);
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * lVar15);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + lVar15 * uVar46);
                          if (cVar25 != '\0') {
                            piVar1 = (int *)((long)local_280 +
                                            lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                            *piVar1 = *piVar1 + 1;
                            *(uint *)(local_2f8._24_8_ +
                                     lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                            goto LAB_00303119;
                          }
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                        }
                        uVar10 = TTA::MemMerge(uVar10,uVar13);
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 + (long)local_210 * 4 + *local_248 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(local_2f8._24_8_ +
                                 lVar49 * 4 + (long)local_210 * 4 + *local_2a8 * uVar19 + 8) =
                             uVar10;
                        goto LAB_00303119;
                      }
                      piVar1 = (int *)(lVar52 + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)puVar40 + lVar49 + lVar36) == '\0') goto LAB_0030d9e9;
                    }
                    piVar1 = (int *)(lVar27 + 0x10 + lVar49 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)puVar40 + lVar49 + lVar28 + 4) != '\0') {
                      piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + (long)puVar40 * 4
                                       + 0xc + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      local_308 = (ulong *)(lVar38 + lVar49);
                      lVar15 = *(long *)local_208._80_8_;
                      if (*(char *)((long)local_308 + 1U +
                                   local_208._24_8_ + lVar15 * (long)local_130) == '\0') {
                        uVar17 = *local_248;
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 +
                                        (long)puVar40 * 4 + uVar17 * (long)local_130 + 0x10);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar46 * (long)local_130 + 0x10);
                        piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
                        *piVar1 = *piVar1 + 1;
                        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                               lVar35 + uVar46 * uVar19));
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(local_2f8._24_8_ +
                                 lVar49 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
                        plVar39 = local_230;
                        goto LAB_00305084;
                      }
                      piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + (long)puVar40 * 4
                                       + 8 + lVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar49 + local_208._24_8_ + lVar38 + lVar15 * (long)local_130)
                          == '\0') {
                        uVar17 = *local_248;
                        piVar1 = (int *)((long)local_280 +
                                        lVar49 * 4 +
                                        (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                        piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
                        *piVar1 = *piVar1 + 1;
                        uVar13 = *(uint *)(local_2f8._24_8_ + lVar35 + uVar46 * uVar19);
                      }
                      else {
                        piVar1 = (int *)(lVar35 + *local_158 * (long)local_218 + local_190);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)(lVar14 + (long)local_218 * lVar15 + local_208._24_8_) == '\0')
                        {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + uVar46 * uVar19);
                        }
                        else {
                          lVar38 = uVar19 - 2;
                          piVar1 = (int *)((lVar37 + 0x100000000 >> 0x1e) +
                                          *local_158 * lVar38 + local_190);
                          *piVar1 = *piVar1 + 1;
                          cVar25 = *(char *)((lVar37 + 0x100000000 >> 0x20) +
                                            local_208._24_8_ + lVar15 * lVar38);
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar14 * 4 + uVar17 * lVar38);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ + lVar14 * 4 + lVar38 * uVar46);
                          if (cVar25 != '\0') {
                            piVar1 = (int *)((long)local_280 +
                                            lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                            *piVar1 = *piVar1 + 1;
                            *(uint *)(local_2f8._24_8_ +
                                     lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                            goto LAB_00305084;
                          }
                          piVar1 = (int *)((long)local_280 +
                                          lVar49 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar13 = *(uint *)(local_2f8._24_8_ +
                                            lVar49 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                        }
                      }
                      uVar10 = TTA::MemMerge(uVar10,uVar13);
                      piVar1 = (int *)((long)local_280 +
                                      lVar49 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(local_2f8._24_8_ +
                               lVar49 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
                      goto LAB_00305084;
                    }
                    lVar35 = *local_248 * uVar19 + (long)puVar40 * 4 + 8;
                    piVar1 = (int *)((long)local_280 + lVar49 * 4 + lVar35 + -8);
                    *piVar1 = *piVar1 + 1;
                    lVar14 = *local_2a8 * uVar19 + (long)puVar40 * 4 + 8;
                    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar49 * 4 + lVar14 + -8);
                    piVar1 = (int *)((long)local_280 + lVar49 * 4 + lVar35);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(local_2f8._24_8_ + lVar49 * 4 + lVar14) = uVar12;
                    lVar37 = lVar37 + 0x200000000;
                    lVar14 = lVar38 + lVar49;
                    lVar49 = lVar49 + 2;
                    lVar32 = lVar32 + 8;
                    if ((long)uVar42 <= lVar14 + 2) {
                      iVar11 = iVar11 + (int)lVar49;
                      uVar10 = iVar20 + (int)lVar49;
                      plVar48 = local_230;
                      break;
                    }
                  } while( true );
                }
                if (iVar29 < (int)uVar10) {
                  local_308 = (ulong *)(ulong)uVar10;
                  goto LAB_0030ad80;
                }
                lVar38 = (long)(int)uVar10;
                piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                lVar15 = *(long *)local_208._80_8_;
                plVar39 = plVar48;
                if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
                  piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
                  lVar41 = (long)iVar11;
                  piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar15 = *(long *)local_208._80_8_;
                  cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
                  if (cVar25 == '\0') {
LAB_0030d64b:
                    if (cVar34 == '\0') {
LAB_0030d683:
                      piVar1 = (int *)((uVar19 | 1) * *local_158 + local_190 + 0xc + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * (uVar19 | 1));
                      plVar39 = plVar48;
                      goto joined_r0x00308443;
                    }
                    piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * (uVar19 - 1));
                    plVar39 = plVar48;
joined_r0x003130eb:
                    if (cVar25 != '\0') goto LAB_00313b57;
                    goto LAB_00313794;
                  }
                  if (cVar34 == '\0') goto LAB_00312c9d;
                  lVar27 = uVar19 - 1;
                  piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar27) == '\0')
                  goto LAB_00312c9d;
                  piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar15 = *(long *)local_208._80_8_;
                  if (*(char *)(lVar38 + lVar15 * (uVar19 - 2) + local_208._24_8_) != '\0') {
                    piVar1 = (int *)(lVar27 * *local_158 + local_190 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar25 = *(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar27);
                    goto joined_r0x0030d640;
                  }
                }
                else {
                  lVar27 = uVar19 - 1;
                  lVar41 = (long)iVar11;
                  piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar27) == '\0')
                  goto LAB_00312c9d;
                  piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar15 = *(long *)local_208._80_8_;
                  if (*(char *)(lVar38 + lVar15 * (uVar19 - 2) + local_208._24_8_) != '\0') {
                    piVar1 = (int *)(lVar27 * *local_158 + local_190 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar25 = *(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar27);
joined_r0x0030d640:
                    lVar41 = (long)iVar11;
                    if (cVar25 != '\0') {
                      lVar41 = (long)iVar11;
                      piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 4 + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar25 = *(char *)(lVar41 + 1 +
                                        *(long *)local_208._80_8_ * (uVar19 - 2) + local_208._24_8_)
                      ;
LAB_00313ac4:
                      uVar17 = *local_248;
                      lVar27 = uVar17 * (uVar19 - 2);
                      piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar27);
                      *piVar1 = *piVar1 + 1;
                      uVar46 = *local_2a8;
                      lVar15 = (uVar19 - 2) * uVar46;
                      uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar15);
                      if (cVar25 == '\0') {
                        piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
                        *piVar1 = *piVar1 + 1;
                        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                               lVar38 * 4 + lVar15));
                        uVar17 = *local_248;
                        goto LAB_003137a9;
                      }
                      piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar10;
                      plVar39 = plVar48;
                      goto LAB_00313bae;
                    }
                  }
                }
LAB_0031203c:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
                piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
LAB_00312080:
                uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + uVar46 * uVar19);
LAB_0031208b:
                uVar10 = TTA::MemMerge(uVar10,uVar13);
                goto LAB_00313799;
              }
              if (cVar34 == '\0') {
                local_308 = (ulong *)(lVar27 + 2 + lVar36);
                uVar17 = *local_158;
                piVar1 = (int *)(uVar17 * (long)local_230 + local_190 + lVar27 * 4 + 0xc +
                                lVar36 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar36 + 3 + lVar37 + (long)local_230 * lVar15) == '\0') {
                  piVar1 = (int *)((long)local_280 +
                                  lVar36 * 4 + lVar27 * 4 + *local_248 * uVar19 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar40 = (ulong *)(local_2f8._24_8_ + lVar41 + lVar27 * 4 + *local_2a8 * uVar19);
                  local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
                  goto LAB_003080de;
                }
                uVar10 = TTA::MemNewLabel();
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + *local_248 * uVar19 + 8
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + *local_2a8 * uVar19 + 8) =
                     uVar10;
                plVar39 = local_230;
                goto LAB_00308812;
              }
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0xc + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar36 + 3 + lVar37 + lVar15 * lVar47) != '\0') {
LAB_00305b0e:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar36 * 4 + lVar27 * 4 + uVar17 * (long)local_130 + 8);
                *piVar1 = *piVar1 + 1;
                local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * (long)local_130 + 8
                          );
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8) =
                     uVar12;
                goto LAB_0030a8be;
              }
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0x10 + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)(lVar36 + 4 + lVar47 * lVar15 + local_208._24_8_ + lVar27) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar36 * 4 + lVar27 * 4 + uVar17 * (long)local_130 + 8);
                *piVar1 = *piVar1 + 1;
                local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * (long)local_130 + 8
                          );
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8) =
                     uVar12;
                goto LAB_003039a7;
              }
              piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + lVar38 + 0xc + lVar36 * 4)
              ;
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar36 + 3 + local_208._24_8_ + lVar27 + lVar15 * (long)local_130);
              uVar46 = *local_248;
              lVar15 = (long)local_130 * uVar46 + lVar38;
              piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15 + 8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_2a8;
              lVar37 = lVar38 + (long)local_130 * uVar17;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar37 + 8);
              if (cVar25 == '\0') {
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15 + 0x10);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       lVar36 * 4 + lVar37 + 0x10));
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar38 + *local_248 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_2a8;
              }
              else {
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar46 * uVar19 + lVar38 + 8);
                *piVar1 = *piVar1 + 1;
              }
            }
            else {
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0xc + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar36 + 3 + lVar37 + lVar15 * lVar47) != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar36 * 4 + lVar27 * 4 + uVar17 * (long)local_130 + 8);
                *piVar1 = *piVar1 + 1;
                local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * (long)local_130 + 8
                          );
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8) =
                     uVar12;
                goto LAB_00303119;
              }
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 + 0xc + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)(lVar36 + 3 + uVar19 * lVar15 + local_208._24_8_ + lVar27) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                local_308 = (ulong *)(ulong)(uint)(iVar20 + iVar43);
                *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * 4 + uVar46 * uVar19 + 8) =
                     uVar12;
                goto LAB_0030da61;
              }
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar38 + 0x10 + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar36 + 4 + local_208._24_8_ + lVar27 + lVar15 * lVar47) == '\0')
              goto LAB_00305751;
              piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + lVar38 + 0xc + lVar36 * 4)
              ;
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar36 + 3 +
                                *(long *)local_208._80_8_ * (long)local_130 + local_208._24_8_ +
                                lVar27);
LAB_00305346:
              uVar46 = *local_248;
              if (cVar25 == '\0') {
                piVar1 = (int *)((long)local_280 +
                                lVar36 * 4 + (long)local_130 * uVar46 + lVar38 + 0x10);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar36 * 4 + (long)local_130 * uVar17 + lVar38 + 0x10);
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar46 * uVar19 + lVar38);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       lVar36 * 4 + uVar17 * uVar19 + lVar38));
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar38 + *local_248 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_2a8;
              }
              else {
                piVar1 = (int *)((long)local_280 +
                                lVar36 * 4 + (long)local_130 * uVar46 + lVar38 + 8);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar36 * 4 + lVar38 + (long)local_130 * uVar17 + 8);
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar46 * uVar19 + lVar38 + 8);
                *piVar1 = *piVar1 + 1;
              }
            }
            *(uint *)(local_2f8._24_8_ + lVar36 * 4 + uVar17 * uVar19 + lVar38 + 8) = uVar10;
            lVar28 = lVar28 + 0x200000000;
            lVar15 = lVar27 + lVar36;
            lVar36 = lVar36 + 2;
            lVar41 = lVar41 + 8;
            if ((long)uVar42 <= lVar15 + 4) {
              iVar11 = iVar11 + (int)lVar36;
              uVar10 = iVar20 + (int)lVar36;
              plVar39 = local_230;
              goto LAB_003055e7;
            }
            goto LAB_003050b7;
          }
LAB_003055e7:
          if (iVar29 < (int)uVar10) {
            local_308 = (ulong *)(ulong)uVar10;
            plVar48 = plVar39;
LAB_0030ad80:
            lVar38 = (long)(int)local_308;
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            plVar39 = plVar48;
            if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
              piVar1 = (int *)((uVar19 | 1) * *local_158 + local_190 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1)) == '\0') {
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = 0;
              }
              else {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19 + -8);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19 + -8);
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
              }
            }
            else {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19 + -8);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19 + -8);
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
            }
          }
          else {
            lVar38 = (long)(int)uVar10;
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
              piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
              lVar41 = (long)iVar11;
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
              if (cVar25 == '\0') {
                if (cVar34 != '\0') goto LAB_00313b57;
LAB_00313370:
                piVar1 = (int *)((uVar19 | 1) * *local_158 + local_190 + 0xc + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * (uVar19 | 1));
joined_r0x00308443:
                if (cVar25 == '\0') {
LAB_0031339a:
                  piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = 0;
                }
                else {
LAB_00313794:
                  uVar10 = TTA::MemNewLabel();
LAB_00313799:
                  uVar17 = *local_248;
                  plVar48 = plVar39;
LAB_003137a9:
                  piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
                  plVar39 = plVar48;
                }
              }
              else if ((cVar34 == '\0') ||
                      (piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + lVar41 * 4),
                      *piVar1 = *piVar1 + 1,
                      *(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * (uVar19 - 1)) == '\0')) {
LAB_00312c9d:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
              }
              else {
LAB_00313b57:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
              }
            }
            else {
              lVar27 = (long)iVar11;
              piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * (uVar19 - 1)) != '\0')
              goto LAB_00313b57;
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar46 * uVar19);
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
            }
          }
          goto LAB_00313bae;
        }
        if (iVar4 == 2) {
          if (cVar25 == '\0') {
            lVar36 = uVar17 * (uVar19 | 1);
            piVar1 = (int *)(local_190 + lVar36);
            *piVar1 = *piVar1 + 1;
            lVar41 = (uVar19 | 1) * lVar15;
            if (*(char *)(local_208._24_8_ + lVar41) == '\0') {
              piVar1 = (int *)(local_190 + 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_208._24_8_ + 1 + lVar27) == '\0') {
                piVar1 = (int *)(local_190 + 4 + lVar36);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(local_208._24_8_ + 1 + lVar41);
                goto joined_r0x0030381c;
              }
              lVar38 = uVar17 * (uVar19 - 1);
              piVar1 = (int *)(local_190 + 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              lVar15 = lVar15 * (uVar19 - 1);
              if (*(char *)(local_208._24_8_ + 1 + lVar15) == '\0') {
                piVar1 = (int *)(local_190 + lVar38);
                *piVar1 = *piVar1 + 1;
                goto LAB_003035d5;
              }
            }
            else {
              piVar1 = (int *)(local_190 + 4 + *local_158 * uVar19);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)(local_208._24_8_ + 1 + lVar15 * uVar19) == '\0') goto LAB_00303822;
              lVar38 = uVar19 - 1;
              piVar1 = (int *)(local_190 + 4 + *local_158 * lVar38);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_208._24_8_ + 1 + lVar15 * lVar38) == '\0') {
                piVar1 = (int *)(local_190 + *local_158 * lVar38);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(local_208._24_8_ + lVar38 * *(long *)local_208._80_8_);
                goto joined_r0x003037fe;
              }
            }
          }
          else {
            lVar38 = uVar19 - 1;
            piVar1 = (int *)(local_190 + 4 + *local_158 * lVar38);
            *piVar1 = *piVar1 + 1;
            if ((*(char *)(local_208._24_8_ + 1 + lVar15 * lVar38) == '\0') &&
               (piVar1 = (int *)(local_190 + *local_158 * lVar38), *piVar1 = *piVar1 + 1,
               *(char *)(local_208._24_8_ + lVar38 * *(long *)local_208._80_8_) == '\0'))
            goto LAB_00303822;
          }
LAB_003035df:
          uVar17 = *local_248;
          puVar40 = (ulong *)((long)local_280 + uVar17 * (uVar19 - 2));
          *(int *)puVar40 = (int)*puVar40 + 1;
          uVar46 = *local_2a8;
          uVar21 = *(ulong *)(local_2f8._24_8_ + (uVar19 - 2) * uVar46);
          puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
          *(int *)puVar40 = (int)*puVar40 + 1;
          *(int *)(local_2f8._24_8_ + uVar46 * uVar19) = (int)uVar21;
        }
        else {
          if (cVar25 == '\0') {
            piVar1 = (int *)(local_190 + *local_158 * (uVar19 | 1));
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(local_208._24_8_ + lVar15 * (uVar19 | 1));
joined_r0x0030381c:
            if (cVar25 == '\0') {
              puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
              *(int *)puVar40 = (int)*puVar40 + 1;
              *(undefined4 *)(local_2f8._24_8_ + *local_2a8 * uVar19) = 0;
              goto LAB_00313bae;
            }
          }
          else {
            piVar1 = (int *)(local_190 + *local_158 * (uVar19 - 1));
            *piVar1 = *piVar1 + 1;
            lVar15 = lVar15 * (uVar19 - 1);
LAB_003035d5:
            cVar25 = *(char *)(local_208._24_8_ + lVar15);
joined_r0x003037fe:
            if (cVar25 != '\0') goto LAB_003035df;
          }
LAB_00303822:
          uVar10 = TTA::MemNewLabel();
          puVar40 = (ulong *)((long)local_280 + *local_248 * uVar19);
          *(int *)puVar40 = (int)*puVar40 + 1;
          *(uint *)(local_2f8._24_8_ + *local_2a8 * uVar19) = uVar10;
        }
LAB_00313bae:
        uVar19 = uVar19 + 2;
        plVar39 = (long *)((long)plVar39 + 2);
        lVar47 = lVar47 + 2;
        puVar18 = (pointer)((long)local_130 + 2);
      } while ((long)uVar19 <
               (long)*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
    }
    if (this->o_rows == false) goto LAB_0031c09e;
    lVar47 = (long)(iVar3 + -1);
    if (iVar4 < 3) {
      uVar10 = 0;
      lVar15 = 1;
    }
    else {
      lVar15 = (long)(iVar3 + -2);
      plVar39 = (long *)(long)(iVar3 + -3);
      local_130 = (pointer)(uVar42 & 0xffffffff);
      puVar50 = (ulong *)0xfffffffe;
      puVar40 = (ulong *)0x0;
      local_230 = plVar39;
      do {
        uVar42 = *local_158;
        lVar27 = uVar42 * lVar47 + local_190;
        lVar41 = (long)(int)puVar50;
        puVar50 = (ulong *)(long)(int)puVar40;
        piVar1 = (int *)(lVar27 + (long)puVar50 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        lVar36 = lVar38 * lVar47 + local_208._24_8_;
        puVar24 = (ulong *)local_2f8._24_8_;
        local_308 = local_280;
        puVar31 = puVar40;
        puVar33 = (ulong *)local_2f8._24_8_;
        local_218 = puVar40;
        if (*(char *)((long)puVar50 + lVar36) == '\0') {
          piVar1 = (int *)(lVar27 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 3 + lVar41) == '\0') {
            local_220 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)local_220 * lVar47);
            *piVar1 = *piVar1 + 1;
            local_140 = (ulong *)*local_2a8;
            puVar22 = local_140;
            puVar30 = puVar40;
            puVar31 = puVar50;
            goto LAB_00315b88;
          }
          lVar27 = uVar42 * lVar15 + local_190;
          piVar1 = (int *)(lVar27 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = lVar38 * lVar15 + local_208._24_8_;
          if (*(char *)(lVar41 + 3 + lVar36) != '\0') {
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * (long)plVar39);
            *piVar1 = *piVar1 + 1;
            puVar51 = (ulong *)*local_2a8;
            local_228 = puVar51;
            local_210 = puVar51;
            goto LAB_00317e90;
          }
          piVar1 = (int *)(lVar27 + 0x10 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar36 + 4 + lVar41);
          piVar1 = (int *)(lVar27 + (long)puVar50 * 4);
          *piVar1 = *piVar1 + 1;
          if (cVar25 == '\0') {
            if (*(char *)(lVar36 + (long)puVar50) == '\0') {
              uVar10 = TTA::MemNewLabel();
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
LAB_00315b65:
              puVar22 = (ulong *)*local_2a8;
              puVar24 = (ulong *)local_2f8._24_8_;
              puVar31 = local_218;
              local_308 = local_280;
              local_228 = puVar22;
              puVar33 = (ulong *)local_2f8._24_8_;
              goto LAB_00316aeb;
            }
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * (long)plVar39);
            *piVar1 = *piVar1 + 1;
LAB_00315a0e:
            local_228 = (ulong *)*local_2a8;
            local_138 = (ulong *)local_2f8._24_8_;
            puVar51 = local_228;
            local_210 = local_228;
            goto LAB_00317801;
          }
          if (*(char *)(lVar36 + (long)puVar50) == '\0') {
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 0x10);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar22 * (long)plVar39 + 0x10)
            ;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            puVar51 = puVar22;
            local_228 = puVar22;
            goto LAB_0031713b;
          }
          piVar1 = (int *)(local_190 + uVar42 * (long)plVar39 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * (long)plVar39);
          puVar23 = (ulong *)*local_248;
          puVar40 = (ulong *)((long)puVar23 * (long)plVar39 + (long)local_280);
          piVar1 = (int *)((long)puVar40 + (long)puVar50 * 4);
          *piVar1 = *piVar1 + 1;
LAB_00315818:
          puVar22 = (ulong *)*local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar50 * 4 + (long)puVar22 * (long)plVar39);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)puVar40 + lVar41 * 4 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   lVar41 * 4 + (long)puVar22 * (long)plVar39 + 0x10
                                                   ));
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            puVar31 = local_218;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar51 = puVar22;
            local_308 = local_280;
            puVar33 = (ulong *)local_2f8._24_8_;
            plVar39 = local_230;
            local_228 = puVar22;
          }
          else {
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            puVar51 = puVar22;
            local_228 = puVar22;
          }
LAB_0031713b:
          *(uint *)((long)puVar24 + (long)puVar50 * 4 + (long)puVar51 * lVar47) = uVar10;
          iVar11 = (int)puVar31;
          uVar10 = iVar11 + 2;
          if ((int)uVar10 < iVar29) {
            lVar36 = (long)iVar11;
            local_140 = (ulong *)(lVar36 + 2);
            lVar41 = lVar36 << 0x20;
            lVar27 = lVar36 * 4;
            lVar28 = 0;
            local_218 = puVar31;
            do {
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 + 8 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              lVar37 = lVar38 * lVar47 + local_208._24_8_ + lVar36;
              uVar42 = *local_158;
              iVar20 = (int)lVar28;
              iVar11 = (int)local_140;
              local_220 = puVar23;
              local_210 = puVar22;
              if (*(char *)(lVar28 + 2 + lVar37) == '\0') {
                piVar1 = (int *)(uVar42 * lVar47 + local_190 + lVar27 + 0xc + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                plVar39 = local_230;
                if (*(char *)(lVar28 + 3 + lVar37) == '\0') {
                  puVar30 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
                  piVar1 = (int *)((long)local_308 +
                                  lVar28 * 4 + lVar36 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar31 = (ulong *)(lVar36 + lVar28 + 2);
                  puVar22 = local_228;
                  puVar24 = puVar33;
                  local_140 = local_228;
                  goto LAB_00315b88;
                }
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 0xc + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + lVar36;
                if (*(char *)(lVar28 + 3 + lVar38) != '\0') {
                  puVar40 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar36 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar51 = (ulong *)*local_2a8;
                  puVar50 = (ulong *)(lVar36 + lVar28 + 2);
                  puVar24 = (ulong *)local_2f8._24_8_;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  local_228 = puVar51;
                  local_210 = puVar51;
                  goto LAB_00317e90;
                }
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 0x10 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar28 + 4 + lVar38) == '\0') goto LAB_003177bf;
                piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 + 0xc +
                                lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(lVar28 + 3 +
                                  *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_ +
                                  lVar36);
                puVar23 = (ulong *)*local_248;
                lVar38 = lVar27 + (long)puVar23 * (long)local_230;
                piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar38 + 8);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                lVar37 = lVar27 + (long)puVar22 * (long)local_230;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 + 8);
                if (cVar25 == '\0') {
                  piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar38 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar28 * 4 + lVar37 + 0x10));
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  plVar39 = local_230;
                }
                else {
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                }
              }
              else {
                piVar1 = (int *)(local_190 + lVar27 + uVar42 * lVar15 + 0xc + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar28 + 3 + local_208._24_8_ + lVar36 + lVar38 * lVar15) != '\0') {
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar36 * 4 + (long)puVar23 * (long)plVar39 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar28 * 4 + lVar36 * 4 + (long)puVar22 * (long)plVar39 + 8);
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar36 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar50 = (ulong *)(lVar36 + lVar28 + 2);
                  puVar24 = (ulong *)local_2f8._24_8_;
                  puVar51 = puVar22;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  puVar31 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
                  local_228 = puVar22;
                  goto LAB_003194b1;
                }
                piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 + 0xc + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_;
                lVar37 = lVar41 >> 0x1e;
                if (*(char *)(lVar28 + 3 + lVar38 * lVar47 + local_208._24_8_ + lVar36) == '\0') {
                  uVar42 = *local_248;
                  piVar1 = (int *)((long)local_280 + lVar37 + uVar42 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar37 + uVar19 * lVar47);
                  piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar36 * 4 + uVar42 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar36 * 4 + uVar19 * lVar47 + 8)
                       = uVar12;
                  puVar40 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
                  goto LAB_0031a55c;
                }
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 0x10 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar28 + 4 + local_208._24_8_ + lVar36 + lVar38 * lVar15) == '\0') {
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 + lVar37 + (long)puVar23 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  puVar50 = (ulong *)*local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar37 + (long)puVar50 * lVar47);
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar36 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (local_2f8._24_8_ + lVar28 * 4 + lVar36 * 4 + (long)puVar50 * lVar47 + 8) =
                       uVar12;
                  puVar31 = (ulong *)local_2f8._24_8_;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  local_218 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
                  local_210 = puVar50;
                  goto LAB_00318a70;
                }
                piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + lVar27 + 0xc + lVar28 * 4)
                ;
                *piVar1 = *piVar1 + 1;
                puVar23 = (ulong *)*local_248;
                if (*(char *)(lVar28 + 3 +
                             *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_ + lVar36)
                    == '\0') {
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * (long)plVar39 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar42 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar28 * 4 + uVar42 * (long)plVar39 + lVar27 + 0x10);
                  piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar27 + (long)puVar23 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar28 * 4 + uVar42 * lVar47 + lVar27));
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  plVar39 = local_230;
                }
                else {
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * (long)plVar39 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar28 * 4 + lVar27 + (long)puVar22 * (long)plVar39 + 8);
                  piVar1 = (int *)((long)local_280 +
                                  lVar28 * 4 + lVar27 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                }
              }
              *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar27 + (long)puVar22 * lVar47 + 8) =
                   uVar10;
              lVar41 = lVar41 + 0x200000000;
              lVar38 = lVar36 + lVar28;
              lVar28 = lVar28 + 2;
              puVar24 = (ulong *)local_2f8._24_8_;
              puVar51 = puVar22;
              local_308 = local_280;
              puVar33 = (ulong *)local_2f8._24_8_;
              local_228 = puVar22;
              if ((long)local_130 <= lVar38 + 4) {
                uVar10 = (int)local_218 + (int)lVar28 + 2;
                iVar11 = (int)local_218 + (int)lVar28;
                break;
              }
            } while( true );
          }
          puVar50 = local_228;
          puVar40 = (ulong *)(ulong)uVar10;
          if (iVar29 < (int)uVar10) {
LAB_0031ae76:
            local_218 = puVar40;
            local_228 = puVar50;
            lVar15 = (long)(int)local_218;
            piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar15 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar15 + *(long *)local_208._80_8_ * lVar47 + local_208._24_8_) == '\0') {
              piVar1 = (int *)((long)local_308 + lVar15 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar33 + lVar15 * 4 + (long)local_228 * lVar47) = 0;
            }
            else {
              piVar1 = (int *)((long)local_308 + lVar15 * 4 + (long)puVar23 * lVar47 + -8);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar33 + lVar15 * 4 + (long)local_228 * lVar47 + -8);
              piVar1 = (int *)((long)local_308 + lVar15 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar33 + lVar15 * 4 + (long)local_228 * lVar47) = uVar12;
            }
            goto LAB_0031c09e;
          }
          lVar27 = (long)(int)uVar10;
          piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          lVar36 = lVar38 * lVar47 + local_208._24_8_;
          lVar41 = (long)iVar11;
          if (*(char *)(lVar27 + lVar36) == '\0') {
            piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar36 + 3 + lVar41) == '\0') {
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)puVar51 * lVar47) = 0;
              goto LAB_0031c09e;
            }
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)puVar51);
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
          }
          else {
            piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar51 * lVar47);
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)puVar51 * lVar47) = uVar12;
              goto LAB_0031c09e;
            }
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)puVar51);
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
          }
          *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)puVar51 * lVar47) = uVar12;
          goto LAB_0031c09e;
        }
        lVar28 = uVar42 * lVar15 + local_190;
        piVar1 = (int *)(lVar28 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar37 = lVar38 * lVar15 + local_208._24_8_;
        if (*(char *)(lVar41 + 3 + lVar37) != '\0') {
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * (long)plVar39);
          *piVar1 = *piVar1 + 1;
          puVar22 = (ulong *)*local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar50 * 4 + (long)puVar22 * (long)plVar39);
          piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
          *piVar1 = *piVar1 + 1;
          puVar51 = puVar22;
          local_228 = puVar22;
          goto LAB_003194b1;
        }
        piVar1 = (int *)(lVar27 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar36 + 3 + lVar41) != '\0') {
          piVar1 = (int *)(lVar28 + 0x10 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar37 + 4 + lVar41);
          piVar1 = (int *)(lVar28 + (long)puVar50 * 4);
          *piVar1 = *piVar1 + 1;
          if (cVar25 == '\0') {
            if (*(char *)(lVar37 + (long)puVar50) == '\0') {
              uVar10 = TTA::MemNewLabel();
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              goto LAB_00315b65;
            }
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * (long)plVar39);
            *piVar1 = *piVar1 + 1;
            goto LAB_00315a0e;
          }
          if (*(char *)(lVar37 + (long)puVar50) == '\0') {
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 0x10);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar22 * (long)plVar39 + 0x10)
            ;
            piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            puVar51 = puVar22;
            local_228 = puVar22;
            goto LAB_0031713b;
          }
          piVar1 = (int *)(local_190 + uVar42 * (long)plVar39 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * (long)plVar39);
          puVar23 = (ulong *)*local_248;
          puVar40 = (ulong *)((long)puVar23 * (long)plVar39 + (long)local_280);
          piVar1 = (int *)((long)puVar40 + (long)puVar50 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_00315818;
        }
        piVar1 = (int *)(lVar28 + (long)puVar50 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + (long)puVar50) == '\0') {
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + *local_248 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)puVar50 * 4 + *local_2a8 * lVar47) = uVar10;
          puVar40 = local_218;
          plVar39 = local_230;
        }
        else {
          uVar42 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + uVar42 * (long)plVar39);
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar50 * 4 + uVar19 * (long)plVar39);
          piVar1 = (int *)((long)local_280 + (long)puVar50 * 4 + uVar42 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar50 * 4 + uVar19 * lVar47) = uVar12;
        }
LAB_0031a55c:
        iVar11 = (int)puVar40;
        uVar10 = iVar11 + 2;
        puVar50 = puVar40;
        puVar40 = (ulong *)(ulong)uVar10;
      } while ((int)uVar10 < iVar29);
      lVar15 = (long)(iVar11 + 3);
    }
    uVar42 = *local_158;
    lVar41 = uVar42 * lVar47 + local_190;
    lVar27 = (long)(int)uVar10;
    piVar1 = (int *)(lVar41 + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = *(long *)local_208._80_8_;
    lVar36 = lVar38 * lVar47 + local_208._24_8_;
    cVar25 = *(char *)(lVar27 + lVar36);
    if (iVar29 < (int)uVar10) {
      if (cVar25 != '\0') {
        piVar1 = (int *)(local_190 + uVar42 * (uVar26 - 2) + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * (uVar26 - 2)) == '\0') {
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar47 * *local_2a8) = uVar10;
        }
        else {
          uVar42 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * (uVar26 - 3));
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + (uVar26 - 3) * uVar19);
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar19 * lVar47) = uVar12;
        }
        goto LAB_0031c09e;
      }
LAB_0031aa81:
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * lVar47);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + lVar47 * *local_2a8) = 0;
    }
    else {
      if (cVar25 == '\0') {
        piVar1 = (int *)(lVar41 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar36 + lVar15) == '\0') goto LAB_0031aa81;
        lVar41 = local_190 + uVar42 * (uVar26 - 2);
        piVar1 = (int *)(lVar41 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = local_208._24_8_ + lVar38 * (uVar26 - 2);
        if (*(char *)(lVar15 + lVar38) != '\0') goto LAB_0031aa20;
        piVar1 = (int *)(lVar41 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + lVar27) != '\0') {
          uVar42 = *local_248;
          lVar15 = (long)(iVar3 + -3);
          goto LAB_0031b5a4;
        }
      }
      else {
        lVar41 = local_190 + uVar42 * (uVar26 - 2);
        piVar1 = (int *)(lVar41 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = local_208._24_8_ + lVar38 * (uVar26 - 2);
        if (*(char *)(lVar15 + lVar38) != '\0') {
LAB_0031aa20:
          uVar42 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * (long)(iVar3 + -3));
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + (long)(iVar3 + -3) * uVar19);
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar19 * lVar47) = uVar12;
          goto LAB_0031c09e;
        }
        piVar1 = (int *)(lVar41 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + lVar27) != '\0') {
          lVar15 = uVar26 - 3;
          uVar42 = *local_248;
LAB_0031b5a4:
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * lVar15);
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + lVar15 * uVar19);
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar19 * lVar47) = uVar12;
          goto LAB_0031c09e;
        }
      }
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * lVar47);
      *piVar1 = *piVar1 + 1;
      puVar40 = (ulong *)(lVar47 * *local_2a8 + local_2f8._24_8_);
LAB_0031b8ea:
      *(uint *)((long)puVar40 + lVar27 * 4) = uVar10;
    }
    goto LAB_0031c09e;
  }
  if (2 < iVar4) {
    iVar20 = -2;
    iVar11 = 0;
LAB_0030235f:
    lVar47 = (long)iVar11;
    piVar1 = (int *)(local_190 + lVar47 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(local_208._24_8_ + lVar47);
    piVar1 = (int *)(local_190 + 0xc + (long)iVar20 * 4);
    *piVar1 = *piVar1 + 1;
    cVar34 = *(char *)(local_208._24_8_ + 3 + (long)iVar20);
    iVar20 = iVar11;
    if (cVar25 == '\0') {
      if (cVar34 == '\0') {
        piVar1 = (int *)((long)local_280 + lVar47 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4) = 0;
        goto LAB_003024ef;
      }
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar47 * 4) = uVar10;
LAB_003023dd:
      uVar19 = lVar47 + 2;
      puVar40 = (ulong *)local_2f8._24_8_;
      puVar50 = local_280;
      if ((int)uVar19 < iVar29) {
        lVar47 = uVar19 * 4;
        lVar15 = 0;
        do {
          iVar43 = (int)lVar15;
          iVar20 = iVar43 + iVar11;
          piVar1 = (int *)(local_190 + lVar47 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar15 + local_208._24_8_ + uVar19);
          piVar1 = (int *)(local_190 + (long)(iVar20 + 3) * 4);
          *piVar1 = *piVar1 + 1;
          cVar34 = *(char *)(local_208._24_8_ + (long)(iVar20 + 3));
          if (cVar25 == '\0') {
            if (cVar34 == '\0') {
              piVar1 = (int *)((long)puVar50 + lVar15 * 4 + uVar19 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar40 + lVar15 * 4 + uVar19 * 4) = 0;
              goto LAB_003024e5;
            }
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar47);
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)local_2f8._24_8_;
            puVar50 = local_280;
          }
          else {
            if (cVar34 == '\0') goto LAB_00302487;
            piVar1 = (int *)((long)puVar50 + (long)iVar20 * 4);
            *piVar1 = *piVar1 + 1;
            uVar10 = *(uint *)((long)puVar40 + (long)iVar20 * 4);
            piVar1 = (int *)((long)puVar50 + lVar15 * 4 + lVar47);
            *piVar1 = *piVar1 + 1;
          }
          *(uint *)((long)puVar40 + lVar15 * 4 + lVar47) = uVar10;
          lVar38 = uVar19 + lVar15;
          lVar15 = lVar15 + 2;
          if ((long)(uVar42 & 0xffffffff) <= lVar38 + 2) {
            uVar19 = (ulong)(iVar11 + (int)lVar15 + 2);
            iVar11 = iVar11 + (int)lVar15;
            break;
          }
        } while( true );
      }
      lVar47 = (long)(int)uVar19;
      piVar1 = (int *)(local_190 + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(local_208._24_8_ + lVar47);
      if (iVar29 < (int)uVar19) {
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)puVar50 + lVar47 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)((long)puVar40 + lVar47 * 4) = 0;
          goto LAB_0031c09e;
        }
        piVar1 = (int *)((long)puVar50 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        uVar12 = *(undefined4 *)((long)puVar40 + (long)iVar11 * 4);
      }
      else {
        lVar15 = (long)iVar11;
        piVar1 = (int *)(local_190 + 0xc + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        if (cVar25 == '\0') {
          if (*(char *)(local_208._24_8_ + 3 + lVar15) == '\0') {
            piVar1 = (int *)((long)puVar50 + lVar47 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar40 + lVar47 * 4) = 0;
          }
          else {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + lVar47 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + lVar47 * 4) = uVar10;
          }
          goto LAB_0031c09e;
        }
        piVar1 = (int *)((long)puVar50 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
        uVar12 = *(undefined4 *)((long)puVar40 + lVar15 * 4);
      }
      piVar1 = (int *)((long)puVar50 + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)((long)puVar40 + lVar47 * 4) = uVar12;
      goto LAB_0031c09e;
    }
    uVar10 = TTA::MemNewLabel();
    piVar1 = (int *)((long)local_280 + lVar47 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + lVar47 * 4) = uVar10;
    if (cVar34 != '\0') goto LAB_003023dd;
    goto LAB_003024ef;
  }
  iVar11 = 0;
  lVar47 = 1;
  goto LAB_00302b44;
LAB_00302768:
  piVar1 = (int *)((long)puVar50 + (lVar38 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  uVar12 = *(undefined4 *)((long)puVar40 + (lVar38 >> 0x1e));
  piVar1 = (int *)((long)puVar50 + lVar27 * 4 + lVar15 * 4 + 8);
  *piVar1 = *piVar1 + 1;
  plVar48 = (long *)(ulong)(uint)((int)local_130 + (int)lVar27);
  *(undefined4 *)((long)puVar40 + lVar27 * 4 + lVar15 * 4 + 8) = uVar12;
LAB_00302796:
  iVar11 = (int)plVar48 + 2;
  local_230 = plVar48;
  if (iVar11 < iVar29) {
    lVar27 = (long)(int)plVar48;
    local_130 = (pointer)(lVar27 + 2);
    lVar41 = lVar27 << 0x20;
    lVar47 = lVar27 * 4;
    lVar15 = 8;
    lVar38 = 0;
    do {
      lVar36 = local_190 + lVar47;
      piVar1 = (int *)(lVar36 + 8 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar28 = local_208._24_8_ + lVar27;
      lVar37 = lVar41 >> 0x1e;
      iVar11 = (int)local_130;
      if (*(char *)(lVar38 + 2 + lVar28) == '\0') {
        lVar32 = *local_158 + local_190;
        piVar1 = (int *)(lVar32 + lVar47 + 8 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar52 = *(long *)local_208._80_8_ + local_208._24_8_;
        if (*(char *)(lVar38 + 2 + lVar27 + lVar52) == '\0') {
          piVar1 = (int *)(local_190 + (lVar41 + 0x300000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          plVar48 = (long *)((long)local_130 + lVar38);
          lVar47 = lVar41 + 0x300000000 >> 0x20;
          if (*(char *)(local_208._24_8_ + lVar47) != '\0') {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27 * 4 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar27 * 4 + 8) = uVar10;
            puVar40 = (ulong *)local_2f8._24_8_;
            puVar50 = local_280;
            goto LAB_003025ea;
          }
          piVar1 = (int *)(lVar32 + lVar47 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar52 + lVar47) == '\0') {
            piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar27 * 4 + 8);
            *piVar1 = *piVar1 + 1;
            puVar45 = (undefined4 *)((long)puVar40 + lVar15 + lVar27 * 4);
            lVar47 = local_190;
            puVar40 = local_158;
            lVar15 = local_208._24_8_;
            goto LAB_00302b1c;
          }
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar27 * 4 + 8) = uVar10;
          puVar40 = (ulong *)local_2f8._24_8_;
          puVar50 = local_280;
          goto LAB_003025ea;
        }
        piVar1 = (int *)(lVar36 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 3 + lVar28) != '\0') {
          piVar1 = (int *)(lVar32 + (lVar41 + 0x100000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar52 + (lVar41 + 0x100000000 >> 0x20)) == '\0') {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27 * 4 + 8);
            *piVar1 = *piVar1 + 1;
            lVar47 = local_2f8._24_8_ + lVar27 * 4;
            puVar40 = (ulong *)local_2f8._24_8_;
            puVar50 = local_280;
          }
          else {
            *(int *)((long)puVar50 + lVar37) = *(int *)((long)puVar50 + lVar37) + 1;
            uVar10 = *(uint *)((long)puVar40 + lVar37);
            piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar27 * 4 + 8);
            *piVar1 = *piVar1 + 1;
            lVar47 = (long)puVar40 + lVar27 * 4;
          }
          *(uint *)(lVar47 + 8 + lVar38 * 4) = uVar10;
          plVar48 = (long *)(ulong)(uint)(iVar11 + (int)lVar38);
          goto LAB_003025ea;
        }
        piVar1 = (int *)(lVar32 + lVar47 + 4 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 1 + lVar27 + lVar52) == '\0') {
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)local_2f8._24_8_;
          puVar50 = local_280;
        }
        else {
          piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar47);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)puVar40 + lVar38 * 4 + lVar47);
          piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar47 + 8);
          *piVar1 = *piVar1 + 1;
        }
      }
      else {
        piVar1 = (int *)(*local_158 + 4 + lVar36 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(*(long *)local_208._80_8_ + 1 + lVar28 + lVar38);
        piVar1 = (int *)(lVar36 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)(lVar38 + 3 + lVar28);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27 * 4 + 8);
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)local_2f8._24_8_;
            puVar50 = local_280;
            goto LAB_00302a41;
          }
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)local_2f8._24_8_;
          puVar50 = local_280;
        }
        else {
          if (cVar34 != '\0') goto LAB_0030293c;
          piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar47);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)puVar40 + lVar38 * 4 + lVar47);
          piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar47 + 8);
          *piVar1 = *piVar1 + 1;
        }
      }
      *(uint *)((long)puVar40 + lVar38 * 4 + lVar47 + 8) = uVar10;
      lVar41 = lVar41 + 0x200000000;
      lVar15 = lVar15 + 8;
      lVar36 = lVar27 + lVar38;
      lVar38 = lVar38 + 2;
      if ((long)(uVar42 & 0xffffffff) <= lVar36 + 4) {
        iVar11 = (int)local_230 + (int)lVar38 + 2;
        plVar48 = (long *)(ulong)(uint)((int)local_230 + (int)lVar38);
        break;
      }
    } while( true );
  }
  lVar15 = (long)iVar11;
  piVar1 = (int *)(local_190 + lVar15 * 4);
  *piVar1 = *piVar1 + 1;
  iVar20 = (int)plVar48;
  if (iVar29 < iVar11) {
    if (*(char *)(local_208._24_8_ + lVar15) == '\0') {
      uVar19 = *local_158;
      piVar1 = (int *)(local_190 + uVar19 + lVar15 * 4);
      *piVar1 = *piVar1 + 1;
      lVar47 = *(long *)local_208._80_8_;
      if (*(char *)(lVar15 + local_208._24_8_ + lVar47) == '\0') {
LAB_0031b30e:
        piVar1 = (int *)((long)puVar50 + lVar15 * 4);
        *piVar1 = *piVar1 + 1;
LAB_0031b312:
        *(undefined4 *)((long)puVar40 + lVar15 * 4) = 0;
        goto LAB_00302faa;
      }
      piVar1 = (int *)(local_190 + uVar19 + 4 + (long)iVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(local_208._24_8_ + lVar47 + 1 + (long)iVar20);
    }
    else {
      piVar1 = (int *)(local_190 + *local_158 + 4 + (long)iVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)iVar20 + 1 + local_208._24_8_ + *(long *)local_208._80_8_);
    }
  }
  else {
    if (*(char *)(local_208._24_8_ + lVar15) == '\0') {
      lVar38 = *local_158 + local_190;
      piVar1 = (int *)(lVar38 + lVar15 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = *(long *)local_208._80_8_ + local_208._24_8_;
      cVar25 = *(char *)(lVar15 + lVar27);
      lVar47 = (long)iVar20;
      piVar1 = (int *)(local_190 + 0xc + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      if (cVar25 == '\0') {
        if ((*(char *)(local_208._24_8_ + 3 + lVar47) != '\0') ||
           (piVar1 = (int *)(lVar38 + 0xc + lVar47 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar27 + 3 + lVar47) != '\0')) goto LAB_00302f92;
        goto LAB_0031b30e;
      }
      piVar1 = (int *)(lVar38 + 4 + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + 1 + lVar47) == '\0') goto LAB_00302f92;
      piVar1 = (int *)((long)puVar50 + lVar47 * 4);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)((long)puVar40 + lVar47 * 4);
      goto LAB_00302ef3;
    }
    lVar47 = (long)iVar20;
    piVar1 = (int *)(*local_158 + local_190 + 4 + lVar47 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar47 + 1 + local_208._24_8_ + *(long *)local_208._80_8_);
    piVar1 = (int *)(local_190 + 0xc + lVar47 * 4);
    *piVar1 = *piVar1 + 1;
  }
  if (cVar25 == '\0') goto LAB_00302f92;
  piVar1 = (int *)((long)puVar50 + (long)iVar20 * 4);
  *piVar1 = *piVar1 + 1;
  uVar12 = *(undefined4 *)((long)puVar40 + (long)iVar20 * 4);
LAB_00302ef3:
  piVar1 = (int *)((long)puVar50 + lVar15 * 4);
  *piVar1 = *piVar1 + 1;
LAB_00302ef7:
  *(undefined4 *)((long)puVar40 + lVar15 * 4) = uVar12;
  goto LAB_00302faa;
LAB_0030293c:
  *(int *)((long)puVar50 + lVar37) = *(int *)((long)puVar50 + lVar37) + 1;
  uVar10 = *(uint *)((long)puVar40 + lVar37);
  piVar1 = (int *)((long)puVar50 + lVar38 * 4 + lVar27 * 4 + 8);
  *piVar1 = *piVar1 + 1;
LAB_00302a41:
  plVar48 = (long *)(ulong)(uint)(iVar11 + (int)lVar38);
  *(uint *)((long)puVar40 + lVar38 * 4 + lVar27 * 4 + 8) = uVar10;
  goto LAB_003025ea;
LAB_0030d9e9:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + lVar35 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar35 + uVar46 * uVar19);
  piVar1 = (int *)((long)local_280 + lVar49 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + lVar49 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
  local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar49);
LAB_0030da61:
  puVar40 = (ulong *)(long)(int)local_308;
  local_308 = (ulong *)((long)puVar40 + 2);
  if ((int)local_308 < iVar29) {
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + 8 + (long)puVar40 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    uVar46 = uVar19 | 1;
    if (*(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 2) == '\0') {
      piVar1 = (int *)(*local_158 * uVar46 + local_190 + 8 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar46 + 2);
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar34 = *(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 3);
      if (cVar25 == '\0') {
        if (cVar34 == '\0') {
          uVar17 = *local_158;
          piVar1 = (int *)(uVar17 * uVar46 + local_190 + 0xc + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + uVar46 * lVar15 + local_208._24_8_ + 3) == '\0') {
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19);
            goto LAB_003080de;
          }
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
          goto LAB_00308812;
        }
        lVar38 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) != '\0') {
LAB_0030f3ac:
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8)
          ;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_0030a8be;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0x10 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        cVar25 = *(char *)((long)puVar40 + lVar15 + 4);
        piVar1 = (int *)(lVar38 * *local_158 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)((long)puVar40 + lVar15 + 2);
joined_r0x0030ea23:
        if (cVar25 == '\0') goto LAB_00310c25;
        if (cVar34 == '\0') {
LAB_00310c8c:
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 0x10);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)
                    (local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 0x10);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00305084;
        }
        piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)puVar40 +
                          *(long *)local_208._80_8_ * (uVar19 - 2) + local_208._24_8_ + 3);
LAB_0030ea70:
        uVar17 = *local_248;
        lVar38 = uVar17 * (uVar19 - 2);
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar15 = (uVar19 - 2) * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 0x10);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 0x10);
          goto LAB_003118a9;
        }
      }
      else {
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar46 + 1);
        if (cVar34 == '\0') {
          if (cVar25 == '\0') {
            local_220 = puVar40;
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + (long)local_220 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_220 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
            goto LAB_0030b131;
          }
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_0030b131;
        }
        lVar15 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
        cVar34 = *(char *)((long)puVar40 + lVar38 + 3);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') goto LAB_0030f3ac;
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0x10 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + 4 + (long)puVar40);
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          cVar34 = *(char *)((long)puVar40 + lVar15 * lVar38 + local_208._24_8_ + 2);
          if (cVar25 != '\0') {
            if (cVar34 != '\0') {
              piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar38 * (uVar19 - 2) + 3);
              goto LAB_0030ea70;
            }
            goto LAB_00310c8c;
          }
LAB_00310c25:
          if (cVar34 == '\0') {
LAB_00310df3:
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
            goto LAB_00303dda;
          }
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8)
          ;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
LAB_003039a7:
          puVar40 = (ulong *)(long)(int)local_308;
          local_308 = (ulong *)((long)puVar40 + 2);
          plVar48 = plVar39;
          if ((int)local_308 < iVar29) {
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 2) == '\0') {
              uVar46 = uVar19 | 1;
              piVar1 = (int *)(*local_158 * uVar46 + local_190 + 8 + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar46 + 2);
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              cVar34 = *(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 3);
              if (cVar25 == '\0') {
                if (cVar34 == '\0') {
                  uVar17 = *local_158;
                  piVar1 = (int *)(uVar17 * uVar46 + local_190 + 0xc + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((long)puVar40 + uVar46 * lVar15 + local_208._24_8_ + 3) == '\0') {
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00314a63;
                  }
                  uVar10 = TTA::MemNewLabel();
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10
                  ;
                  goto LAB_00308812;
                }
                lVar38 = uVar19 - 1;
                piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) != '\0') {
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar12 = *(undefined4 *)
                            (local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8);
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) =
                       uVar12;
LAB_0030a8be:
                  iVar11 = (int)local_308;
                  uVar10 = iVar11 + 2;
                  if ((int)uVar10 < iVar29) {
                    lVar38 = uVar19 - 1;
                    local_220 = (ulong *)(uVar19 - 2);
                    puVar40 = (ulong *)(long)iVar11;
                    lVar27 = (long)puVar40 + 2;
                    lVar37 = (long)puVar40 << 0x20;
                    lVar41 = (long)puVar40 * 4;
                    lVar28 = 8;
                    lVar36 = 0;
                    do {
                      plVar39 = local_230;
                      piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar41 + 8 + lVar36 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar15 = *(long *)local_208._80_8_;
                      lVar32 = lVar37 >> 0x1e;
                      iVar20 = (int)lVar27;
                      plVar48 = local_230;
                      if (*(char *)((long)puVar40 + lVar36 + 2 + uVar19 * lVar15 + local_208._24_8_)
                          != '\0') {
                        uVar17 = lVar27 + lVar36;
                        lVar41 = lVar37 + 0x300000000 >> 0x20;
                        piVar1 = (int *)((lVar37 + 0x300000000 >> 0x1e) +
                                        *local_158 * lVar38 + local_190);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
                          piVar1 = (int *)(local_190 + *local_158 * lVar47 + (long)puVar40 * 4 + 8 +
                                          lVar36 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar15 = *(long *)local_208._80_8_;
                          if (*(char *)((long)puVar40 +
                                       lVar36 + 2 + lVar15 * lVar47 + local_208._24_8_) == '\0') {
                            piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                             (long)puVar40 * 4 + 8 + lVar36 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar46 = *local_248;
                            if (*(char *)((long)puVar40 +
                                         lVar36 + 2 + lVar15 * (long)local_130 + local_208._24_8_)
                                == '\0') {
                              piVar1 = (int *)((long)local_280 +
                                              lVar36 * 4 +
                                              (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                              *piVar1 = *piVar1 + 1;
                              uVar21 = *local_2a8;
                              uVar10 = *(uint *)(local_2f8._24_8_ +
                                                lVar36 * 4 +
                                                (long)puVar40 * 4 + uVar21 * (long)local_130 + 8);
                              piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
                              *piVar1 = *piVar1 + 1;
                              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                                     lVar32 + uVar21 * uVar19));
                              piVar1 = (int *)((long)local_280 +
                                              lVar36 * 4 +
                                              (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                              *piVar1 = *piVar1 + 1;
                              *(uint *)(local_2f8._24_8_ +
                                       lVar36 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
                                   uVar10;
                              local_308 = (ulong *)(uVar17 & 0xffffffff);
                              goto LAB_00303119;
                            }
                            piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * (long)local_220);
                            *piVar1 = *piVar1 + 1;
                            uVar21 = *local_2a8;
                            uVar12 = *(undefined4 *)
                                      (local_2f8._24_8_ + lVar32 + (long)local_220 * uVar21);
                            lVar15 = (long)puVar40 * 4 + uVar46 * uVar19;
                          }
                          else {
                            uVar46 = *local_248;
                            piVar1 = (int *)((long)local_280 +
                                            lVar36 * 4 +
                                            (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                            *piVar1 = *piVar1 + 1;
                            uVar21 = *local_2a8;
                            uVar12 = *(undefined4 *)
                                      (local_2f8._24_8_ +
                                      lVar36 * 4 + (long)puVar40 * 4 + uVar21 * (long)local_130 + 8)
                            ;
                            lVar15 = (long)puVar40 * 4 + uVar46 * uVar19;
                          }
                          piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar21 * uVar19 + 8)
                               = uVar12;
                          local_308 = (ulong *)(uVar17 & 0xffffffff);
                          goto LAB_00303119;
                        }
                        piVar1 = (int *)(local_190 + *local_158 * uVar19 + lVar41 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)(lVar41 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
                          uVar46 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar21 = *local_2a8;
                          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19);
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar21 * uVar19 + 8)
                               = uVar12;
                          local_308 = (ulong *)(uVar17 & 0xffffffff);
                          goto LAB_0030da61;
                        }
                        piVar1 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                                        lVar38 * *local_158 + local_190);
                        *piVar1 = *piVar1 + 1;
                        lVar28 = lVar37 + 0x400000000 >> 0x20;
                        if (*(char *)(lVar28 + local_208._24_8_ + lVar15 * lVar38) == '\0') {
                          uVar46 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar21 = *local_2a8;
                          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19);
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar21 * uVar19 + 8)
                               = uVar12;
                          local_308 = (ulong *)(uVar17 & 0xffffffff);
                          goto LAB_0030d1a8;
                        }
                        piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + lVar41 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)(lVar41 + lVar15 * (long)local_220 + local_208._24_8_) == '\0')
                        {
                          uVar46 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar28 * 4 + uVar46 * (long)local_220);
                          *piVar1 = *piVar1 + 1;
                          uVar17 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar28 * 4 + (long)local_220 * uVar17);
                          goto LAB_0030f0bf;
                        }
                        piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)puVar40 * 4 + 8 +
                                        lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 2 + lVar15 * lVar47 + local_208._24_8_) != '\0') {
LAB_0030bfba:
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 +
                                          (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar12 = *(undefined4 *)
                                    (local_2f8._24_8_ +
                                    lVar36 * 4 + (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                          lVar15 = (long)puVar40 * 4 + uVar17 * uVar19;
                          goto LAB_0030f92b;
                        }
                        piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                         (long)puVar40 * 4 + 8 + lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar17 = *local_248;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 2 +
                                     *(long *)local_208._80_8_ * (long)local_130 + local_208._24_8_)
                            != '\0') {
                          piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * (long)local_220);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar12 = *(undefined4 *)
                                    (local_2f8._24_8_ + lVar32 + (long)local_220 * uVar46);
                          goto LAB_0030f920;
                        }
LAB_0030f946:
                        piVar1 = (int *)((long)local_280 +
                                        lVar36 * 4 +
                                        (long)puVar40 * 4 + uVar17 * (long)local_130 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar36 * 4 +
                                          (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
                        piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                        *piVar1 = *piVar1 + 1;
                        uVar13 = *(uint *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
LAB_0030f0d2:
                        uVar10 = TTA::MemMerge(uVar10,uVar13);
                        piVar1 = (int *)((long)local_280 +
                                        lVar36 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(local_2f8._24_8_ +
                                 lVar36 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
                        local_308 = (ulong *)(lVar27 + lVar36 & 0xffffffff);
                        goto LAB_00305084;
                      }
                      piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar41 + 8 +
                                      lVar36 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar25 = *(char *)((long)puVar40 +
                                        lVar36 + 2 + lVar15 * (long)local_230 + local_208._24_8_);
                      piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar41 + 0xc + lVar36 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar15 = *(long *)local_208._80_8_;
                      cVar34 = *(char *)((long)puVar40 +
                                        lVar36 + 3 + uVar19 * lVar15 + local_208._24_8_);
                      if (cVar25 == '\0') {
                        if (cVar34 == '\0') {
                          local_308 = (ulong *)(lVar27 + lVar36);
                          uVar17 = *local_158;
                          piVar1 = (int *)(uVar17 * (long)local_230 + local_190 + (long)puVar40 * 4
                                           + 0xc + lVar36 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)((long)puVar40 +
                                       lVar36 + 3 + (long)local_230 * lVar15 + local_208._24_8_) ==
                              '\0') {
                            piVar1 = (int *)((long)local_280 +
                                            lVar36 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8
                                            );
                            *piVar1 = *piVar1 + 1;
                            puVar40 = (ulong *)(local_2f8._24_8_ +
                                               lVar28 + (long)puVar40 * 4 + *local_2a8 * uVar19);
                            goto LAB_0030cd34;
                          }
                          uVar10 = TTA::MemNewLabel();
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(local_2f8._24_8_ +
                                   lVar36 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
                               uVar10;
                          goto LAB_00308812;
                        }
                        piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar41 + 0xc + lVar36 * 4
                                        );
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 3 + lVar15 * lVar47 + local_208._24_8_) == '\0')
                        goto LAB_0030c1d9;
LAB_0030ab0c:
                        uVar17 = *local_248;
                        piVar1 = (int *)((long)local_280 +
                                        lVar36 * 4 + (long)local_130 * uVar17 + lVar41 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar36 * 4 + lVar41 + (long)local_130 * uVar46 + 8);
LAB_0030ab60:
                        piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * uVar19 + lVar41 + 8
                                        );
                        *piVar1 = *piVar1 + 1;
                      }
                      else {
                        if (cVar34 == '\0') {
                          uVar17 = *local_248;
                          piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8)
                               = uVar12;
                          local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar36);
                          goto LAB_0030b131;
                        }
                        piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar41 + 0xc + lVar36 * 4
                                        );
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 3 + lVar15 * lVar47 + local_208._24_8_) == '\0') {
                          piVar1 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                                          *local_158 * lVar38 + local_190);
                          *piVar1 = *piVar1 + 1;
                          lVar41 = lVar37 + 0x400000000 >> 0x20;
                          lVar15 = *(long *)local_208._80_8_;
                          if (*(char *)(lVar41 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
                            uVar17 = *local_248;
                            piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
                            *piVar1 = *piVar1 + 1;
                            uVar46 = *local_2a8;
                            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
                            piVar1 = (int *)((long)local_280 +
                                            lVar36 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                            *piVar1 = *piVar1 + 1;
                            *(undefined4 *)
                             (local_2f8._24_8_ +
                             lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
                            local_308 = (ulong *)(lVar27 + lVar36 & 0xffffffff);
                            goto LAB_0030d1a8;
                          }
                          piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                           (long)puVar40 * 4 + 0xc + lVar36 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)((long)puVar40 +
                                       lVar36 + 3 + lVar15 * (long)local_130 + local_208._24_8_) ==
                              '\0') {
                            uVar46 = *local_248;
                            piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar46 * (long)local_220
                                            );
                            *piVar1 = *piVar1 + 1;
                            uVar17 = *local_2a8;
                            uVar10 = *(uint *)(local_2f8._24_8_ +
                                              lVar41 * 4 + (long)local_220 * uVar17);
LAB_0030f0bf:
                            piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
                            *piVar1 = *piVar1 + 1;
                            uVar13 = *(uint *)(local_2f8._24_8_ + lVar32 + uVar17 * uVar19);
                            goto LAB_0030f0d2;
                          }
                          piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)puVar40 * 4 + 8 +
                                          lVar36 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar15 = *(long *)local_208._80_8_;
                          if (*(char *)((long)puVar40 +
                                       lVar36 + 2 + lVar15 * lVar47 + local_208._24_8_) != '\0')
                          goto LAB_0030bfba;
                          piVar1 = (int *)(*local_158 * (long)local_130 + local_190 +
                                           (long)puVar40 * 4 + 8 + lVar36 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar17 = *local_248;
                          if (*(char *)((long)puVar40 +
                                       lVar36 + 2 + lVar15 * (long)local_130 + local_208._24_8_) ==
                              '\0') goto LAB_0030f946;
                          piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * (long)local_220);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar12 = *(undefined4 *)
                                    (local_2f8._24_8_ + lVar32 + (long)local_220 * uVar46);
LAB_0030f920:
                          lVar15 = (long)puVar40 * 4 + uVar17 * uVar19;
LAB_0030f92b:
                          piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8)
                               = uVar12;
                          local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar36);
                          goto LAB_00305084;
                        }
                        piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar41 + 8 + lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar15 = *(long *)local_208._80_8_;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 2 + lVar47 * lVar15 + local_208._24_8_) != '\0')
                        goto LAB_0030ab0c;
                        piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + lVar41 + 8 +
                                        lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar17 = *local_248;
                        if (*(char *)((long)puVar40 +
                                     lVar36 + 2 + lVar15 * (long)local_130 + local_208._24_8_) !=
                            '\0') {
                          piVar1 = (int *)((long)local_280 +
                                          lVar36 * 4 + (long)local_130 * uVar17 + lVar41);
                          *piVar1 = *piVar1 + 1;
                          uVar46 = *local_2a8;
                          uVar10 = *(uint *)(local_2f8._24_8_ +
                                            lVar36 * 4 + lVar41 + (long)local_130 * uVar46);
                          goto LAB_0030ab60;
                        }
                        piVar1 = (int *)((long)local_280 +
                                        lVar36 * 4 + (long)local_130 * uVar17 + lVar41 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar36 * 4 + (long)local_130 * uVar46 + lVar41 + 8);
                        piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * uVar19 + lVar41);
                        *piVar1 = *piVar1 + 1;
                        local_228 = puVar40;
                        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                               lVar36 * 4 + uVar46 * uVar19 + lVar41
                                                               ));
                        piVar1 = (int *)((long)local_280 +
                                        lVar36 * 4 + lVar41 + *local_248 * uVar19 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar46 = *local_2a8;
                        puVar40 = local_228;
                      }
                      *(uint *)(local_2f8._24_8_ + lVar36 * 4 + uVar46 * uVar19 + lVar41 + 8) =
                           uVar10;
                      lVar37 = lVar37 + 0x200000000;
                      lVar28 = lVar28 + 8;
                      lVar15 = lVar36 + 4;
                      lVar36 = lVar36 + 2;
                      if ((long)uVar42 <= (long)puVar40 + lVar15) {
                        iVar11 = iVar11 + (int)lVar36;
                        uVar10 = iVar20 + (int)lVar36;
                        plVar39 = local_230;
                        break;
                      }
                    } while( true );
                  }
                  plVar48 = plVar39;
                  if (iVar29 < (int)uVar10) {
                    local_308 = (ulong *)(ulong)uVar10;
                    goto LAB_0030ad80;
                  }
                  lVar38 = (long)(int)uVar10;
                  piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar15 = *(long *)local_208._80_8_;
                  if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
                    piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + lVar38 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
                    lVar41 = (long)iVar11;
                    piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar15 = *(long *)local_208._80_8_;
                    cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
                    if (cVar25 == '\0') {
LAB_0030b051:
                      plVar39 = plVar48;
                      if (cVar34 == '\0') goto LAB_0030d683;
LAB_0030b05a:
                      lVar27 = uVar19 - 1;
                      piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar27) != '\0')
                      goto LAB_00313b57;
                      piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar25 = *(char *)(lVar38 + lVar27 * *(long *)local_208._80_8_ +
                                                  local_208._24_8_);
joined_r0x00312259:
                      if (cVar25 == '\0') goto LAB_00313794;
                      goto LAB_00313b57;
                    }
                    if (cVar34 == '\0') goto LAB_00312c9d;
                    lVar27 = *local_158 * (uVar19 - 1);
                  }
                  else {
                    lVar27 = *local_158 * (uVar19 - 1);
                  }
                  lVar36 = uVar19 - 1;
                  lVar41 = (long)iVar11;
                  piVar1 = (int *)(lVar27 + local_190 + 0xc + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar36) == '\0')
                  goto LAB_00312c9d;
                  piVar1 = (int *)(*local_158 * lVar36 + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar27 = *(long *)local_208._80_8_;
                  lVar15 = uVar19 - 2;
                  if (*(char *)(lVar38 + lVar36 * lVar27 + local_208._24_8_) != '\0') {
LAB_0030af2a:
                    uVar17 = *local_248;
                    piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
                    *piVar1 = *piVar1 + 1;
                    uVar46 = *local_2a8;
                    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
                    piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
                    goto LAB_00313bae;
                  }
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *local_248;
                  if (*(char *)(lVar38 + local_208._24_8_ + lVar27 * lVar15) == '\0') {
                    piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar15);
                    *piVar1 = *piVar1 + 1;
                    uVar46 = *local_2a8;
                    uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15 * uVar46);
                    piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * uVar19);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00312080;
                  }
                  piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * lVar15);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + lVar15 * uVar46);
                  piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
LAB_00312c25:
                  *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
                  goto LAB_00313bae;
                }
                piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0x10 + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)puVar40 +
                             lVar38 * *(long *)local_208._80_8_ + local_208._24_8_ + 4) == '\0')
                goto LAB_00310df3;
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 0x10)
                ;
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 0x10);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12
                ;
                goto LAB_00305084;
              }
              if (cVar34 == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12
                ;
                goto LAB_0030b131;
              }
              lVar38 = uVar19 - 1;
              piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) != '\0') {
                lVar15 = uVar19 - 2;
                piVar1 = (int *)(local_190 + *local_158 * lVar15 + 8 + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
                if (*(char *)((long)puVar40 + lVar38 + 2) == '\0') {
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
                }
                else {
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar38 + 1 + (long)puVar40);
                  uVar17 = *local_248;
                  lVar38 = uVar17 * lVar15;
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  lVar15 = lVar15 * uVar46;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15);
                  if (cVar25 != '\0') {
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                    goto LAB_0030a8be;
                  }
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
                }
                uVar10 = TTA::MemMerge(uVar10,uVar13);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
                goto LAB_0030a8be;
              }
              piVar1 = (int *)(local_190 + *local_158 * lVar38 + 0x10 + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)((long)puVar40 + lVar38 * lVar15 + local_208._24_8_ + 4) != '\0') {
                lVar38 = uVar19 - 2;
                piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) == '\0')
                goto LAB_003067ab;
                piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
                if (*(char *)((long)puVar40 + lVar15 + 2) != '\0') {
                  piVar1 = (int *)(*local_158 * lVar38 + local_190 + 4 + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar15 + 1 + (long)puVar40);
                  goto LAB_00306532;
                }
LAB_00306fd6:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8)
                ;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
                goto LAB_00307359;
              }
            }
            else {
              lVar38 = uVar19 - 1;
              piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) != '\0') {
                lVar15 = uVar19 - 2;
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
                if (*(char *)((long)puVar40 + lVar38 + 2) == '\0') {
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
                }
                else {
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar38 + 1 + (long)puVar40);
                  uVar17 = *local_248;
                  lVar38 = uVar17 * lVar15;
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  lVar15 = lVar15 * uVar46;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15);
                  if (cVar25 != '\0') {
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                    goto LAB_00303119;
                  }
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
                }
                uVar10 = TTA::MemMerge(uVar10,uVar13);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
                goto LAB_00303119;
              }
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 3) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12
                ;
                goto LAB_0030da61;
              }
              piVar1 = (int *)(lVar38 * *local_158 + local_190 + 0x10 + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 4) != '\0') {
                lVar15 = uVar19 - 2;
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + (long)puVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
                if (*(char *)((long)puVar40 + lVar38 + 3) == '\0') {
LAB_003067ab:
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 +
                                  (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 0x10);
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         (long)puVar40 * 4 + uVar46 * uVar19));
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10
                  ;
                }
                else {
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar38 + 2 + (long)puVar40) == '\0') goto LAB_00306fd6;
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)((long)puVar40 +
                                    *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + 1);
LAB_00306532:
                  uVar17 = *local_248;
                  lVar38 = uVar17 * (uVar19 - 2);
                  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  lVar15 = (uVar19 - 2) * uVar46;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15);
                  if (cVar25 == '\0') {
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
LAB_00307359:
                    uVar10 = TTA::MemMerge(uVar10,uVar13);
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
                         uVar10;
                  }
                  else {
                    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                  }
                }
                goto LAB_00305084;
              }
            }
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
            goto LAB_0030d1a8;
          }
          if (iVar29 < (int)local_308) goto LAB_0030ad80;
          piVar1 = (int *)(*local_158 * uVar19 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 2) == '\0') {
            uVar17 = uVar19 | 1;
            piVar1 = (int *)(*local_158 * uVar17 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 2);
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            cVar34 = *(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 3);
            if (cVar25 != '\0') {
              if (cVar34 != '\0') goto LAB_00303b46;
              goto LAB_00304c04;
            }
            if (cVar34 == '\0') {
              piVar1 = (int *)(uVar17 * *local_158 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 3) == '\0') {
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = 0;
                goto LAB_00313bae;
              }
            }
            else {
              piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * (uVar19 - 1) + 3) != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8);
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12
                ;
                goto LAB_00313bae;
              }
            }
            uVar10 = TTA::MemNewLabel();
          }
          else {
LAB_00303b46:
            piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * (uVar19 - 1) + 3) == '\0') {
LAB_00304c04:
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
              goto LAB_00313bae;
            }
            lVar15 = uVar19 - 2;
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
            if (*(char *)((long)puVar40 + lVar38 + 2) == '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
            }
            else {
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar38 + 1 + (long)puVar40);
              uVar17 = *local_248;
              lVar38 = uVar17 * lVar15;
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              lVar15 = lVar15 * uVar46;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15);
              if (cVar25 != '\0') {
                piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
                goto LAB_00313bae;
              }
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
            }
            uVar10 = TTA::MemMerge(uVar10,uVar13);
          }
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
          goto LAB_00313bae;
        }
        if (cVar34 != '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar27 = uVar19 - 2;
          if (*(char *)(lVar38 + (long)puVar40) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 8);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 8);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   (long)puVar40 * 4 + uVar46 * uVar19));
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
            goto LAB_0030a8be;
          }
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          if (*(char *)((long)puVar40 + lVar38 * lVar27 + local_208._24_8_ + 1) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 8);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 8);
          }
          else {
            piVar1 = (int *)(lVar15 * *local_158 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)puVar40 + local_208._24_8_ + lVar38 * lVar15 + 2) != '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
              goto LAB_0030a8be;
            }
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)puVar40 +
                              *(long *)local_208._80_8_ * lVar27 + local_208._24_8_ + 2);
            uVar17 = *local_248;
            lVar15 = uVar17 * lVar27;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            lVar27 = lVar27 * uVar46;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27);
            if (cVar25 != '\0') {
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
              goto LAB_0030a8be;
            }
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15 + 8);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 + 8);
          }
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
          goto LAB_0030a8be;
        }
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0x10 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 4 + (long)puVar40) == '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
          if (*(char *)((long)puVar40 + lVar38 + 2) == '\0') goto LAB_0031115a;
          piVar1 = (int *)(lVar15 * *local_158 + local_190 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = uVar19 - 2;
          if (*(char *)(lVar38 + (long)puVar40) == '\0') {
            uVar46 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar15 + 8);
            *piVar1 = *piVar1 + 1;
            uVar17 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar17 + 8);
            goto LAB_0031194a;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 +
                            *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + 1);
          uVar17 = *local_248;
          lVar38 = uVar17 * lVar15;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            goto LAB_00311149;
          }
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
          goto LAB_00311959;
        }
        lVar38 = uVar19 - 2;
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        lVar41 = *local_158 * lVar15 + local_190;
        if (*(char *)((long)puVar40 + lVar27 * lVar38 + local_208._24_8_ + 3) == '\0') {
          piVar1 = (int *)(lVar41 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar15 + 2) == '\0') {
            uVar46 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar38 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar17 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar17 + 0x10);
            goto LAB_003119ea;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar27 = *(long *)local_208._80_8_;
          if (*(char *)((long)puVar40 + lVar15 * lVar27 + local_208._24_8_) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 8);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 8);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 0x10);
            goto LAB_00311afd;
          }
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar38 + 1) != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 0x10);
LAB_00311a07:
            local_220 = puVar40;
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            goto LAB_00311b54;
          }
          goto LAB_00305084;
        }
        piVar1 = (int *)(lVar41 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar15) == '\0') {
          uVar46 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar17 + 8);
          goto LAB_003117e7;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 4 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        if (*(char *)((long)puVar40 + lVar27 * lVar38 + local_208._24_8_ + 1) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 8);
          goto LAB_003118a9;
        }
        piVar1 = (int *)(lVar15 * *local_158 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar15 + 2) != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00305084;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)puVar40 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_ + 2
                          );
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 8);
          goto LAB_003118a9;
        }
      }
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
LAB_0030eac4:
      *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
    }
    else {
      piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = uVar19 - 1;
      cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar46 + 1);
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar27 = lVar15 * lVar38 + local_208._24_8_;
      cVar34 = *(char *)((long)puVar40 + lVar27 + 3);
      if (cVar25 == '\0') {
        if (cVar34 != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8)
          ;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar19 + 3) == '\0') {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + lVar38 * *(long *)local_208._80_8_ + local_208._24_8_ + 2)
              == '\0') {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
            goto LAB_00311b9e;
          }
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8)
          ;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_003126fa;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0x10 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        cVar25 = *(char *)((long)puVar40 + lVar15 + 4);
        piVar1 = (int *)(lVar38 * *local_158 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)((long)puVar40 + lVar15 + 2);
        goto joined_r0x0030ea23;
      }
      if (cVar34 != '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = uVar19 - 2;
        if (*(char *)(lVar27 + (long)puVar40) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                 (long)puVar40 * 4 + uVar46 * uVar19));
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        if (*(char *)((long)puVar40 + lVar27 * lVar15 + local_208._24_8_ + 1) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15);
          *piVar1 = *piVar1 + 1;
          puVar50 = (ulong *)(lVar15 * *local_2a8 + local_2f8._24_8_);
          uVar10 = *(uint *)((long)puVar50 + (long)puVar40 * 4);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)(lVar38 * *local_158 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar38 + 2) != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
            goto LAB_00303119;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 +
                            *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + 2);
          uVar17 = *local_248;
          lVar38 = uVar17 * lVar15;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          puVar50 = (ulong *)(lVar15 * uVar46 + local_2f8._24_8_);
          uVar10 = *(uint *)((long)puVar50 + (long)puVar40 * 4);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
            goto LAB_00303119;
          }
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
          *piVar1 = *piVar1 + 1;
        }
        uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar50 + (long)puVar40 * 4 + 8));
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
        goto LAB_00303119;
      }
      piVar1 = (int *)(local_190 + *local_158 * uVar19 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar19 + 3) == '\0') {
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        if (*(char *)((long)puVar40 + lVar15 + 2) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00311b9e;
        }
        piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = uVar19 - 2;
        if (*(char *)(lVar15 + (long)puVar40) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 * uVar46 + 8);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
        }
        else {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 +
                            *(long *)local_208._80_8_ * lVar38 + local_208._24_8_ + 1);
          uVar17 = *local_248;
          lVar15 = uVar17 * lVar38;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          lVar38 = lVar38 * uVar46;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
            goto LAB_003126fa;
          }
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar38 + 8);
        }
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
        goto LAB_003126fa;
      }
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0x10 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar27 = lVar15 * lVar38 + local_208._24_8_;
      if (*(char *)((long)puVar40 + lVar27 + 4) == '\0') {
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + 2 + (long)puVar40) == '\0') {
LAB_0031115a:
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00303dda;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        lVar15 = uVar19 - 2;
        if (*(char *)((long)puVar40 + lVar38 * lVar27 + local_208._24_8_) == '\0') {
          uVar46 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar15 + 8);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar17 + 8);
LAB_0031194a:
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar17 * uVar19);
        }
        else {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar27 * lVar15 + 1);
          uVar17 = *local_248;
          lVar38 = uVar17 * lVar15;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
LAB_00311149:
            *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
            goto LAB_003039a7;
          }
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46 + 8);
        }
LAB_00311959:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
        goto LAB_003039a7;
      }
      lVar27 = uVar19 - 2;
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *local_158 * lVar38 + local_190;
      if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar27 + 3) == '\0') {
        piVar1 = (int *)(lVar41 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        if (*(char *)((long)puVar40 + lVar15 + 2) == '\0') {
          uVar46 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar27 + 0x10);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar17 + 0x10);
LAB_003119ea:
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar17 * uVar19);
          goto LAB_00311a07;
        }
        piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar15 + (long)puVar40) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 8);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 8);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 0x10);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 0x10);
LAB_00311afd:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          local_220 = puVar40;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                 (long)puVar40 * 4 + *local_2a8 * uVar19));
LAB_00311b54:
          piVar1 = (int *)((long)local_280 + (long)local_220 * 4 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_220 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
        }
        else {
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + *(long *)local_208._80_8_ * lVar27 + local_208._24_8_ + 1)
              != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 0x10);
            goto LAB_00311a07;
          }
        }
        goto LAB_00305084;
      }
      piVar1 = (int *)(lVar41 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      if (*(char *)((long)puVar40 + lVar15 * lVar38 + local_208._24_8_) == '\0') {
        uVar46 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar17 + 8);
LAB_003117e7:
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar46 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar17 * uVar19);
      }
      else {
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar27 + 1) != '\0') {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)((long)puVar40 + lVar38 * lVar15 + local_208._24_8_ + 2) == '\0') {
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar27 + 2);
            uVar17 = *local_248;
            lVar15 = uVar17 * lVar27;
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
            if (cVar25 == '\0') {
              piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar15 + 8);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 8);
              goto LAB_003118a9;
            }
            piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            goto LAB_0030eac4;
          }
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
          goto LAB_00305084;
        }
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar27 * uVar46 + 8);
      }
LAB_003118a9:
      uVar10 = TTA::MemMerge(uVar10,uVar13);
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
    }
    goto LAB_00305084;
  }
  piVar1 = (int *)(*local_158 * uVar19 + local_190 + 8 + (long)puVar40 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  uVar17 = uVar19 | 1;
  cVar25 = *(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 2);
  if ((int)local_308 <= iVar29) {
    if (cVar25 == '\0') {
      piVar1 = (int *)(*local_158 * uVar17 + local_190 + 8 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 2);
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar34 = *(char *)((long)puVar40 + lVar15 * uVar19 + local_208._24_8_ + 3);
      if (cVar25 == '\0') {
        if (cVar34 != '\0') {
          lVar38 = uVar19 - 1;
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * lVar38 + 3) != '\0')
          goto LAB_0031028f;
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 +
                            lVar38 * *(long *)local_208._80_8_ + local_208._24_8_ + 2);
          goto joined_r0x0030ef2d;
        }
        piVar1 = (int *)(uVar17 * *local_158 + local_190 + 0xc + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 3) == '\0')
        goto LAB_0031035d;
      }
      else {
        piVar1 = (int *)(uVar17 * *local_158 + local_190 + 4 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 1);
        if (cVar34 != '\0') {
          lVar15 = uVar19 - 1;
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
          cVar34 = *(char *)((long)puVar40 + lVar38 + 3);
          if (cVar25 == '\0') goto joined_r0x00310289;
          lVar15 = *local_158 * lVar15 + local_190;
          if (cVar34 == '\0') {
            piVar1 = (int *)(lVar15 + 8 + (long)puVar40 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_0030edde;
          }
          piVar1 = (int *)(lVar15 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_0030de00;
        }
        if (cVar25 != '\0') goto LAB_0030f709;
      }
LAB_00310316:
      uVar10 = TTA::MemNewLabel();
    }
    else {
      piVar1 = (int *)(uVar17 * *local_158 + local_190 + 4 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = uVar19 - 1;
      cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 1);
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
      cVar34 = *(char *)((long)puVar40 + lVar38 + 3);
      if (cVar25 == '\0') {
joined_r0x00310289:
        if (cVar34 != '\0') goto LAB_0031028f;
        piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + 2 + (long)puVar40);
joined_r0x0030ef2d:
        if (cVar25 != '\0') goto LAB_0031028f;
        goto LAB_00310316;
      }
      lVar15 = *local_158 * lVar27 + local_190;
      if (cVar34 == '\0') {
        piVar1 = (int *)(lVar15 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
LAB_0030edde:
        if (*(char *)(lVar38 + 2 + (long)puVar40) != '\0') {
          piVar1 = (int *)(*local_158 * (uVar19 - 1) + local_190 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)((long)puVar40 + (uVar19 - 1) * lVar15 + local_208._24_8_) == '\0')
          goto LAB_0030ee57;
          piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 4 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * (uVar19 - 2) + 1);
          goto LAB_00310716;
        }
        goto LAB_0030f709;
      }
      piVar1 = (int *)(lVar15 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
LAB_0030de00:
      lVar15 = uVar19 - 2;
      if (*(char *)(lVar38 + (long)puVar40) == '\0') {
LAB_0030ee57:
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8);
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
        goto LAB_00310790;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_;
      if (*(char *)((long)puVar40 + lVar38 * lVar15 + local_208._24_8_ + 1) != '\0') {
        piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 8 + (long)puVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)puVar40 + local_208._24_8_ + lVar38 * (uVar19 - 1) + 2) == '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 8 + (long)puVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar40 +
                            *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + 2);
          goto LAB_00310716;
        }
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46);
        goto LAB_003102d1;
      }
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * lVar15 + 8);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                             (long)puVar40 * 4 + lVar15 * uVar46 + 8));
    }
    piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
    goto LAB_00313bae;
  }
  if (cVar25 == '\0') {
    piVar1 = (int *)(*local_158 * uVar17 + local_190 + 8 + (long)puVar40 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 2) == '\0') {
LAB_0031035d:
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) = 0;
      goto LAB_00313bae;
    }
    piVar1 = (int *)(*local_158 * uVar17 + local_190 + 4 + (long)puVar40 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)((long)puVar40 + uVar17 * *(long *)local_208._80_8_ + local_208._24_8_ + 1) == '\0'
       ) goto LAB_00310316;
  }
  else {
    piVar1 = (int *)(uVar17 * *local_158 + local_190 + 4 + (long)puVar40 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = uVar19 - 1;
    cVar25 = *(char *)((long)puVar40 + local_208._24_8_ + lVar15 * uVar17 + 1);
    piVar1 = (int *)(*local_158 * lVar38 + local_190 + 8 + (long)puVar40 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
    cVar34 = *(char *)((long)puVar40 + lVar15 + 2);
    if (cVar25 == '\0') {
      if (cVar34 == '\0') goto LAB_00310316;
LAB_0031028f:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * (uVar19 - 2) + 8);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + (uVar19 - 2) * uVar46 + 8);
LAB_003102d1:
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
      goto LAB_00313bae;
    }
    if (cVar34 != '\0') {
      piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar15 + (long)puVar40) == '\0') goto LAB_0030ee57;
      piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 4 + (long)puVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)puVar40 +
                        *(long *)local_208._80_8_ * (uVar19 - 2) + local_208._24_8_ + 1);
LAB_00310716:
      uVar17 = *local_248;
      lVar38 = uVar17 * (uVar19 - 2);
      piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar15 = (uVar19 - 2) * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + lVar38 + 8);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + lVar15 + 8);
LAB_00310790:
        local_220 = puVar40;
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)local_220 * 4 + *local_248 * uVar19 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_220 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
      }
      else {
        piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
      }
      goto LAB_00313bae;
    }
  }
LAB_0030f709:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19);
  piVar1 = (int *)((long)local_280 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar12;
  goto LAB_00313bae;
LAB_0030c1d9:
  local_308 = (ulong *)(lVar27 + lVar36);
  lVar27 = lVar37 + 0x400000000 >> 0x20;
  piVar1 = (int *)((lVar37 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  cVar25 = *(char *)(lVar27 + lVar38 * lVar15 + local_208._24_8_);
  piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)puVar40 * 4 + 8 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  cVar34 = *(char *)((long)puVar40 + lVar36 + 2 + lVar15 * lVar47 + local_208._24_8_);
  if (cVar25 == '\0') {
    if (cVar34 == '\0') {
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
           uVar10;
      local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
LAB_00303dda:
      iVar11 = (int)local_308;
      uVar10 = iVar11 + 2;
      if ((int)uVar10 < iVar29) {
        local_220 = (ulong *)(uVar19 - 1);
        lVar37 = (long)iVar11;
        lVar38 = lVar37 + 2;
        lVar36 = lVar37 << 0x20;
        lVar27 = lVar37 * 4;
        lVar41 = 8;
        lVar28 = 0;
        do {
          plVar39 = local_230;
          piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar27 + 8 + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          lVar32 = lVar36 >> 0x1e;
          lVar52 = lVar36 >> 0x20;
          if (*(char *)(lVar28 + 2 + uVar19 * lVar15 + local_208._24_8_ + lVar37) != '\0') {
            uVar17 = lVar38 + lVar28;
            lVar38 = lVar36 + 0x300000000 >> 0x20;
            piVar1 = (int *)((lVar36 + 0x300000000 >> 0x1e) +
                            *local_158 * (long)local_220 + local_190);
            *piVar1 = *piVar1 + 1;
            uVar10 = (uint)uVar17;
            if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * (long)local_220) != '\0') {
              uVar46 = *local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar28 * 4 + lVar37 * 4 + uVar46 * (long)local_130 + 8);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ +
                                lVar28 * 4 + lVar37 * 4 + uVar21 * (long)local_130 + 8);
              piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19));
              piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + *local_248 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + *local_2a8 * uVar19 + 8) =
                   uVar10;
              local_308 = (ulong *)(uVar17 & 0xffffffff);
              plVar39 = local_230;
              goto LAB_00303119;
            }
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
              uVar46 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19);
              piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + uVar46 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar21 * uVar19 + 8) =
                   uVar12;
              local_308 = (ulong *)(uVar17 & 0xffffffff);
              goto LAB_0030da61;
            }
            piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) +
                            (long)local_220 * *local_158 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar27 = lVar36 + 0x400000000 >> 0x20;
            if (*(char *)(lVar27 + local_208._24_8_ + lVar15 * (long)local_220) == '\0')
            goto LAB_00306e00;
            lVar15 = uVar19 - 2;
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            uVar17 = *local_248;
            puVar40 = (ulong *)(uVar17 * uVar19 + (long)local_280);
            if (*(char *)(lVar38 + *(long *)local_208._80_8_ * lVar15 + local_208._24_8_) != '\0') {
              piVar1 = (int *)((long)local_280 +
                              lVar28 * 4 + lVar37 * 4 + uVar17 * (long)local_130 + 8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_2a8;
              goto LAB_00306a83;
            }
            piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * lVar15);
            *piVar1 = *piVar1 + 1;
LAB_0030776b:
            uVar17 = *local_2a8;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (uVar19 - 2) * uVar17);
            piVar1 = (int *)((long)puVar40 + lVar52 * 4);
            *piVar1 = *piVar1 + 1;
            v = *(uint *)(local_2f8._24_8_ + lVar52 * 4 + uVar17 * uVar19);
LAB_00307794:
            uVar13 = TTA::MemMerge(uVar13,v);
            piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + *local_248 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + *local_2a8 * uVar19 + 8) = uVar13
            ;
            local_308 = (ulong *)(ulong)uVar10;
            plVar39 = local_230;
            goto LAB_00305084;
          }
          piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 + 8 + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + 2 + local_208._24_8_ + lVar37 + lVar15 * (long)local_230) != '\0')
          {
            uVar17 = lVar38 + lVar28;
            lVar38 = lVar36 + 0x300000000 >> 0x20;
            piVar1 = (int *)(local_190 + *local_158 * uVar19 + (lVar36 + 0x300000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            uVar10 = (uint)uVar17;
            if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
              uVar46 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19);
              piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + uVar46 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar21 * uVar19 + 8) =
                   uVar12;
              local_308 = (ulong *)(uVar17 & 0xffffffff);
              goto LAB_0030b131;
            }
            piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * (long)local_220) != '\0') {
              uVar46 = *local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar28 * 4 + lVar37 * 4 + uVar46 * (long)local_130 + 8);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ +
                                lVar28 * 4 + lVar37 * 4 + uVar21 * (long)local_130 + 8);
              piVar1 = (int *)((long)local_280 + lVar32 + uVar46 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar32 + uVar21 * uVar19));
              piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + *local_248 * uVar19 + 8);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + *local_2a8 * uVar19 + 8) =
                   uVar10;
              local_308 = (ulong *)(uVar17 & 0xffffffff);
              plVar39 = local_230;
              goto LAB_0030a8be;
            }
            piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) +
                            *local_158 * (long)local_220 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar27 = lVar36 + 0x400000000 >> 0x20;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)(lVar27 + (long)local_220 * lVar15 + local_208._24_8_) != '\0') {
              lVar41 = uVar19 - 2;
              piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_248;
              puVar40 = (ulong *)(uVar17 * uVar19 + (long)local_280);
              if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
                piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * lVar41);
                *piVar1 = *piVar1 + 1;
                goto LAB_0030776b;
              }
              piVar1 = (int *)((long)local_280 +
                              lVar28 * 4 + lVar37 * 4 + uVar17 * (long)local_130 + 8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_2a8;
LAB_00306a83:
              uVar13 = *(uint *)(local_2f8._24_8_ +
                                lVar28 * 4 + lVar37 * 4 + uVar17 * (long)local_130 + 8);
              piVar1 = (int *)((long)puVar40 + lVar52 * 4);
              *piVar1 = *piVar1 + 1;
              v = *(uint *)(local_2f8._24_8_ + lVar52 * 4 + uVar17 * uVar19);
              goto LAB_00307794;
            }
LAB_00306e00:
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar32 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar32 + uVar46 * uVar19);
            piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar46 * uVar19 + 8) =
                 uVar12;
            local_308 = (ulong *)(ulong)uVar10;
            plVar48 = local_230;
            goto LAB_0030d1a8;
          }
          piVar1 = (int *)(local_190 + lVar27 + *local_158 * uVar19 + 0xc + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          lVar32 = local_208._24_8_ + lVar37;
          if (*(char *)(lVar28 + 3 + uVar19 * lVar15 + lVar32) == '\0') goto LAB_00304ead;
          piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 + 0xc + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          iVar20 = (int)lVar38;
          if (*(char *)(lVar28 + 3 + lVar32 + lVar15 * lVar47) != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar28 * 4 + lVar37 * 4 + uVar17 * (long)local_130 + 8);
            *piVar1 = *piVar1 + 1;
            local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar28);
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)
                      (local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar46 * (long)local_130 + 8);
            piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar46 * uVar19 + 8) =
                 uVar12;
            goto LAB_0030a8be;
          }
          piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 + 0x10 + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + 4 + *(long *)local_208._80_8_ * lVar47 + local_208._24_8_ + lVar37)
              != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar28 * 4 + lVar37 * 4 + uVar17 * (long)local_130 + 0x10);
            *piVar1 = *piVar1 + 1;
            local_308 = (ulong *)(ulong)(uint)(iVar20 + (int)lVar28);
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)
                      (local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar46 * (long)local_130 + 0x10)
            ;
            piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + uVar17 * uVar19 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + uVar46 * uVar19 + 8) =
                 uVar12;
            goto LAB_00305084;
          }
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar27 + *local_248 * uVar19 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar27 + *local_2a8 * uVar19 + 8) = uVar10;
          lVar36 = lVar36 + 0x200000000;
          lVar41 = lVar41 + 8;
          lVar15 = lVar37 + lVar28;
          lVar28 = lVar28 + 2;
          if ((long)uVar42 <= lVar15 + 4) {
            iVar11 = iVar11 + (int)lVar28;
            uVar10 = iVar20 + (int)lVar28;
            plVar39 = local_230;
            break;
          }
        } while( true );
      }
      plVar48 = plVar39;
      if (iVar29 < (int)uVar10) {
        local_308 = (ulong *)(ulong)uVar10;
        goto LAB_0030ad80;
      }
      lVar38 = (long)(int)uVar10;
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar41 = (long)iVar11;
      if (*(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
        piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
        if (cVar25 == '\0') goto LAB_0030d64b;
        if (cVar34 == '\0') goto LAB_00312c9d;
      }
      piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * (uVar19 - 1)) == '\0')
      goto LAB_00312c9d;
      goto LAB_0031203c;
    }
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + uVar17 * (long)local_130 + 8
                    );
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)
              (local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) =
         uVar12;
    local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
    goto LAB_003039a7;
  }
  if (cVar34 == '\0') {
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (long)local_220);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + (long)local_220 * uVar46);
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) =
         uVar12;
    local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
  }
  else {
    piVar1 = (int *)(*local_158 * (long)local_130 + local_190 + (long)puVar40 * 4 + 0xc + lVar36 * 4
                    );
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)((long)puVar40 +
                      lVar36 + 3 + *(long *)local_208._80_8_ * (long)local_130 + local_208._24_8_);
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + uVar17 * (long)local_130 + 8
                    );
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ +
                      lVar36 * 4 + (long)puVar40 * 4 + uVar46 * (long)local_130 + 8);
    if (cVar25 == '\0') {
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (long)local_220);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                             lVar27 * 4 + uVar46 * (long)local_220));
      piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + *local_248 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + *local_2a8 * uVar19 + 8) =
           uVar10;
    }
    else {
      piVar1 = (int *)((long)local_280 + lVar36 * 4 + (long)puVar40 * 4 + uVar17 * uVar19 + 8);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * 4 + uVar46 * uVar19 + 8) = uVar10;
    }
  }
  goto LAB_00305084;
LAB_00304ead:
  local_308 = (ulong *)(lVar38 + lVar28);
  uVar17 = *local_158;
  piVar1 = (int *)(uVar17 * (long)local_230 + local_190 + lVar37 * 4 + 0xc + lVar28 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar28 + 3 + lVar32 + (long)local_230 * lVar15) != '\0') {
    uVar10 = TTA::MemNewLabel();
    piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + *local_248 * uVar19 + 8);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar37 * 4 + *local_2a8 * uVar19 + 8) = uVar10;
    local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
    goto LAB_00308812;
  }
  piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar37 * 4 + *local_248 * uVar19 + 8);
  *piVar1 = *piVar1 + 1;
  puVar40 = (ulong *)(local_2f8._24_8_ + lVar41 + lVar37 * 4 + *local_2a8 * uVar19);
LAB_0030cd34:
  local_308 = (ulong *)((ulong)local_308 & 0xffffffff);
LAB_003080de:
  plVar39 = local_230;
  *(undefined4 *)puVar40 = 0;
  uVar10 = (int)local_308 + 2;
  uVar46 = (ulong)uVar10;
  if ((int)uVar10 < iVar29) {
    local_220 = local_280;
    local_228 = local_248;
    lVar38 = (long)(int)local_308;
    uVar46 = lVar38 + 2;
LAB_00308160:
    local_308 = (ulong *)uVar46;
    piVar1 = (int *)(local_190 + uVar17 * uVar19 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_208._24_8_ + lVar15 * uVar19 + (long)local_308) == '\0') {
      uVar46 = *local_158;
      lVar41 = uVar46 * (uVar19 | 1) + local_190;
      piVar1 = (int *)(lVar41 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = *(long *)local_208._80_8_;
      lVar36 = lVar27 * (uVar19 | 1) + local_208._24_8_;
      if (*(char *)((long)local_308 + lVar36) == '\0') {
        piVar1 = (int *)(uVar46 * uVar19 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 3 + lVar27 * uVar19 + local_208._24_8_) == '\0') {
          piVar1 = (int *)(lVar41 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 3 + lVar38) != '\0') goto LAB_003087be;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = 0;
          uVar46 = (long)local_308 + 2;
          lVar38 = lVar38 + 2;
          if ((long)uVar42 <= (long)uVar46) goto LAB_00308240;
          goto LAB_00308160;
        }
        lVar15 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
        if (*(char *)(lVar38 + 3 + lVar27) != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_0030a8be;
        }
        lVar36 = (lVar38 << 0x20) + 0x400000000;
        lVar41 = lVar36 >> 0x20;
        piVar1 = (int *)((lVar36 >> 0x1e) + *local_158 * lVar15 + local_190);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar27 + lVar41);
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        cVar34 = *(char *)((long)local_308 + lVar15 * lVar27 + local_208._24_8_);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') goto LAB_0030e6f4;
          goto LAB_003151d4;
        }
        lVar15 = uVar19 - 2;
        if (cVar34 != '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + 3 + local_208._24_8_ + lVar27 * lVar15);
          uVar46 = *local_248;
          lVar38 = uVar46 * lVar15;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15 * uVar17);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar38);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar15 * uVar17);
LAB_0030a498:
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            uVar17 = *local_248;
            goto LAB_0030a4ad;
          }
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
          goto LAB_00309b08;
        }
        uVar46 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar46 * lVar15);
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + lVar15 * uVar17);
        puVar40 = (ulong *)(uVar46 * uVar19 + (long)local_280);
LAB_0030f220:
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar17 * uVar19) = uVar12;
        goto LAB_00305084;
      }
      lVar15 = (lVar38 << 0x20) + 0x300000000;
      lVar27 = lVar15 >> 0x20;
      piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * uVar19 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      if (*(char *)(lVar27 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
        uVar10 = TTA::MemNewLabel();
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        plVar39 = local_230;
        goto LAB_0030b131;
      }
      lVar41 = uVar19 - 1;
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + local_208._24_8_ + lVar15 * lVar41) != '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_0030a8be;
      }
      lVar15 = (lVar38 << 0x20) + 0x400000000;
      piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar41 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar15 = lVar15 >> 0x20;
      lVar38 = *(long *)local_208._80_8_ * lVar41 + local_208._24_8_;
      cVar25 = *(char *)(lVar15 + lVar38);
      piVar1 = (int *)(lVar41 * *local_158 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      cVar34 = *(char *)((long)local_308 + lVar38);
      if (cVar25 != '\0') {
        lVar38 = uVar19 - 2;
        if (cVar34 == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        }
        else {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar27 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_);
          uVar46 = *local_248;
          lVar27 = uVar46 * lVar38;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38 * uVar17);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar27);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar17);
            goto LAB_0030a498;
          }
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
LAB_00309b08:
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar17 * uVar19) = uVar10;
        }
        goto LAB_00305084;
      }
      if (cVar34 == '\0') goto LAB_003151d4;
LAB_0030e6f4:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003039a7;
    }
    lVar15 = uVar19 - 1;
    lVar41 = lVar38 << 0x20;
    lVar36 = lVar41 + 0x300000000 >> 0x20;
    piVar1 = (int *)((lVar41 + 0x300000000 >> 0x1e) + *local_158 * lVar15 + local_190);
    *piVar1 = *piVar1 + 1;
    lVar27 = *(long *)local_208._80_8_;
    lVar28 = lVar27 * lVar15 + local_208._24_8_;
    iVar11 = (int)lVar38;
    if (*(char *)(lVar36 + lVar28) != '\0') {
      piVar1 = (int *)(local_190 + *local_158 * lVar15 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar28 + (long)local_308) != '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00303119;
      }
      piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar27 = *(long *)local_208._80_8_;
      lVar38 = uVar19 - 2;
      if (*(char *)((lVar41 + 0x100000000 >> 0x20) + lVar15 * lVar27 + local_208._24_8_) == '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar38);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00303119;
      }
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar27 * lVar38);
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar38;
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar38 = lVar38 * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar38);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38));
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_00303119;
      }
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
      goto LAB_00303119;
    }
    piVar1 = (int *)(local_190 + *local_158 * uVar19 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = *local_158 * lVar15 + local_190;
    if (*(char *)(lVar36 + local_208._24_8_ + lVar27 * uVar19) == '\0') {
      piVar1 = (int *)(lVar38 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
      if (*(char *)((long)local_308 + lVar38) == '\0') {
        piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + lVar15 * *local_158 + local_190);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + (lVar41 + 0x100000000 >> 0x20)) == '\0') goto LAB_00310a80;
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
        goto LAB_00310a77;
      }
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003126fa;
    }
    piVar1 = (int *)(lVar38 + (lVar41 + 0x400000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    lVar38 = lVar41 + 0x400000000 >> 0x20;
    lVar27 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
    cVar25 = *(char *)(lVar38 + lVar27);
    piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    cVar34 = *(char *)((long)local_308 + lVar27);
    if (cVar25 != '\0') {
      if (cVar34 == '\0') {
        piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
        *piVar1 = *piVar1 + 1;
        lVar28 = *(long *)local_208._80_8_;
        lVar27 = uVar19 - 2;
        if (*(char *)((lVar41 + 0x100000000 >> 0x20) + lVar15 * lVar28 + local_208._24_8_) == '\0')
        {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar27);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + lVar27 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        }
        else {
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + local_208._24_8_ + lVar28 * lVar27) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar27);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar27 * uVar46);
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar27);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar27 * uVar46)
                                  );
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          }
          else {
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)local_308 +
                              *(long *)local_208._80_8_ * lVar27 + local_208._24_8_);
            uVar17 = *local_248;
            lVar15 = uVar17 * lVar27;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            lVar27 = lVar27 * uVar46;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar27);
            if (cVar25 == '\0') {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                     (long)local_308 * 4 + lVar27));
              uVar17 = *local_248;
LAB_0030a4ad:
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            }
            else {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
            }
          }
        }
      }
      else {
        lVar15 = uVar19 - 2;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar36 + *(long *)local_208._80_8_ * lVar15 + local_208._24_8_);
        uVar17 = *local_248;
        lVar27 = uVar17 * lVar15;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar15 = lVar15 * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15));
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        }
        else {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
        }
      }
      goto LAB_00305084;
    }
    if (cVar34 != '\0') {
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003039a7;
    }
    piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
    *piVar1 = *piVar1 + 1;
    if (*(char *)((lVar41 + 0x100000000 >> 0x20) +
                 lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0') {
LAB_003151d4:
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    }
    else {
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
LAB_0030fb3f:
      *(undefined4 *)((long)puVar40 + (long)local_308 * 4) = uVar12;
    }
    goto LAB_00303dda;
  }
LAB_00308240:
  lVar38 = (long)(int)uVar46;
  piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  cVar25 = *(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_);
  iVar11 = (int)local_308;
  if (iVar29 < (int)uVar46) {
    if (cVar25 == '\0') {
      piVar1 = (int *)(local_190 + *local_158 * (uVar19 | 1) + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
      goto joined_r0x00308443;
    }
    lVar27 = uVar19 - 1;
    piVar1 = (int *)(local_190 + *local_158 * lVar27 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * lVar27) != '\0') goto LAB_00313b57;
    lVar15 = (long)iVar11;
    piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + lVar15 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar15 + 1 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0')
    goto LAB_00313794;
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
  }
  else {
    if (cVar25 == '\0') {
      piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1));
      lVar41 = (long)iVar11;
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
      plVar48 = local_230;
      if (cVar25 == '\0') goto LAB_0030b051;
      if (cVar34 != '\0') goto LAB_0030b05a;
      goto LAB_00313794;
    }
    lVar27 = uVar19 - 1;
    lVar41 = (long)iVar11;
    piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar27);
    piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
    if (cVar25 != '\0') {
      if (*(char *)(lVar38 + lVar15) != '\0') goto LAB_00313b57;
      piVar1 = (int *)(lVar27 * *local_158 + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar15 + 1 + lVar41) == '\0') goto LAB_0030af2a;
      piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * (uVar19 - 2) + local_208._24_8_;
LAB_00313ac0:
      cVar25 = *(char *)(lVar38 + lVar15);
      plVar48 = plVar39;
      goto LAB_00313ac4;
    }
    if (*(char *)(lVar38 + lVar15) != '\0') goto LAB_00313b57;
    piVar1 = (int *)(lVar27 * *local_158 + local_190 + 4 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar15 + 1 + lVar41) == '\0') goto LAB_00313794;
LAB_00312be1:
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + (uVar19 - 2) * uVar46);
  }
  piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  goto LAB_00312c25;
LAB_003087be:
  uVar10 = TTA::MemNewLabel();
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
  plVar39 = local_230;
LAB_00308812:
  uVar10 = (int)local_308 + 2;
  uVar17 = (ulong)uVar10;
  if ((int)uVar10 < iVar29) {
    uVar46 = uVar19 | 1;
    lVar38 = (long)(int)local_308;
    uVar17 = lVar38 + 2;
LAB_0030882c:
    local_308 = (ulong *)uVar17;
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    iVar11 = (int)lVar38;
    if (*(char *)((long)local_308 + lVar15 * uVar19 + local_208._24_8_) != '\0') goto LAB_00308d55;
    piVar1 = (int *)(*local_158 * uVar46 + local_190 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    lVar27 = *local_158 * uVar19 + local_190;
    if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * uVar46) == '\0') {
      piVar1 = (int *)(lVar27 + 0xc + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      if (*(char *)(lVar38 + 3 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
        uVar17 = *local_158;
        piVar1 = (int *)(uVar17 * uVar46 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 3 + lVar15 * uVar46 + local_208._24_8_) != '\0')
        goto code_r0x0030891c;
LAB_0030c092:
        puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
LAB_0030c0a9:
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19);
        goto LAB_003080de;
      }
      lVar27 = uVar19 - 1;
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 3 + local_208._24_8_ + lVar15 * lVar27) != '\0') goto LAB_0030c179;
      lVar15 = (lVar38 << 0x20) + 0x400000000;
      piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar27 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar15 = lVar15 >> 0x20;
      lVar41 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
      cVar25 = *(char *)(lVar15 + lVar41);
      piVar1 = (int *)(lVar27 * *local_158 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      cVar34 = *(char *)((long)local_308 + lVar41);
      if (cVar25 == '\0') goto joined_r0x0031402f;
      lVar27 = uVar19 - 2;
      if (cVar34 == '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + lVar27 * uVar46);
LAB_00310056:
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      }
      else {
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + 3 + *(long *)local_208._80_8_ * lVar27 + local_208._24_8_);
        uVar17 = *local_248;
        puVar40 = (ulong *)(uVar17 * lVar27 + (long)local_280);
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        puVar50 = (ulong *)(lVar27 * uVar46 + local_2f8._24_8_);
        uVar10 = *(uint *)((long)puVar50 + (long)local_308 * 4);
joined_r0x00312674:
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)puVar40 + lVar15 * 4);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)((long)puVar50 + lVar15 * 4);
LAB_00314097:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          uVar17 = *local_248;
          goto LAB_003140ac;
        }
LAB_0031267a:
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
LAB_0031268a:
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
      }
    }
    else {
      lVar15 = (lVar38 << 0x20) + 0x300000000;
      lVar41 = lVar15 >> 0x20;
      piVar1 = (int *)(lVar27 + (lVar15 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      if (*(char *)(lVar41 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_0030b131;
      }
      lVar27 = uVar19 - 1;
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar27) != '\0') goto LAB_0030b859;
      lVar15 = (lVar38 << 0x20) + 0x400000000;
      lVar28 = lVar15 >> 0x20;
      piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar27 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar36 = lVar15 * lVar27 + local_208._24_8_;
      if (*(char *)(lVar28 + lVar36) == '\0') goto LAB_00309e26;
      lVar36 = uVar19 - 2;
      piVar1 = (int *)(*local_158 * lVar36 + local_190 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar36) != '\0') goto LAB_0030a7de;
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar36;
      if (*(char *)((long)local_308 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0'
         ) {
        piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar36 * uVar46);
        lVar15 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
LAB_00310b7f:
        uVar13 = *(uint *)((long)puVar40 + lVar15 * 4);
        goto LAB_0030a832;
      }
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar17 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar36 * uVar17);
      piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar13 = *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar36 * uVar17);
LAB_0030c722:
      uVar10 = TTA::MemMerge(uVar10,uVar13);
      piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                             (long)(int)lVar38 * 4 + *local_2a8 * uVar19));
LAB_0030c771:
      puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
LAB_0030c78d:
      piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    }
    goto LAB_00305084;
  }
LAB_00308972:
  lVar38 = (long)(int)uVar17;
  piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  cVar25 = *(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_);
  iVar11 = (int)local_308;
  if (iVar29 < (int)uVar17) {
    if (cVar25 == '\0') {
      piVar1 = (int *)((uVar19 | 1) * *local_158 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = *local_248 * uVar19;
      if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 | 1)) == '\0') {
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = 0;
      }
      else {
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar17 * uVar19);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar17 * uVar19) = uVar12;
      }
      goto LAB_00313bae;
    }
    lVar27 = uVar19 - 1;
    lVar41 = (long)iVar11;
    piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * lVar27) != '\0') {
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar41 * 4 + uVar46 * uVar19));
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
      goto LAB_00313bae;
    }
    piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar38 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_);
joined_r0x00311ea3:
    if (cVar25 != '\0') goto LAB_0031203c;
    goto LAB_00312c9d;
  }
  lVar27 = (long)iVar11;
  if (cVar25 == '\0') {
    uVar17 = uVar19 | 1;
    piVar1 = (int *)(*local_158 * uVar17 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar17);
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    cVar34 = *(char *)(lVar27 + 3 + lVar15 * uVar19 + local_208._24_8_);
    if (cVar25 != '\0') {
      if (cVar34 != '\0') {
        lVar41 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + lVar41 * *(long *)local_208._80_8_ + local_208._24_8_);
          goto joined_r0x00308d11;
        }
        goto LAB_0030979e;
      }
LAB_00308d17:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar46 * uVar19);
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_00313bae;
    }
    if (cVar34 != '\0') {
      lVar41 = uVar19 - 1;
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) != '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00313bae;
      }
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + lVar41 * *(long *)local_208._80_8_ + local_208._24_8_);
      goto joined_r0x003130eb;
    }
    piVar1 = (int *)(uVar17 * *local_158 + local_190 + 0xc + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar17) == '\0') {
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = 0;
      goto LAB_00313bae;
    }
    uVar10 = TTA::MemNewLabel();
  }
  else {
    lVar41 = uVar19 - 1;
    piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * lVar41 + local_208._24_8_;
      if (*(char *)(lVar27 + 1 + lVar15) == '\0') {
        piVar1 = (int *)(lVar41 * *local_158 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar15 + lVar38);
joined_r0x00308d11:
        if (cVar25 == '\0') goto LAB_00308d17;
        goto LAB_0030979e;
      }
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (uVar19 - 2) * uVar46);
LAB_003097d8:
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar13 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar46 * uVar19);
    }
    else {
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * lVar41 + local_208._24_8_;
      if (*(char *)(lVar38 + lVar15) != '\0') {
LAB_0030979e:
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
        goto LAB_003097d8;
      }
      piVar1 = (int *)(lVar41 * *local_158 + local_190 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = uVar19 - 2;
      if (*(char *)(lVar15 + 1 + lVar27) == '\0') goto LAB_0030979e;
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + *(long *)local_208._80_8_ * lVar41 + local_208._24_8_);
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar41;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar41 = lVar41 * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar41);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar41));
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + *local_2a8 * uVar19);
      }
      else {
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar46 * uVar19);
      }
    }
    uVar10 = TTA::MemMerge(uVar10,uVar13);
  }
  piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
  goto LAB_00313bae;
code_r0x0030891c:
  uVar10 = TTA::MemNewLabel();
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
  uVar17 = (long)local_308 + 2;
  lVar38 = lVar38 + 2;
  if ((long)uVar42 <= (long)uVar17) goto LAB_00308972;
  goto LAB_0030882c;
LAB_00308d55:
  lVar27 = uVar19 - 1;
  lVar41 = lVar38 << 0x20;
  lVar36 = lVar41 + 0x300000000 >> 0x20;
  piVar1 = (int *)((lVar41 + 0x300000000 >> 0x1e) + *local_158 * lVar27 + local_190);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar36 + local_208._24_8_ + lVar15 * lVar27) != '\0') {
    piVar1 = (int *)(local_190 + *local_158 * lVar27 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
    if (*(char *)((long)local_308 + lVar15) == '\0') {
      piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + lVar27 * *local_158 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar38 = uVar19 - 2;
      if (*(char *)(lVar15 + (lVar41 + 0x100000000 >> 0x20)) != '\0') {
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_);
        uVar17 = *local_248;
        lVar27 = uVar17 * lVar38;
        lVar15 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar46);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38 * uVar46);
          goto LAB_0030f857;
        }
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        goto LAB_0030caef;
      }
    }
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
    piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
LAB_00308e47:
    uVar10 = TTA::MemMerge(uVar10,uVar13);
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
LAB_00303119:
    uVar10 = (int)local_308 + 2;
    uVar17 = (ulong)uVar10;
    if ((int)uVar10 < iVar29) {
      lVar38 = uVar19 - 1;
      puVar40 = (ulong *)(uVar19 - 2);
      uVar46 = uVar19 | 1;
      lVar27 = (long)(int)local_308;
      uVar17 = lVar27 + 2;
      local_220 = puVar40;
      while( true ) {
        local_308 = (ulong *)uVar17;
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        lVar41 = lVar15 * uVar19 + local_208._24_8_;
        iVar11 = (int)lVar27;
        plVar48 = plVar39;
        if (*(char *)((long)local_308 + lVar41) == '\0') break;
        piVar1 = (int *)(local_190 + *local_158 * uVar19 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + lVar27) == '\0') {
          piVar1 = (int *)(*local_158 * uVar46 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          cVar25 = *(char *)(lVar27 + 1 + lVar15 * uVar46 + local_208._24_8_);
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar34 = *(char *)(lVar27 + 3 + lVar15 * lVar38 + local_208._24_8_);
          if (cVar25 == '\0') {
            if (cVar34 == '\0') goto LAB_0030684e;
            piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)((long)local_308 + lVar15 * lVar38 + local_208._24_8_) != '\0')
            goto LAB_0030321a;
          }
          else {
            if (cVar34 == '\0') {
              piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)(lVar27 + 3 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
                uVar17 = *local_248;
                lVar15 = (lVar27 << 0x20) >> 0x1e;
                piVar1 = (int *)((long)local_280 + lVar15 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 + (long)puVar40 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_0030da61;
              }
              lVar36 = (lVar27 << 0x20) + 0x400000000;
              lVar41 = lVar36 >> 0x20;
              piVar1 = (int *)((lVar36 >> 0x1e) + *local_158 * lVar38 + local_190);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar38) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_0030d1a8;
              }
              piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + 0xc + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)(lVar27 + 3 + lVar15 * (long)puVar40 + local_208._24_8_) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                puVar50 = (ulong *)((long)puVar40 * *local_2a8 + local_2f8._24_8_);
                uVar10 = *(uint *)((long)puVar50 + (long)iVar11 * 4);
                piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                goto LAB_0030766d;
              }
              piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_00305084;
              }
              piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((long)local_308 +
                                *(long *)local_208._80_8_ * (long)puVar40 + local_208._24_8_);
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
              if (cVar25 == '\0') {
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
                goto LAB_0030a832;
              }
LAB_00307a7f:
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
              goto LAB_00305084;
            }
            piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)((long)local_308 + lVar15 * lVar38 + local_208._24_8_) != '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (long)puVar40);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar21 * (long)puVar40);
              goto LAB_00303350;
            }
          }
          piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * (long)puVar40);
          uVar17 = *local_248;
          lVar15 = uVar17 * (long)puVar40;
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar21 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar21 * (long)puVar40);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   (long)local_308 * 4 + uVar21 * (long)puVar40));
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar21 = *local_2a8;
            puVar40 = local_220;
          }
          else {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            puVar40 = local_220;
          }
        }
        else {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          lVar41 = lVar15 * lVar38 + local_208._24_8_;
          if (*(char *)(lVar27 + 3 + lVar41) == '\0') {
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar19) == '\0') {
              uVar17 = *local_248;
              lVar15 = (lVar27 << 0x20) >> 0x1e;
              piVar1 = (int *)((long)local_280 + lVar15 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 + uVar46 * uVar19);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              goto LAB_0030da61;
            }
            lVar15 = (lVar27 << 0x20) + 0x400000000;
            lVar41 = lVar15 >> 0x20;
            piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar38 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)(lVar41 + lVar15 * lVar38 + local_208._24_8_) == '\0') goto LAB_00306dbf;
            piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + 0xc + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * (long)puVar40) == '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * (long)puVar40);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar40 * uVar46);
              lVar41 = (long)iVar11;
              piVar1 = (int *)((long)local_280 + lVar41 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              puVar50 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
LAB_0030766d:
              uVar13 = *(uint *)((long)puVar50 + lVar41 * 4);
LAB_0031528c:
              uVar10 = TTA::MemMerge(uVar10,uVar13);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            }
            else {
              piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              lVar15 = *(long *)local_208._80_8_;
              if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_00305084;
              }
              piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_248;
              if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * (long)puVar40) == '\0') {
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
                goto LAB_0030a832;
              }
              piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46)
              ;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            }
            goto LAB_00305084;
          }
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + (long)local_308) == '\0') {
            piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *local_248 * (long)puVar40;
            lVar41 = *local_248 * uVar19;
            if (*(char *)((long)local_308 +
                         *(long *)local_208._80_8_ * (long)puVar40 + local_208._24_8_) == '\0') {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar17 * (long)puVar40);
              piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar41);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                     lVar27 * 4 + uVar17 * uVar19));
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              puVar40 = local_220;
            }
            else {
              piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar21 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar21 * (long)puVar40);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar41);
              *piVar1 = *piVar1 + 1;
            }
          }
          else {
LAB_0030321a:
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
            *piVar1 = *piVar1 + 1;
            uVar21 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar21 * (long)puVar40);
LAB_00303350:
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
          }
        }
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar21 * uVar19) = uVar10;
        uVar17 = (long)local_308 + 2;
        lVar27 = lVar27 + 2;
        if ((long)uVar42 <= (long)uVar17) goto LAB_00304437;
      }
      piVar1 = (int *)(local_190 + *local_158 * uVar46 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * uVar46);
      lVar36 = lVar27 << 0x20;
      piVar1 = (int *)((lVar36 + 0x300000000 >> 0x1e) + *local_158 * uVar19 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar41 = lVar36 + 0x300000000 >> 0x20;
      lVar15 = *(long *)local_208._80_8_;
      lVar28 = lVar15 * uVar19 + local_208._24_8_;
      cVar34 = *(char *)(lVar41 + lVar28);
      uVar17 = *local_158;
      if (cVar25 == '\0') {
        if (cVar34 != '\0') {
          piVar1 = (int *)(local_190 + uVar17 * lVar38 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)
                      (local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
LAB_0030732f:
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            goto LAB_0030a8be;
          }
          piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
          *piVar1 = *piVar1 + 1;
          lVar15 = lVar36 + 0x400000000 >> 0x20;
          lVar27 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
          cVar34 = *(char *)(lVar15 + lVar27);
          piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)local_308 + lVar27);
joined_r0x00306f22:
          if (cVar34 == '\0') {
            if (cVar25 != '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)
                        (local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              goto LAB_003039a7;
            }
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            goto LAB_00303dda;
          }
          if (cVar25 == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (long)local_220);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + (long)local_220 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          }
          else {
            piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(lVar41 + *(long *)local_208._80_8_ * (long)local_220 +
                                        local_208._24_8_);
            uVar17 = *local_248;
            lVar27 = uVar17 * (long)local_220;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            lVar38 = (long)local_220 * uVar46;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38);
            if (cVar25 == '\0') {
              piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar27);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar38));
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            }
            else {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
            }
          }
          goto LAB_00305084;
        }
        piVar1 = (int *)(uVar17 * uVar46 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + uVar46 * lVar15 + local_208._24_8_) == '\0') {
          puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
          goto LAB_0030c0a9;
        }
        uVar10 = TTA::MemNewLabel();
        puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
LAB_0030c06c:
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_00308812;
      }
      lVar37 = lVar36 + 0x100000000 >> 0x20;
      if (cVar34 == '\0') {
        piVar1 = (int *)(local_190 + uVar17 * uVar46 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + local_208._24_8_ + lVar15 * uVar46) != '\0') goto LAB_003137e5;
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + *(long *)local_208._80_8_ * uVar19 + local_208._24_8_) != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_0030b131;
        }
        uVar10 = TTA::MemNewLabel();
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_0030b131;
      }
      piVar1 = (int *)(local_190 + uVar17 * uVar19 + lVar37 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar28 + lVar37) != '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar38 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        lVar27 = *local_158 * lVar38 + local_190;
        if (*(char *)(lVar41 + lVar15) == '\0') {
          piVar1 = (int *)(lVar27 + (lVar36 + 0x400000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          lVar27 = lVar36 + 0x400000000 >> 0x20;
          if (*(char *)(lVar15 + lVar27) == '\0') {
LAB_00306dbf:
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            goto LAB_0030d1a8;
          }
          piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)(lVar41 + lVar15 * (long)local_220 + local_208._24_8_) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (long)local_220);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (long)local_220 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   (long)iVar11 * 4 + uVar46 * uVar19));
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          }
          else {
            piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar38) == '\0') {
              piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_248;
              if (*(char *)((long)local_308 +
                           *(long *)local_208._80_8_ * (long)local_220 + local_208._24_8_) == '\0')
              {
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46
                                  );
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       (long)iVar11 * 4 + uVar46 * uVar19));
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              }
              else {
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)local_220);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)
                          (local_2f8._24_8_ + (long)iVar11 * 4 + (long)local_220 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              }
            }
            else {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)
                        (local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            }
          }
          goto LAB_00305084;
        }
        piVar1 = (int *)(lVar27 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar15 + (long)local_308) != '\0') {
LAB_003072eb:
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)
                    (local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
          goto LAB_0030732f;
        }
        piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_248;
        if (*(char *)((long)local_308 +
                     *(long *)local_208._80_8_ * (long)local_220 + local_208._24_8_) == '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
          goto LAB_00307ea7;
        }
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)local_220);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)local_220 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_0030a8be;
      }
      piVar1 = (int *)(local_190 + *local_158 * uVar46 + lVar37 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar25 = *(char *)(lVar37 + uVar46 * lVar15 + local_208._24_8_);
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar34 = *(char *)(lVar41 + lVar15 * lVar38 + local_208._24_8_);
      if (cVar25 == '\0') {
        if (cVar34 == '\0') {
          piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
          *piVar1 = *piVar1 + 1;
          lVar15 = lVar36 + 0x400000000 >> 0x20;
          lVar27 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
          cVar34 = *(char *)(lVar15 + lVar27);
          piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)local_308 + lVar27);
          goto joined_r0x00306f22;
        }
        goto LAB_003072eb;
      }
      lVar15 = *local_158 * lVar38 + local_190;
      if (cVar34 != '\0') {
        piVar1 = (int *)(lVar15 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
          piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * (long)local_220);
          uVar17 = *local_248;
          lVar38 = uVar17 * (long)local_220;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          lVar15 = (long)local_220 * uVar46;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar15);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar38);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15);
LAB_00307ea7:
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          }
          else {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          }
        }
        else {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)local_220);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)local_220 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        }
        goto LAB_0030a8be;
      }
      lVar27 = lVar36 + 0x400000000 >> 0x20;
      piVar1 = (int *)(lVar15 + (lVar36 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar36 = lVar15 * lVar38 + local_208._24_8_;
      if (*(char *)(lVar27 + lVar36) == '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_248;
        lVar15 = (long)iVar11;
        if (*(char *)(lVar36 + (long)local_308) != '\0') {
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (long)local_220);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + (long)local_220 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_003039a7;
        }
        puVar40 = (ulong *)((long)local_280 + uVar17 * uVar19);
        goto LAB_003106b7;
      }
      piVar1 = (int *)(local_190 + *local_158 * (long)local_220 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar41 + local_208._24_8_ + lVar15 * (long)local_220);
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar34 = *(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_);
      if (cVar25 == '\0') {
        uVar17 = *local_248;
        lVar15 = uVar17 * (long)local_220;
        if (cVar34 == '\0') {
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (long)local_220 * uVar46);
          lVar27 = (long)iVar11;
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
        }
        else {
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)((long)local_220 * *local_2a8 + local_2f8._24_8_);
          uVar10 = *(uint *)((long)puVar40 + (long)iVar11 * 4);
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
          *piVar1 = *piVar1 + 1;
        }
        uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar40 + lVar27 * 4));
        puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
        goto LAB_0030c78d;
      }
      if (cVar34 == '\0') {
        piVar1 = (int *)(*local_158 * (long)local_220 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * (long)local_220);
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)local_220);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)local_220 * uVar46);
        if (cVar25 != '\0') goto LAB_00307a7f;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)local_220);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)local_220 * uVar46);
LAB_00311791:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        goto LAB_0030c771;
      }
      uVar17 = *local_248;
      puVar50 = (ulong *)(uVar17 * (long)local_220 + (long)local_280);
      lVar15 = (long)iVar11;
      puVar40 = local_220;
LAB_00311440:
      piVar1 = (int *)((long)puVar50 + lVar15 * 4);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + (long)puVar40 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_00305084;
    }
LAB_00304437:
    lVar38 = (long)(int)uVar17;
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    lVar41 = lVar15 * uVar19 + local_208._24_8_;
    uVar46 = *local_158;
    iVar11 = (int)local_308;
    if (iVar29 < (int)uVar17) {
      if (*(char *)(lVar38 + lVar41) == '\0') {
        uVar17 = uVar19 | 1;
        piVar1 = (int *)(local_190 + uVar46 * uVar17 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar17) == '\0') {
LAB_0030c417:
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = 0;
          goto LAB_00313bae;
        }
        lVar27 = (long)iVar11;
        piVar1 = (int *)(*local_158 * uVar17 + local_190 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)(lVar27 + 1 + uVar17 * lVar15 + local_208._24_8_) == '\0') {
          piVar1 = (int *)(*local_158 * uVar19 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * uVar19);
joined_r0x0030c8d9:
          if (cVar25 == '\0') goto LAB_0030cef9;
        }
      }
      else {
        lVar27 = (long)iVar11;
        piVar1 = (int *)(local_190 + uVar46 * uVar19 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + lVar27) == '\0') {
          piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)(lVar27 + 1 + (uVar19 | 1) * lVar15 + local_208._24_8_) != '\0')
          goto LAB_0030c944;
          piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = uVar19 - 2;
          uVar17 = *local_248;
          if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * (uVar19 - 1)) == '\0') {
            piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + lVar41 * uVar46);
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
LAB_0030c990:
            *(undefined4 *)((long)puVar40 + lVar38 * 4) = uVar12;
          }
          else {
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + lVar41 * uVar46);
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
          }
          goto LAB_00313bae;
        }
      }
LAB_0030c8df:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + uVar46 * uVar19);
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_00313bae;
    }
    lVar27 = (long)iVar11;
    if (*(char *)(lVar38 + lVar41) == '\0') {
      uVar17 = uVar19 | 1;
      piVar1 = (int *)(local_190 + uVar46 * uVar17 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar17);
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar41 = lVar15 * uVar19 + local_208._24_8_;
      cVar34 = *(char *)(lVar27 + 3 + lVar41);
      if (cVar25 != '\0') {
        if (cVar34 == '\0') {
          piVar1 = (int *)(local_190 + *local_158 * uVar17 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * uVar17) == '\0') {
            piVar1 = (int *)(*local_158 * uVar19 + local_190 + 4 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_ * uVar19;
LAB_0030b94e:
            cVar25 = *(char *)(lVar27 + 1 + lVar15 + local_208._24_8_);
            goto joined_r0x0030c8d9;
          }
        }
        else {
          piVar1 = (int *)(local_190 + *local_158 * uVar19 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 1 + lVar27) != '\0') goto LAB_003045a6;
          piVar1 = (int *)(*local_158 * uVar17 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_208._80_8_;
          lVar15 = uVar19 - 1;
          cVar25 = *(char *)(lVar27 + 1 + uVar17 * lVar41 + local_208._24_8_);
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar34 = *(char *)(lVar27 + 3 + lVar41 * lVar15 + local_208._24_8_);
          if (cVar25 == '\0') {
            if (cVar34 == '\0') {
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar38 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_);
              goto joined_r0x00307539;
            }
            goto LAB_0030bc70;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_208._80_8_;
          cVar25 = *(char *)(lVar38 + lVar15 * lVar41 + local_208._24_8_);
          if (cVar34 != '\0') goto joined_r0x00304849;
          if (cVar25 != '\0') goto LAB_0030c944;
        }
        goto LAB_0030c8df;
      }
joined_r0x0030c3e7:
      if (cVar34 != '\0') {
        lVar41 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + lVar41 * *(long *)local_208._80_8_ + local_208._24_8_);
joined_r0x00307539:
          if (cVar25 == '\0') goto LAB_0030cef9;
        }
LAB_0030bc70:
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00313bae;
      }
      piVar1 = (int *)((uVar19 | 1) * *local_158 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * (uVar19 | 1)) == '\0')
      goto LAB_0030c417;
LAB_0030cef9:
      uVar10 = TTA::MemNewLabel();
LAB_0030cefe:
      uVar17 = *local_248;
    }
    else {
      piVar1 = (int *)(local_190 + uVar46 * uVar19 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 1 + lVar27) != '\0') {
LAB_003045a6:
        lVar15 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
        if (*(char *)(lVar27 + 3 + lVar41) == '\0') goto LAB_0030c8df;
        piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = uVar19 - 2;
        if (*(char *)(lVar41 + lVar38) == '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_248;
          puVar40 = (ulong *)(uVar46 * lVar15 + (long)local_280);
          if (*(char *)(lVar38 + *(long *)local_208._80_8_ * lVar15 + local_208._24_8_) != '\0')
          goto LAB_00306006;
          piVar1 = (int *)((long)puVar40 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15 * uVar17);
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
LAB_0030bab8:
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar17 * uVar19));
          goto LAB_0030cefe;
        }
LAB_0030460e:
        uVar46 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar46 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar17);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar46 * uVar19);
        *piVar1 = *piVar1 + 1;
LAB_0030465c:
        *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar17 * uVar19) = uVar12;
        goto LAB_00313bae;
      }
      piVar1 = (int *)(*local_158 * (uVar19 | 1) + local_190 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_208._80_8_;
      lVar15 = uVar19 - 1;
      cVar25 = *(char *)(lVar27 + 1 + (uVar19 | 1) * lVar41 + local_208._24_8_);
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      cVar34 = *(char *)(lVar27 + 3 + lVar41 * lVar15 + local_208._24_8_);
      if (cVar25 != '\0') {
        if (cVar34 != '\0') {
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar41 = *(long *)local_208._80_8_;
          cVar25 = *(char *)(lVar38 + lVar15 * lVar41 + local_208._24_8_);
joined_r0x00304849:
          if (cVar25 == '\0') goto LAB_0030638f;
        }
LAB_0030c944:
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar21 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + (uVar19 - 2) * uVar21);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
LAB_0030c989:
        puVar40 = (ulong *)(uVar21 * uVar19 + local_2f8._24_8_);
        goto LAB_0030c990;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar41 = *(long *)local_208._80_8_;
      cVar25 = *(char *)(lVar38 + lVar15 * lVar41 + local_208._24_8_);
      if (cVar34 == '\0') {
        uVar46 = *local_248;
        puVar40 = (ulong *)(uVar46 * (uVar19 - 2) + (long)local_280);
        if (cVar25 != '\0') {
          piVar1 = (int *)((long)puVar40 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar17);
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar46 * uVar19);
          *piVar1 = *piVar1 + 1;
          goto LAB_0030465c;
        }
LAB_00306006:
        piVar1 = (int *)((long)puVar40 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        uVar21 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + (uVar19 - 2) * uVar21);
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar46 * uVar19);
        *piVar1 = *piVar1 + 1;
        goto LAB_0030c989;
      }
      if (cVar25 != '\0') goto LAB_0030460e;
LAB_0030638f:
      lVar15 = uVar19 - 2;
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar41 * lVar15);
      uVar17 = *local_248;
      lVar41 = uVar17 * lVar15;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar41);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar15 = lVar15 * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar15);
      if (cVar25 != '\0') {
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar10;
        goto LAB_00313bae;
      }
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar41);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15));
      uVar17 = *local_248;
    }
    piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
    goto LAB_00313bae;
  }
  piVar1 = (int *)(local_190 + *local_158 * uVar19 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
  lVar28 = *local_158 * lVar27 + local_190;
  if (*(char *)(lVar36 + *(long *)local_208._80_8_ * uVar19 + local_208._24_8_) == '\0') {
    piVar1 = (int *)(lVar28 + (lVar41 + 0x100000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar15 + (lVar41 + 0x100000000 >> 0x20)) == '\0') {
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)local_308 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0'
         ) goto LAB_00310245;
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19)
                            );
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      goto LAB_003126fa;
    }
    uVar17 = *local_248;
    lVar15 = (long)iVar11;
    piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
    piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + uVar46 * uVar19));
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    goto LAB_0030da61;
  }
  piVar1 = (int *)(lVar28 + (lVar41 + 0x400000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  lVar28 = lVar41 + 0x400000000 >> 0x20;
  lVar37 = *local_158 * lVar27 + local_190;
  if (*(char *)(lVar15 + lVar28) != '\0') {
    piVar1 = (int *)(lVar37 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    lVar37 = lVar15 * lVar27 + local_208._24_8_;
    if (*(char *)((long)local_308 + lVar37) == '\0') {
      piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + lVar27 * *local_158 + local_190);
      *piVar1 = *piVar1 + 1;
      lVar15 = uVar19 - 2;
      if (*(char *)(lVar37 + (lVar41 + 0x100000000 >> 0x20)) == '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar28 * 4 + uVar17 * lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar15 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
        goto LAB_0030a832;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
      if (*(char *)(lVar36 + lVar38) == '\0') {
        uVar17 = *local_248;
        lVar38 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15 * uVar46);
        piVar1 = (int *)((long)local_280 + lVar28 * 4 + uVar17 * lVar15);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar15 * uVar46));
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19);
LAB_0030a6ec:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
LAB_0030a710:
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      }
      else {
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + (long)local_308);
        uVar17 = *local_248;
        lVar27 = uVar17 * lVar15;
        lVar38 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar15 = lVar15 * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15);
LAB_00311698:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19);
        }
        else {
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19);
        }
LAB_00311852:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        uVar17 = *local_248;
LAB_003140ac:
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      }
    }
    else {
      lVar27 = uVar19 - 2;
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar36 + local_208._24_8_ + lVar15 * lVar27);
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar27;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar27 = lVar27 * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar27);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + lVar28 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar28 * 4 + lVar27);
LAB_003103a2:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)(int)lVar38 * 4 + *local_2a8 * uVar19);
      }
      else {
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
      }
LAB_003103dd:
      uVar10 = TTA::MemMerge(uVar10,uVar13);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    }
    goto LAB_00305084;
  }
  piVar1 = (int *)(lVar37 + (lVar41 + 0x100000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  lVar36 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
  if (*(char *)((lVar41 + 0x100000000 >> 0x20) + lVar36) != '\0') {
    uVar17 = *local_248;
    lVar15 = (long)iVar11;
    piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
    piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + uVar46 * uVar19));
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    plVar48 = plVar39;
    goto LAB_0030d1a8;
  }
LAB_00309e26:
  piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + (long)local_308 * 4);
  *piVar1 = *piVar1 + 1;
  cVar25 = *(char *)(lVar36 + (long)local_308);
joined_r0x0030e886:
  if (cVar25 != '\0') {
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
    piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    uVar13 = *(uint *)(local_2f8._24_8_ + (long)(int)lVar38 * 4 + uVar46 * uVar19);
LAB_00314b2e:
    uVar10 = TTA::MemMerge(uVar10,uVar13);
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    goto LAB_003039a7;
  }
LAB_0031069d:
  puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
  lVar15 = (long)(int)lVar38;
LAB_003106b7:
  piVar1 = (int *)((long)puVar40 + lVar15 * 4);
  *piVar1 = *piVar1 + 1;
  uVar17 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + uVar17 * uVar19);
  piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar17 * uVar19) = uVar12;
  goto LAB_00303dda;
LAB_0030684e:
  piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  lVar41 = *local_158 * lVar38 + local_190;
  if (*(char *)(lVar27 + 3 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
    piVar1 = (int *)(lVar41 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    uVar17 = *local_248;
    if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003126fa;
    }
    piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
LAB_00311b9e:
    uVar10 = (int)local_308 + 2;
    uVar17 = (ulong)uVar10;
    if ((int)uVar10 < iVar29) {
      uVar46 = uVar19 | 1;
      lVar38 = uVar19 - 1;
      lVar27 = (long)(int)local_308;
      uVar17 = lVar27 + 2;
      do {
        local_308 = (ulong *)uVar17;
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * uVar46 + local_208._24_8_;
        lVar41 = *local_158 * uVar46 + local_190;
        iVar11 = (int)lVar27;
        if (*(char *)((long)local_308 + *(long *)local_208._80_8_ * uVar19 + local_208._24_8_) ==
            '\0') {
          piVar1 = (int *)(lVar41 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar15 + (long)local_308);
          lVar27 = lVar27 << 0x20;
          piVar1 = (int *)((lVar27 + 0x300000000 >> 0x1e) + *local_158 * uVar19 + local_190);
          *piVar1 = *piVar1 + 1;
          lVar41 = lVar27 + 0x300000000 >> 0x20;
          lVar15 = *(long *)local_208._80_8_;
          cVar34 = *(char *)(lVar41 + lVar15 * uVar19 + local_208._24_8_);
          uVar17 = *local_158;
          if (cVar25 == '\0') {
            if (cVar34 == '\0') {
              piVar1 = (int *)(uVar17 * uVar46 + local_190 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar41 + uVar46 * lVar15 + local_208._24_8_) == '\0') {
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                puVar40 = (ulong *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19);
                goto LAB_003080de;
              }
              uVar10 = TTA::MemNewLabel();
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              goto LAB_00308812;
            }
            piVar1 = (int *)(local_190 + uVar17 * lVar38 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)
                        (local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              goto LAB_0030a8be;
            }
            piVar1 = (int *)((lVar27 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar15 = lVar27 + 0x400000000 >> 0x20;
            lVar27 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
            cVar25 = *(char *)(lVar15 + lVar27);
            piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            cVar34 = *(char *)((long)local_308 + lVar27);
            if (cVar25 != '\0') {
              if (cVar34 == '\0') goto LAB_00314f3e;
              piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar27 = *(long *)local_208._80_8_ * (uVar19 - 2);
              goto LAB_003148ff;
            }
          }
          else {
            piVar1 = (int *)((lVar27 + 0x100000000 >> 0x1e) + local_190 + uVar17 * uVar46);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((lVar27 + 0x100000000 >> 0x20) + local_208._24_8_ + lVar15 * uVar46);
            if (cVar34 == '\0') {
              if (cVar25 != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_0030b131;
              }
              uVar10 = TTA::MemNewLabel();
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              goto LAB_0030b131;
            }
            piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar36 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
            if (cVar25 != '\0') {
              if (*(char *)(lVar41 + lVar36) != '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       (long)iVar11 * 4 + uVar46 * uVar19));
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
                goto LAB_0030a8be;
              }
              piVar1 = (int *)((lVar27 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar15 = lVar27 + 0x400000000 >> 0x20;
              if (*(char *)(lVar36 + lVar15) == '\0') {
                piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_308 +
                             lVar38 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0') {
                  uVar17 = *local_248;
                  piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
                  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12
                  ;
                  goto LAB_00303dda;
                }
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       (long)iVar11 * 4 + uVar46 * uVar19));
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
                goto LAB_003039a7;
              }
              lVar27 = uVar19 - 2;
              piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar36 = *(long *)local_208._80_8_;
              if (*(char *)(lVar41 + lVar36 * lVar27 + local_208._24_8_) == '\0') {
                piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_248;
                lVar41 = uVar17 * lVar27;
                if (*(char *)((long)local_308 + local_208._24_8_ + lVar36 * lVar38) == '\0') {
                  piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar41);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar27 * uVar46);
                  piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
                }
                else {
                  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar41);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar27 * uVar17);
                  piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar41);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar15 * 4 + lVar27 * uVar17));
                  piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + *local_248 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + *local_2a8 * uVar19);
                }
              }
              else {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar27);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar27 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
              }
              uVar10 = TTA::MemMerge(uVar10,uVar13);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              goto LAB_00305084;
            }
            if (*(char *)(lVar41 + lVar36) != '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)
                        (local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              goto LAB_0030a8be;
            }
            lVar15 = lVar27 + 0x400000000 >> 0x20;
            piVar1 = (int *)((lVar27 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(lVar36 + lVar15);
            piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            lVar27 = *(long *)local_208._80_8_;
            cVar34 = *(char *)((long)local_308 + lVar38 * lVar27 + local_208._24_8_);
            if (cVar25 != '\0') {
              if (cVar34 == '\0') {
LAB_00314f3e:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
              }
              else {
                piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = lVar27 * (uVar19 - 2);
LAB_003148ff:
                cVar25 = *(char *)(lVar41 + local_208._24_8_ + lVar27);
                uVar17 = *local_248;
                puVar40 = (ulong *)(uVar17 * (uVar19 - 2) + (long)local_280);
                piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                puVar50 = (ulong *)((uVar19 - 2) * uVar46 + local_2f8._24_8_);
                uVar10 = *(uint *)((long)puVar50 + (long)local_308 * 4);
joined_r0x0031494a:
                if (cVar25 == '\0') {
                  piVar1 = (int *)((long)puVar40 + lVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar50 + lVar15 * 4));
                  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
                }
                else {
                  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
                }
              }
              goto LAB_00305084;
            }
          }
          if (cVar34 == '\0') {
            uVar10 = TTA::MemNewLabel();
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            goto LAB_00303dda;
          }
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_003039a7;
        }
        piVar1 = (int *)(lVar41 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar15 + 1 + lVar27);
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        cVar34 = *(char *)(lVar27 + 3 + lVar15 * lVar38 + local_208._24_8_);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46)
            ;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            goto LAB_00303119;
          }
          piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
            lVar15 = (lVar27 << 0x20) + 0x400000000;
            piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar38 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar15 = lVar15 >> 0x20;
            lVar41 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
            cVar25 = *(char *)(lVar15 + lVar41);
            piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            cVar34 = *(char *)((long)local_308 + lVar41);
            if (cVar25 == '\0') goto joined_r0x0031402f;
            lVar38 = uVar19 - 2;
            if (cVar34 != '\0') {
              piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar27 + 3 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_)
              ;
              uVar17 = *local_248;
              puVar40 = (ulong *)(uVar17 * lVar38 + (long)local_280);
              piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              puVar50 = (ulong *)(lVar38 * uVar46 + local_2f8._24_8_);
              uVar10 = *(uint *)((long)puVar50 + (long)local_308 * 4);
              goto joined_r0x00312674;
            }
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar38);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            goto LAB_00305084;
          }
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)local_308 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_) !=
              '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46)
            ;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
            goto LAB_003126fa;
          }
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)(*local_2a8 * uVar19 + local_2f8._24_8_);
        }
        else {
          if (cVar34 != '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   (long)iVar11 * 4 + uVar46 * uVar19));
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            goto LAB_00303119;
          }
          piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
            lVar15 = (lVar27 << 0x20) + 0x400000000;
            lVar36 = lVar15 >> 0x20;
            piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar38 + local_190);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            lVar41 = lVar15 * lVar38 + local_208._24_8_;
            if (*(char *)(lVar36 + lVar41) == '\0') {
              piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar41 + (long)local_308) == '\0') goto LAB_00314dc1;
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
              piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                     (long)iVar11 * 4 + uVar46 * uVar19));
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              goto LAB_003039a7;
            }
            lVar41 = uVar19 - 2;
            piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
              piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              uVar17 = *local_248;
              lVar15 = uVar17 * lVar41;
              if (*(char *)((long)local_308 + lVar38 * *(long *)local_208._80_8_ + local_208._24_8_)
                  == '\0') {
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar41 * uVar46);
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       (long)iVar11 * 4 + uVar46 * uVar19));
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              }
              else {
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
                *piVar1 = *piVar1 + 1;
                uVar17 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar17);
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       lVar36 * 4 + lVar41 * uVar17));
                piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       (long)iVar11 * 4 + *local_2a8 * uVar19));
                piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
              }
            }
            else {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
LAB_003123cf:
              piVar1 = (int *)((long)local_280 + (long)(int)lVar27 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)(int)lVar27 * 4 + uVar46 * uVar19);
LAB_0031458d:
              uVar10 = TTA::MemMerge(uVar10,uVar13);
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            }
            goto LAB_00305084;
          }
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)local_308 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_) !=
              '\0') goto LAB_003123ec;
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)(*local_2a8 * uVar19 + local_2f8._24_8_);
          uVar10 = *(uint *)((long)puVar40 + lVar27 * 4);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
        }
        *(uint *)((long)puVar40 + (long)local_308 * 4) = uVar10;
        uVar17 = (long)local_308 + 2;
        lVar27 = lVar27 + 2;
        if ((long)uVar42 <= (long)uVar17) break;
      } while( true );
    }
    lVar38 = (long)(int)uVar17;
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    uVar46 = uVar19 | 1;
    cVar25 = *(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_);
    iVar11 = (int)local_308;
    if (iVar29 < (int)uVar17) {
      if (cVar25 != '\0') {
        lVar41 = (long)iVar11;
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * uVar46);
        piVar1 = (int *)(*local_158 * (uVar19 - 1) + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + (uVar19 - 1) * *(long *)local_208._80_8_ + local_208._24_8_);
        if (cVar34 != '\0') goto joined_r0x00311ea3;
        goto joined_r0x003130eb;
      }
LAB_00312c35:
      uVar17 = uVar19 | 1;
      piVar1 = (int *)(*local_158 * uVar17 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar17) == '\0') goto LAB_0031339a;
      lVar41 = (long)iVar11;
      piVar1 = (int *)(*local_158 * uVar17 + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 1 + uVar17 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0')
      goto LAB_00313794;
      goto LAB_00312c9d;
    }
    if (cVar25 == '\0') {
      piVar1 = (int *)(*local_158 * uVar46 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar46);
      lVar41 = (long)iVar11;
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
      if (cVar25 == '\0') {
LAB_00313050:
        if (cVar34 == '\0') goto LAB_00313370;
        lVar27 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar15 * lVar27) != '\0') goto LAB_00313b57;
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_);
        goto joined_r0x00312259;
      }
      piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * uVar46);
      if (cVar34 == '\0') {
joined_r0x0031378e:
        if (cVar25 != '\0') goto LAB_00312c9d;
        goto LAB_00313794;
      }
      piVar1 = (int *)(*local_158 * (uVar19 - 1) + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * (uVar19 - 1) + local_208._24_8_;
      cVar34 = *(char *)(lVar41 + 3 + lVar15);
    }
    else {
      lVar27 = (long)iVar11;
      piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * uVar46);
      piVar1 = (int *)(*local_158 * (uVar19 - 1) + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * (uVar19 - 1) + local_208._24_8_;
      cVar34 = *(char *)(lVar27 + 3 + lVar15);
    }
    if (cVar25 == '\0') {
      if (cVar34 != '\0') goto LAB_00313b57;
      piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar15 + lVar38);
      goto joined_r0x00312259;
    }
    lVar41 = (long)iVar11;
    if (cVar34 != '\0') goto LAB_0031203c;
    lVar41 = (long)iVar11;
    piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar15 + lVar38);
    goto joined_r0x00311ea3;
  }
  lVar36 = (lVar27 << 0x20) + 0x400000000;
  piVar1 = (int *)(lVar41 + (lVar36 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  lVar36 = lVar36 >> 0x20;
  cVar25 = *(char *)(lVar36 + local_208._24_8_ + lVar15 * lVar38);
  piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
  *piVar1 = *piVar1 + 1;
  lVar15 = *(long *)local_208._80_8_;
  cVar34 = *(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_);
  if (cVar25 == '\0') {
    uVar17 = *local_248;
    if (cVar34 == '\0') {
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_00303dda;
    }
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (long)puVar40);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
LAB_00314018:
    *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
    goto LAB_003039a7;
  }
  piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + 0xc + lVar27 * 4);
  *piVar1 = *piVar1 + 1;
  cVar25 = *(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * (long)puVar40);
  if (cVar34 != '\0') {
    uVar17 = *local_248;
    lVar15 = uVar17 * (long)puVar40;
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (long)puVar40 * uVar46);
    if (cVar25 != '\0') {
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      goto LAB_0031268a;
    }
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar15);
    *piVar1 = *piVar1 + 1;
    uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * uVar46);
    goto LAB_00311852;
  }
  if (cVar25 == '\0') {
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
    piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * (long)puVar40);
    *piVar1 = *piVar1 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar36 * 4 + (long)puVar40 * uVar46))
    ;
    puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
    goto LAB_0030a710;
  }
  piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
  *piVar1 = *piVar1 + 1;
  cVar25 = *(char *)((long)local_308 + *(long *)local_208._80_8_ * (long)puVar40 + local_208._24_8_)
  ;
  uVar17 = *local_248;
  lVar38 = uVar17 * (long)puVar40;
  piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar38);
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  lVar15 = (long)puVar40 * uVar46;
  uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar15);
  if (cVar25 == '\0') {
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar38);
    *piVar1 = *piVar1 + 1;
    uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15);
    goto LAB_0030a6ec;
  }
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
  goto LAB_00305084;
LAB_003123ec:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
  piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19));
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
LAB_003126fa:
  uVar10 = (int)local_308 + 2;
  uVar17 = (ulong)uVar10;
  if (iVar29 <= (int)uVar10) {
LAB_003129fd:
    lVar38 = (long)(int)uVar17;
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    uVar46 = uVar19 | 1;
    cVar25 = *(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_);
    iVar11 = (int)local_308;
    if (iVar29 < (int)uVar17) {
      if (cVar25 == '\0') goto LAB_00312c35;
      lVar41 = (long)iVar11;
      piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar34 = *(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * uVar46);
      piVar1 = (int *)(*local_158 * (uVar19 - 1) + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      cVar25 = *(char *)(lVar38 + (uVar19 - 1) * lVar15 + local_208._24_8_);
      if (cVar34 == '\0') goto joined_r0x003130eb;
      if (cVar25 == '\0') goto LAB_00312c9d;
      piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = lVar15 * (uVar19 - 2);
    }
    else {
      if (cVar25 == '\0') {
        piVar1 = (int *)(*local_158 * uVar46 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar46);
        lVar41 = (long)iVar11;
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        cVar34 = *(char *)(lVar41 + 3 + lVar15 * uVar19 + local_208._24_8_);
        if (cVar25 == '\0') goto LAB_00313050;
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * uVar46);
        if (cVar34 == '\0') goto joined_r0x0031378e;
        lVar15 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = *(long *)local_208._80_8_;
        lVar36 = lVar27 * lVar15 + local_208._24_8_;
        cVar34 = *(char *)(lVar41 + 3 + lVar36);
        if (cVar25 == '\0') {
          if (cVar34 == '\0') {
            piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_003130e7;
          }
          goto LAB_00313b57;
        }
        if (cVar34 != '\0') {
          lVar36 = uVar19 - 2;
          piVar1 = (int *)(*local_158 * lVar36 + local_190 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 1 + local_208._24_8_ + lVar27 * lVar36) == '\0') goto LAB_00313747;
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar27 = *(long *)local_208._80_8_;
          if (*(char *)(lVar38 + lVar15 * lVar27 + local_208._24_8_) != '\0') goto LAB_00312be1;
          piVar1 = (int *)(*local_158 * lVar36 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar27 * lVar36);
          plVar48 = plVar39;
          goto LAB_00313ac4;
        }
        piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        lVar41 = (long)iVar11;
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar27 = uVar19 - 1;
        cVar25 = *(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * uVar46);
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        lVar36 = lVar15 * lVar27 + local_208._24_8_;
        cVar34 = *(char *)(lVar41 + 3 + lVar36);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') goto LAB_00313b57;
          piVar1 = (int *)(lVar27 * *local_158 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
LAB_003130e7:
          cVar25 = *(char *)(lVar36 + lVar38);
          goto joined_r0x003130eb;
        }
        if (cVar34 != '\0') {
          lVar36 = uVar19 - 2;
          piVar1 = (int *)(*local_158 * lVar36 + local_190 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 1 + local_208._24_8_ + lVar15 * lVar36) != '\0') {
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = *(long *)local_208._80_8_;
            if (*(char *)(lVar38 + lVar27 * lVar15 + local_208._24_8_) != '\0') goto LAB_00312be1;
            piVar1 = (int *)(*local_158 * lVar36 + local_190 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            lVar15 = local_208._24_8_ + lVar15 * lVar36;
            goto LAB_00313ac0;
          }
LAB_00313747:
          lVar27 = *local_248 * (uVar19 - 2);
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          lVar15 = (uVar19 - 2) * *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar15);
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15);
          goto LAB_0031208b;
        }
        piVar1 = (int *)(lVar27 * *local_158 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar41 = (long)iVar11;
      if (*(char *)(lVar36 + lVar38) == '\0') goto LAB_00312c9d;
      piVar1 = (int *)(*local_158 * (uVar19 - 2) + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * (uVar19 - 2);
    }
    lVar27 = (long)iVar11;
    cVar25 = *(char *)(lVar27 + 1 + local_208._24_8_ + lVar15);
    uVar17 = *local_248;
    lVar41 = uVar17 * (uVar19 - 2);
    piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar41);
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    lVar15 = (uVar19 - 2) * uVar46;
    uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar15);
    if (cVar25 == '\0') {
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar41);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15));
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
    }
    else {
      piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar10;
    }
    goto LAB_00313bae;
  }
  uVar46 = uVar19 | 1;
  lVar38 = uVar19 - 1;
  lVar41 = uVar19 - 2;
  lVar27 = (long)(int)local_308;
  uVar17 = lVar27 + 2;
  while( true ) {
    local_308 = (ulong *)uVar17;
    plVar39 = local_230;
    piVar1 = (int *)(*local_158 * uVar19 + local_190 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_ * uVar46 + local_208._24_8_;
    lVar36 = *local_158 * uVar46 + local_190;
    iVar11 = (int)lVar27;
    if (*(char *)((long)local_308 + *(long *)local_208._80_8_ * uVar19 + local_208._24_8_) == '\0')
    break;
    piVar1 = (int *)(lVar36 + 4 + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar15 + 1 + lVar27);
    piVar1 = (int *)(*local_158 * lVar38 + local_190 + 0xc + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_;
    cVar34 = *(char *)(lVar27 + 3 + lVar15 * lVar38 + local_208._24_8_);
    if (cVar25 == '\0') {
      if (cVar34 != '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00303119;
      }
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
        lVar15 = (lVar27 << 0x20) + 0x400000000;
        piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar38 + local_190);
        *piVar1 = *piVar1 + 1;
        lVar15 = lVar15 >> 0x20;
        lVar36 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
        cVar25 = *(char *)(lVar15 + lVar36);
        piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)((long)local_308 + lVar36);
        if (cVar25 == '\0') {
          if (cVar34 == '\0') goto LAB_0030a878;
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          goto LAB_00314018;
        }
        if (cVar34 == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        }
        else {
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar27 + 3 + *(long *)local_208._80_8_ * lVar41 + local_208._24_8_);
          uVar17 = *local_248;
          lVar38 = uVar17 * lVar41;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar38);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          lVar41 = lVar41 * uVar46;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar38);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar41));
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          }
          else {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          }
        }
        goto LAB_00305084;
      }
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)local_308 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_) == '\0'
         ) {
        uVar10 = TTA::MemNewLabel();
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        plVar39 = local_230;
        goto LAB_00311b9e;
      }
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
      *piVar1 = *piVar1 + 1;
      uVar21 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar21 * lVar41);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
    }
    else {
      if (cVar34 != '\0') {
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                 (long)local_308 * 4 + lVar41 * uVar46));
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          plVar39 = local_230;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar41);
        uVar17 = *local_248;
        lVar15 = uVar17 * lVar41;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar41 = lVar41 * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41);
        if (cVar25 != '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          goto LAB_00303119;
        }
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41);
        goto LAB_00308e47;
      }
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
        lVar15 = (lVar27 << 0x20) + 0x400000000;
        lVar36 = lVar15 >> 0x20;
        piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar38 + local_190);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        lVar28 = lVar15 * lVar38 + local_208._24_8_;
        if (*(char *)(lVar36 + lVar28) == '\0') {
          piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + (long)local_308) == '\0') goto LAB_00314dc1;
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar27 + 1 + *(long *)local_208._80_8_ * lVar41 + local_208._24_8_);
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          if (cVar25 != '\0') goto LAB_003139b9;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
          goto LAB_00314b2e;
        }
        piVar1 = (int *)(local_190 + *local_158 * lVar41 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
          piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar41 * uVar46);
            goto LAB_003123cf;
          }
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * lVar41) == '\0') goto LAB_00305084;
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar41 * uVar46);
        }
        else {
          piVar1 = (int *)(local_190 + *local_158 * lVar41 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)(lVar27 + 1 + lVar15 * lVar41 + local_208._24_8_) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
            goto LAB_0031458d;
          }
          piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar38) != '\0')
          goto LAB_003132d6;
          piVar1 = (int *)(*local_158 * lVar41 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)local_308 + *(long *)local_208._80_8_ * lVar41 + local_208._24_8_
                            );
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          if (cVar25 != '\0') goto LAB_00314a1b;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
        }
        goto LAB_0031528c;
      }
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      if (*(char *)((long)local_308 + lVar15 * lVar38 + local_208._24_8_) == '\0') {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_00311b9e;
      }
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + 4 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * lVar41);
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar41;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar21 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar21 * lVar41);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                               (long)local_308 * 4 + uVar21 * lVar41));
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar21 = *local_2a8;
      }
      else {
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
      }
    }
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar21 * uVar19) = uVar10;
    uVar17 = (long)local_308 + 2;
    lVar27 = lVar27 + 2;
    plVar39 = local_230;
    if ((long)uVar42 <= (long)uVar17) goto LAB_003129fd;
  }
  piVar1 = (int *)(lVar36 + (long)local_308 * 4);
  *piVar1 = *piVar1 + 1;
  cVar25 = *(char *)(lVar15 + (long)local_308);
  lVar28 = lVar27 << 0x20;
  piVar1 = (int *)((lVar28 + 0x300000000 >> 0x1e) + *local_158 * uVar19 + local_190);
  *piVar1 = *piVar1 + 1;
  lVar36 = lVar28 + 0x300000000 >> 0x20;
  lVar15 = *(long *)local_208._80_8_;
  cVar34 = *(char *)(lVar36 + lVar15 * uVar19 + local_208._24_8_);
  uVar17 = *local_158;
  if (cVar25 != '\0') {
    lVar37 = lVar28 + 0x100000000 >> 0x20;
    piVar1 = (int *)((lVar28 + 0x100000000 >> 0x1e) + local_190 + uVar17 * uVar46);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)(lVar37 + local_208._24_8_ + lVar15 * uVar46);
    if (cVar34 != '\0') {
      piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar32 = lVar15 * lVar38 + local_208._24_8_;
      if (cVar25 == '\0') {
        if (*(char *)(lVar36 + lVar32) == '\0') {
          lVar27 = lVar28 + 0x400000000 >> 0x20;
          piVar1 = (int *)((lVar28 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
          *piVar1 = *piVar1 + 1;
          cVar34 = *(char *)(lVar32 + lVar27);
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          cVar25 = *(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_);
          if (cVar34 != '\0') {
            if (cVar25 == '\0') goto LAB_00314ee8;
            piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_003147e6;
          }
          goto LAB_00315176;
        }
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
        goto LAB_0030a8be;
      }
      if (*(char *)(lVar36 + lVar32) != '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar41 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + local_208._24_8_ + lVar15 * lVar41) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                 (long)local_308 * 4 + lVar41 * uVar46));
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        }
        else {
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_;
          if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
            piVar1 = (int *)(*local_158 * lVar41 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar41);
            uVar17 = *local_248;
            lVar15 = uVar17 * lVar41;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            lVar41 = lVar41 * uVar46;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41);
            if (cVar25 == '\0') {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                     (long)local_308 * 4 + lVar41));
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
            }
            else {
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
            }
          }
          else {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          }
        }
        goto LAB_0030a8be;
      }
      piVar1 = (int *)((lVar28 + 0x400000000 >> 0x1e) + local_190 + *local_158 * lVar38);
      *piVar1 = *piVar1 + 1;
      lVar15 = lVar28 + 0x400000000 >> 0x20;
      if (*(char *)(lVar32 + lVar15) == '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) == '\0')
        goto LAB_00314dc1;
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar37 + local_208._24_8_ + lVar15 * lVar41);
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
          goto LAB_00314d7a;
        }
LAB_003139b9:
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
        goto LAB_003039a7;
      }
      piVar1 = (int *)(local_190 + *local_158 * lVar41 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = *(long *)local_208._80_8_;
      lVar28 = lVar27 * lVar41 + local_208._24_8_;
      if (*(char *)(lVar36 + lVar28) == '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar38 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)local_308 + local_208._24_8_ + lVar27 * lVar38) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
          goto LAB_00315448;
        }
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + *(long *)local_208._80_8_ * lVar41 + local_208._24_8_) == '\0')
        goto LAB_00305084;
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar41 * uVar46);
      }
      else {
        piVar1 = (int *)(local_190 + *local_158 * lVar41 + lVar37 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar28 + lVar37) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
LAB_00315448:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          goto LAB_00305084;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)((long)local_308 + lVar38 * lVar15 + local_208._24_8_) != '\0') {
LAB_003132d6:
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_00305084;
        }
        piVar1 = (int *)(*local_158 * lVar41 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar41);
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar41 * uVar46);
        if (cVar25 != '\0') {
LAB_00314a1b:
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          goto LAB_00305084;
        }
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
      }
      uVar10 = TTA::MemMerge(uVar10,uVar13);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      goto LAB_00305084;
    }
    if (cVar25 == '\0') {
      uVar10 = TTA::MemNewLabel();
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    }
    else {
LAB_003137e5:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)(int)lVar27 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)(int)lVar27 * 4 + uVar46 * uVar19);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
    }
LAB_0030b131:
    uVar10 = (int)local_308 + 2;
    uVar17 = (ulong)uVar10;
    if (iVar29 <= (int)uVar10) {
LAB_0030b2c3:
      lVar38 = (long)(int)uVar17;
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      uVar46 = uVar19 | 1;
      cVar25 = *(char *)(lVar38 + lVar15 * uVar19 + local_208._24_8_);
      iVar11 = (int)local_308;
      if (iVar29 < (int)uVar17) {
        if (cVar25 == '\0') {
          piVar1 = (int *)(*local_158 * uVar46 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar46) == '\0') goto LAB_0030c417;
          lVar27 = (long)iVar11;
          piVar1 = (int *)(*local_158 * uVar46 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = uVar46 * *(long *)local_208._80_8_;
          goto LAB_0030b94e;
        }
        lVar27 = (long)iVar11;
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = uVar19 - 1;
        lVar36 = *local_158 * lVar41 + local_190;
        if (*(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * uVar46) == '\0') {
          piVar1 = (int *)(lVar36 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_ * lVar41 + local_208._24_8_;
          if (*(char *)(lVar38 + lVar15) != '\0') goto LAB_0030bc70;
          piVar1 = (int *)(lVar41 * *local_158 + local_190 + 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar15 + 1 + lVar27) == '\0') goto LAB_0030cef9;
          goto LAB_0030c944;
        }
        piVar1 = (int *)(lVar36 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_208._80_8_ * lVar41 + local_208._24_8_;
        if (*(char *)(lVar27 + 1 + lVar41) == '\0') {
LAB_0030ba4b:
          lVar27 = (long)iVar11;
          piVar1 = (int *)((uVar19 - 1) * *local_158 + local_190 + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + lVar38) != '\0') goto LAB_0030ba6e;
          goto LAB_0030c8df;
        }
        uVar46 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar46 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (uVar19 - 2) * uVar17);
      }
      else {
        if (cVar25 != '\0') {
          lVar36 = (long)iVar11;
          piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar27 = uVar19 - 1;
          cVar25 = *(char *)(lVar36 + 1 + local_208._24_8_ + lVar15 * uVar46);
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
          lVar41 = *local_158 * lVar27 + local_190;
          cVar34 = *(char *)(lVar36 + 3 + lVar15);
          if (cVar25 == '\0') {
            piVar1 = (int *)(lVar41 + lVar38 * 4);
            *piVar1 = *piVar1 + 1;
            if (cVar34 != '\0') {
              if (*(char *)(lVar15 + lVar38) != '\0') goto LAB_0030c9a1;
              piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              lVar41 = *(long *)local_208._80_8_;
              lVar15 = uVar19 - 2;
              if (*(char *)(lVar36 + 1 + lVar27 * lVar41 + local_208._24_8_) == '\0') {
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar15);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + lVar15 * uVar46);
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
              }
              else {
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar41 * lVar15);
                uVar17 = *local_248;
                lVar27 = uVar17 * lVar15;
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                lVar15 = lVar15 * uVar46;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar15);
                if (cVar25 == '\0') {
                  piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15);
                  goto LAB_0030c3a2;
                }
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar10;
              }
              goto LAB_00313bae;
            }
            if (*(char *)(lVar15 + lVar38) != '\0') {
LAB_0030c9a1:
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
LAB_0030c9e1:
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
              goto LAB_00313bae;
            }
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar36 + 1 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) !=
                '\0') {
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + (uVar19 - 2) * uVar46);
              goto LAB_0030c9e1;
            }
            uVar10 = TTA::MemNewLabel();
          }
          else {
            if (cVar34 == '\0') {
              piVar1 = (int *)(lVar41 + 4 + lVar36 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar15 + 1 + lVar36) == '\0') {
                piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar38 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar38 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) !=
                    '\0') goto LAB_0030b46d;
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + uVar46 * uVar19);
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19) = uVar12;
                goto LAB_00313bae;
              }
              uVar17 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * (uVar19 - 2));
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + (uVar19 - 2) * uVar46);
            }
            else {
              piVar1 = (int *)(lVar41 + lVar38 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar15 + lVar38) == '\0') {
                piVar1 = (int *)(*local_158 * lVar27 + local_190 + 4 + lVar36 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = *(long *)local_208._80_8_;
                lVar15 = uVar19 - 2;
                if (*(char *)(lVar36 + 1 + lVar27 * lVar41 + local_208._24_8_) != '\0') {
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar38 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar41 * lVar15);
                  uVar17 = *local_248;
                  lVar27 = uVar17 * lVar15;
                  piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar27);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = *local_2a8;
                  lVar15 = lVar15 * uVar46;
                  uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar15);
                  if (cVar25 == '\0') {
                    piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar27);
                    *piVar1 = *piVar1 + 1;
                    uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15))
                    ;
                    piVar1 = (int *)((long)local_280 + lVar36 * 4 + *local_248 * uVar19);
                    *piVar1 = *piVar1 + 1;
                    uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + *local_2a8 * uVar19);
                  }
                  else {
                    piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * uVar19);
                    *piVar1 = *piVar1 + 1;
                    uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + uVar46 * uVar19);
                  }
                  goto LAB_0030c3a2;
                }
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar15);
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar15 * uVar46);
              }
              else {
LAB_0030b46d:
                uVar17 = *local_248;
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * (uVar19 - 2));
                *piVar1 = *piVar1 + 1;
                uVar46 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar46);
              }
            }
            piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + uVar46 * uVar19);
LAB_0030c3a2:
            uVar10 = TTA::MemMerge(uVar10,uVar13);
          }
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19) = uVar10;
          goto LAB_00313bae;
        }
        piVar1 = (int *)(*local_158 * uVar46 + local_190 + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + local_208._24_8_ + lVar15 * uVar46);
        lVar27 = (long)iVar11;
        piVar1 = (int *)(*local_158 * uVar19 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        cVar34 = *(char *)(lVar27 + 3 + lVar15 * uVar19 + local_208._24_8_);
        if (cVar25 == '\0') goto joined_r0x0030c3e7;
        piVar1 = (int *)(uVar46 * *local_158 + local_190 + 4 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar27 + 1 + local_208._24_8_ + lVar15 * uVar46);
        if (cVar34 == '\0') goto joined_r0x0030c8d9;
        lVar15 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
        cVar34 = *(char *)(lVar27 + 3 + lVar41);
        if (cVar25 == '\0') {
          if ((cVar34 != '\0') ||
             (piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar38 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(lVar41 + lVar38) != '\0')) goto LAB_0030bc70;
          goto LAB_0030cef9;
        }
        if (cVar34 == '\0') goto LAB_0030ba4b;
LAB_0030ba6e:
        uVar46 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar46 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar17 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (uVar19 - 2) * uVar17);
      }
      lVar27 = (long)iVar11;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar46 * uVar19);
      *piVar1 = *piVar1 + 1;
      goto LAB_0030bab8;
    }
    uVar46 = uVar19 | 1;
    lVar38 = (long)(int)local_308;
    uVar17 = lVar38 + 2;
    while( true ) {
      local_308 = (ulong *)uVar17;
      piVar1 = (int *)(*local_158 * uVar19 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      iVar11 = (int)lVar38;
      if (*(char *)((long)local_308 + lVar15 * uVar19 + local_208._24_8_) != '\0') break;
      piVar1 = (int *)(*local_158 * uVar46 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar27 = *local_158 * uVar19 + local_190;
      if (*(char *)((long)local_308 + local_208._24_8_ + lVar15 * uVar46) == '\0') {
        lVar15 = (lVar38 << 0x20) + 0x300000000;
        lVar41 = lVar15 >> 0x20;
        piVar1 = (int *)(lVar27 + (lVar15 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        if (*(char *)(lVar41 + lVar15 * uVar19 + local_208._24_8_) == '\0') {
          uVar17 = *local_158;
          piVar1 = (int *)(uVar17 * uVar46 + local_190 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + uVar46 * lVar15 + local_208._24_8_) == '\0') goto LAB_0030c092;
          uVar10 = TTA::MemNewLabel();
          puVar40 = (ulong *)(*local_248 * uVar19 + (long)local_280);
          goto LAB_0030c06c;
        }
        lVar27 = uVar19 - 1;
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + local_208._24_8_ + lVar15 * lVar27) != '\0') goto LAB_0030c179;
        lVar15 = (lVar38 << 0x20) + 0x400000000;
        piVar1 = (int *)((lVar15 >> 0x1e) + *local_158 * lVar27 + local_190);
        *piVar1 = *piVar1 + 1;
        lVar15 = lVar15 >> 0x20;
        lVar38 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
        cVar25 = *(char *)(lVar15 + lVar38);
        piVar1 = (int *)(lVar27 * *local_158 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)((long)local_308 + lVar38);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') goto LAB_0030e6f4;
          goto LAB_0030a878;
        }
        lVar38 = uVar19 - 2;
        if (cVar34 == '\0') {
          uVar46 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar46 * lVar38);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar17);
          puVar40 = (ulong *)(uVar46 * uVar19 + (long)local_280);
          goto LAB_0030f220;
        }
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar41 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_);
        uVar17 = *local_248;
        puVar40 = (ulong *)(uVar17 * lVar38 + (long)local_280);
        piVar1 = (int *)((long)puVar40 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        puVar50 = (ulong *)(lVar38 * uVar46 + local_2f8._24_8_);
        uVar10 = *(uint *)((long)puVar50 + (long)local_308 * 4);
        goto joined_r0x0031494a;
      }
      piVar1 = (int *)(lVar27 + 0xc + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar27 = *local_158 * uVar46 + local_190;
      if (*(char *)(lVar38 + 3 + lVar15 * uVar19 + local_208._24_8_) != '\0') {
        lVar41 = lVar38 << 0x20;
        piVar1 = (int *)(lVar27 + (lVar41 + 0x100000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar27 = uVar19 - 1;
        cVar25 = *(char *)((lVar41 + 0x100000000 >> 0x20) + local_208._24_8_ + lVar15 * uVar46);
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
        cVar34 = *(char *)(lVar38 + 3 + lVar15);
        if (cVar25 != '\0') {
          if (cVar34 != '\0') goto LAB_0030b859;
          piVar1 = (int *)((lVar41 + 0x400000000 >> 0x1e) + *local_158 * lVar27 + local_190);
          *piVar1 = *piVar1 + 1;
          lVar41 = lVar41 + 0x400000000 >> 0x20;
          if (*(char *)(lVar15 + lVar41) == '\0') {
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)((long)local_308 +
                              lVar27 * *(long *)local_208._80_8_ + local_208._24_8_);
            goto joined_r0x0030e886;
          }
          lVar15 = uVar19 - 2;
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar38 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = *(long *)local_208._80_8_;
          if (*(char *)(lVar38 + 3 + lVar36 * lVar15 + local_208._24_8_) != '\0') goto LAB_0030a7de;
          piVar1 = (int *)(lVar27 * *local_158 + local_190 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = *local_248;
          lVar28 = uVar17 * lVar15;
          if (*(char *)((long)local_308 + local_208._24_8_ + lVar36 * lVar27) != '\0') {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar28);
            *piVar1 = *piVar1 + 1;
            uVar17 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15 * uVar17);
            piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar28);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar15 * uVar17);
            goto LAB_0030c722;
          }
          piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar28);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar15 * uVar46);
          lVar15 = (long)iVar11;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
          goto LAB_00310b7f;
        }
        if (cVar34 != '\0') goto LAB_0030c179;
        lVar36 = lVar41 + 0x400000000 >> 0x20;
        piVar1 = (int *)((lVar41 + 0x400000000 >> 0x1e) + *local_158 * lVar27 + local_190);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar15 + lVar36);
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        lVar15 = *(long *)local_208._80_8_;
        cVar34 = *(char *)((long)local_308 + lVar27 * lVar15 + local_208._24_8_);
        if (cVar25 == '\0') goto joined_r0x0031402f;
        lVar27 = uVar19 - 2;
        if (cVar34 == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * lVar27);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * uVar46);
          goto LAB_00310056;
        }
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + 0xc + lVar38 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar38 + 3 + local_208._24_8_ + lVar15 * lVar27);
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar27 * uVar46);
        if (cVar25 != '\0') goto LAB_0031267a;
        piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar17 * lVar27);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar27 * uVar46);
        goto LAB_00314097;
      }
      piVar1 = (int *)(lVar27 + 4 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 1 + local_208._24_8_ + lVar15 * uVar46) == '\0') {
        uVar10 = TTA::MemNewLabel();
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)(*local_2a8 * uVar19 + local_2f8._24_8_);
      }
      else {
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)(*local_2a8 * uVar19 + local_2f8._24_8_);
        uVar10 = *(uint *)((long)puVar40 + lVar38 * 4);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
      }
      *(uint *)((long)puVar40 + (long)local_308 * 4) = uVar10;
      uVar17 = (long)local_308 + 2;
      lVar38 = lVar38 + 2;
      if ((long)uVar42 <= (long)uVar17) goto LAB_0030b2c3;
    }
    lVar28 = lVar38 << 0x20;
    piVar1 = (int *)((lVar28 + 0x100000000 >> 0x1e) + uVar46 * *local_158 + local_190);
    *piVar1 = *piVar1 + 1;
    lVar41 = lVar28 + 0x100000000 >> 0x20;
    cVar25 = *(char *)(lVar41 + local_208._24_8_ + lVar15 * uVar46);
    lVar27 = uVar19 - 1;
    piVar1 = (int *)((lVar28 + 0x300000000 >> 0x1e) + *local_158 * lVar27 + local_190);
    *piVar1 = *piVar1 + 1;
    lVar36 = lVar28 + 0x300000000 >> 0x20;
    lVar15 = *(long *)local_208._80_8_;
    lVar37 = lVar15 * lVar27 + local_208._24_8_;
    uVar17 = *local_158;
    if (cVar25 == '\0') {
      if (*(char *)(lVar36 + lVar37) != '\0') {
        piVar1 = (int *)(local_190 + uVar17 * lVar27 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar37 + (long)local_308) != '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        lVar15 = uVar19 - 2;
        if (*(char *)(lVar41 + lVar27 * lVar38 + local_208._24_8_) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar15);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15 * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
          goto LAB_00303119;
        }
        piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar38 * lVar15);
        uVar17 = *local_248;
        lVar38 = uVar17 * lVar15;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar38);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar15 = lVar15 * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar15);
        if (cVar25 != '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          goto LAB_00303119;
        }
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar38);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar15);
        goto LAB_003105bb;
      }
      piVar1 = (int *)(local_190 + uVar17 * uVar19 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *local_158 * lVar27 + local_190;
      if (*(char *)(lVar36 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
        piVar1 = (int *)(lVar38 + (lVar28 + 0x400000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar15 = lVar28 + 0x400000000 >> 0x20;
        lVar38 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
        cVar25 = *(char *)(lVar15 + lVar38);
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar34 = *(char *)((long)local_308 + lVar38);
        if (cVar25 == '\0') {
          if (cVar34 != '\0') goto LAB_00314035;
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0')
          goto LAB_003151d4;
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (uVar19 - 2));
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (uVar19 - 2) * uVar46);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
          goto LAB_0030fb3f;
        }
        if (cVar34 != '\0') {
          lVar38 = uVar19 - 2;
          piVar1 = (int *)(*local_158 * lVar38 + local_190 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar36 + *(long *)local_208._80_8_ * lVar38 + local_208._24_8_);
          uVar17 = *local_248;
          lVar27 = uVar17 * lVar38;
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          lVar38 = lVar38 * uVar46;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar27);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar38));
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          }
          else {
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          }
          goto LAB_00305084;
        }
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        puVar40 = (ulong *)(uVar19 - 2);
        if (*(char *)(lVar41 + lVar27 * lVar38 + local_208._24_8_) == '\0') {
          uVar17 = *local_248;
          puVar50 = (ulong *)(uVar17 * (long)puVar40 + (long)local_280);
          goto LAB_00311440;
        }
        piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar36 + local_208._24_8_ + lVar38 * (long)puVar40) == '\0') {
          uVar17 = *local_248;
          piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (long)puVar40);
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + (long)puVar40 * uVar46);
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (long)puVar40);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + (long)puVar40 * uVar46);
          goto LAB_00311791;
        }
        piVar1 = (int *)(*local_158 * (long)puVar40 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 +
                          *(long *)local_208._80_8_ * (long)puVar40 + local_208._24_8_);
        uVar17 = *local_248;
        lVar15 = uVar17 * (long)puVar40;
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        lVar38 = (long)puVar40 * uVar46;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + lVar38);
        if (cVar25 != '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
          goto LAB_00305084;
        }
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38);
        goto LAB_00311852;
      }
      piVar1 = (int *)(lVar38 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
      if (*(char *)((long)local_308 + lVar15) == '\0') goto LAB_00310a07;
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003126fa;
    }
    if (*(char *)(lVar36 + lVar37) == '\0') {
      piVar1 = (int *)(local_190 + uVar17 * uVar19 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar37 = *local_158 * lVar27 + local_190;
      if (*(char *)(lVar36 + local_208._24_8_ + lVar15 * uVar19) != '\0') {
        lVar15 = lVar28 + 0x400000000 >> 0x20;
        piVar1 = (int *)(lVar37 + (lVar28 + 0x400000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar28 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
        lVar37 = *local_158 * lVar27 + local_190;
        if (*(char *)(lVar15 + lVar28) != '\0') {
          piVar1 = (int *)(lVar37 + (long)local_308 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar28 + (long)local_308) != '\0') {
            lVar27 = uVar19 - 2;
            piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(lVar36 + *(long *)local_208._80_8_ * lVar27 + local_208._24_8_);
            uVar17 = *local_248;
            lVar41 = uVar17 * lVar27;
            piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar41);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            lVar27 = lVar27 * uVar46;
            uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar27);
            if (cVar25 != '\0') {
              piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
              goto LAB_003103dd;
            }
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar41);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar27);
            goto LAB_003103a2;
          }
          piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          lVar28 = uVar19 - 2;
          if (*(char *)(lVar41 + lVar27 * lVar38 + local_208._24_8_) == '\0') {
            uVar17 = *local_248;
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar28);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar28 * uVar46);
            piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
          }
          else {
            piVar1 = (int *)(*local_158 * lVar28 + local_190 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar36 + local_208._24_8_ + lVar38 * lVar28) != '\0') {
              piVar1 = (int *)(*local_158 * lVar28 + local_190 + (long)local_308 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((long)local_308 +
                                *(long *)local_208._80_8_ * lVar28 + local_208._24_8_);
              uVar17 = *local_248;
              lVar15 = uVar17 * lVar28;
              lVar38 = (long)iVar11;
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar46 = *local_2a8;
              lVar28 = lVar28 * uVar46;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar28);
              if (cVar25 != '\0') {
                piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * uVar19);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + uVar46 * uVar19);
                goto LAB_00311852;
              }
              piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar28);
              goto LAB_00311698;
            }
            uVar17 = *local_248;
            lVar38 = (long)iVar11;
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar17 * lVar28);
            *piVar1 = *piVar1 + 1;
            uVar46 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + lVar28 * uVar46);
            piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * lVar28);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar28 * uVar46)
                                  );
            piVar1 = (int *)((long)local_280 + lVar38 * 4 + *local_248 * uVar19);
            *piVar1 = *piVar1 + 1;
            uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + *local_2a8 * uVar19);
          }
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          goto LAB_00305084;
        }
        piVar1 = (int *)(lVar37 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar28 + lVar41) != '\0') {
          uVar17 = *local_248;
          lVar15 = (long)iVar11;
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
          *piVar1 = *piVar1 + 1;
          uVar46 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + uVar46 * uVar19));
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
          plVar48 = plVar39;
          goto LAB_0030d1a8;
        }
        piVar1 = (int *)(*local_158 * lVar27 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)local_308 + lVar27 * *(long *)local_208._80_8_ + local_208._24_8_) ==
            '\0') goto LAB_0031069d;
        uVar17 = *local_248;
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19);
LAB_00314d7a:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_003039a7;
      }
      piVar1 = (int *)(lVar37 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_ * lVar27 + local_208._24_8_;
      if (*(char *)(lVar41 + lVar15) != '\0') {
        uVar17 = *local_248;
        lVar15 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * (uVar19 - 2));
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + (uVar19 - 2) * uVar46);
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar15 * 4 + uVar46 * uVar19));
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_0030da61;
      }
      piVar1 = (int *)(lVar27 * *local_158 + local_190 + (long)local_308 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar15 + (long)local_308) == '\0') goto LAB_00310245;
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19)
                            );
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      goto LAB_003126fa;
    }
    piVar1 = (int *)(local_190 + uVar17 * lVar27 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar37 + (long)local_308) == '\0') {
      piVar1 = (int *)(*local_158 * lVar27 + local_190 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
      lVar38 = uVar19 - 2;
      if (*(char *)(lVar41 + lVar27 * lVar15 + local_208._24_8_) != '\0') {
        piVar1 = (int *)(*local_158 * lVar38 + local_190 + (long)local_308 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)local_308 + local_208._24_8_ + lVar15 * lVar38);
        uVar17 = *local_248;
        lVar27 = uVar17 * lVar38;
        lVar15 = (long)iVar11;
        piVar1 = (int *)((long)local_280 + lVar15 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar46 = *local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + lVar38 * uVar46);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38 * uVar46);
LAB_0030f857:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + *local_248 * uVar19);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + *local_2a8 * uVar19);
        }
        else {
          piVar1 = (int *)((long)local_280 + lVar15 * 4 + uVar17 * uVar19);
          *piVar1 = *piVar1 + 1;
LAB_0030caef:
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar15 * 4 + uVar46 * uVar19);
        }
LAB_003105bb:
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
        goto LAB_00303119;
      }
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar38);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar38 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19)
                            );
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar17 = *local_2a8;
    }
    else {
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
      piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)iVar11 * 4 + uVar46 * uVar19)
                            );
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
      *piVar1 = *piVar1 + 1;
      uVar17 = *local_2a8;
    }
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar17 * uVar19) = uVar10;
    goto LAB_00303119;
  }
  if (cVar34 != '\0') {
    piVar1 = (int *)(local_190 + uVar17 * lVar38 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar36 + local_208._24_8_ + lVar15 * lVar38) != '\0') {
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_0030a8be;
    }
    piVar1 = (int *)((lVar28 + 0x400000000 >> 0x1e) + *local_158 * lVar38 + local_190);
    *piVar1 = *piVar1 + 1;
    lVar27 = lVar28 + 0x400000000 >> 0x20;
    lVar15 = *(long *)local_208._80_8_ * lVar38 + local_208._24_8_;
    cVar34 = *(char *)(lVar27 + lVar15);
    piVar1 = (int *)(lVar38 * *local_158 + local_190 + (long)local_308 * 4);
    *piVar1 = *piVar1 + 1;
    cVar25 = *(char *)((long)local_308 + lVar15);
    if (cVar34 == '\0') {
LAB_00315176:
      if (cVar25 == '\0') goto LAB_003151d4;
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * lVar41);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
      goto LAB_003039a7;
    }
    if (cVar25 == '\0') {
LAB_00314ee8:
      uVar17 = *local_248;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar17 * lVar41);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar27 * 4 + lVar41 * uVar46);
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
    }
    else {
      piVar1 = (int *)(*local_158 * lVar41 + local_190 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar15 = *(long *)local_208._80_8_;
LAB_003147e6:
      cVar25 = *(char *)(lVar36 + local_208._24_8_ + lVar15 * lVar41);
      uVar17 = *local_248;
      lVar15 = uVar17 * lVar41;
      piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + lVar15);
      *piVar1 = *piVar1 + 1;
      uVar46 = *local_2a8;
      lVar41 = lVar41 * uVar46;
      uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + lVar41);
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + lVar15);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar41));
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
      }
      else {
        piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar10;
      }
    }
    goto LAB_00305084;
  }
  piVar1 = (int *)(uVar17 * uVar46 + local_190 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar36 + uVar46 * lVar15 + local_208._24_8_) != '\0') {
    uVar10 = TTA::MemNewLabel();
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    plVar39 = local_230;
    goto LAB_00308812;
  }
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
LAB_00314a63:
  puVar40 = (ulong *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19);
  goto LAB_003080de;
LAB_00310a07:
  piVar1 = (int *)(lVar27 * *local_158 + local_190 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar15 + lVar41) == '\0') {
LAB_00310a80:
    uVar10 = TTA::MemNewLabel();
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
  }
  else {
    uVar17 = *local_248;
    piVar1 = (int *)((long)local_280 + (long)iVar11 * 4 + uVar17 * (uVar19 - 2));
    *piVar1 = *piVar1 + 1;
    uVar46 = *local_2a8;
    uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)iVar11 * 4 + (uVar19 - 2) * uVar46);
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
    *piVar1 = *piVar1 + 1;
    puVar40 = (ulong *)(uVar46 * uVar19 + local_2f8._24_8_);
LAB_00310a77:
    *(undefined4 *)((long)puVar40 + (long)local_308 * 4) = uVar12;
  }
  goto LAB_00311b9e;
LAB_00310245:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)(int)lVar38 * 4 + uVar46 * uVar19);
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
  goto LAB_00311b9e;
LAB_0030c179:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
  goto LAB_0030a8be;
joined_r0x0031402f:
  if (cVar34 == '\0') {
LAB_0030a878:
    uVar10 = TTA::MemNewLabel();
    piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
    *piVar1 = *piVar1 + 1;
    *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
    goto LAB_00303dda;
  }
LAB_00314035:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
  goto LAB_003039a7;
LAB_0030b859:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
  piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + (long)(int)lVar38 * 4 + uVar46 * uVar19
                                         ));
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
  goto LAB_0030a8be;
LAB_0030a7de:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * (uVar19 - 2));
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar10 = *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + (uVar19 - 2) * uVar46);
  piVar1 = (int *)((long)local_280 + (long)(int)lVar38 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar13 = *(uint *)(local_2f8._24_8_ + (long)(int)lVar38 * 4 + uVar46 * uVar19);
LAB_0030a832:
  uVar10 = TTA::MemMerge(uVar10,uVar13);
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + *local_248 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + (long)local_308 * 4 + *local_2a8 * uVar19) = uVar10;
  goto LAB_00305084;
LAB_00314dc1:
  uVar17 = *local_248;
  piVar1 = (int *)((long)local_280 + (long)(int)lVar27 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  uVar46 = *local_2a8;
  uVar12 = *(undefined4 *)(local_2f8._24_8_ + (long)(int)lVar27 * 4 + uVar46 * uVar19);
  piVar1 = (int *)((long)local_280 + (long)local_308 * 4 + uVar17 * uVar19);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_2f8._24_8_ + (long)local_308 * 4 + uVar46 * uVar19) = uVar12;
  goto LAB_00303dda;
LAB_003177bf:
  piVar1 = (int *)((long)local_308 + lVar28 * 4 + lVar36 * 4 + (long)puVar23 * (long)local_230 + 8);
  *piVar1 = *piVar1 + 1;
  puVar50 = (ulong *)(lVar28 + lVar36 + 2);
  local_138 = puVar24;
  puVar40 = (ulong *)(ulong)(uint)(iVar11 + iVar20);
LAB_00317801:
  uVar12 = *(undefined4 *)((long)local_138 + (long)puVar50 * 4 + (long)puVar51 * (long)plVar39);
  lVar27 = (long)puVar23 * lVar47;
  piVar1 = (int *)((long)local_308 + (long)puVar50 * 4 + lVar27);
  *piVar1 = *piVar1 + 1;
  lVar36 = (long)puVar51 * lVar47;
  *(undefined4 *)((long)local_138 + (long)puVar50 * 4 + lVar36) = uVar12;
  lVar41 = (long)(int)puVar40;
  puVar40 = (ulong *)(lVar41 + 2);
  local_218 = puVar40;
  local_220 = puVar23;
  if ((int)puVar40 < iVar29) {
    piVar1 = (int *)(*local_158 * lVar47 + local_190 + 8 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = *(long *)local_208._80_8_;
    lVar28 = lVar38 * lVar47 + local_208._24_8_;
    uVar42 = *local_158;
    puVar24 = local_138;
    puVar50 = puVar40;
    if (*(char *)(lVar41 + 2 + lVar28) == '\0') {
      piVar1 = (int *)(uVar42 * lVar47 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar28 + 3 + lVar41) == '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
LAB_00317c19:
        puVar22 = local_228;
        puVar30 = (ulong *)((ulong)puVar40 & 0xffffffff);
        puVar31 = puVar40;
        puVar24 = puVar33;
        local_140 = local_228;
        goto LAB_00315b88;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
      if (*(char *)(lVar41 + 3 + lVar38) != '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
        *piVar1 = *piVar1 + 1;
        puVar40 = (ulong *)((ulong)puVar40 & 0xffffffff);
        goto LAB_00317e90;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0x10 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 4 + lVar41) == '\0') {
        uVar10 = TTA::MemNewLabel();
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        puVar24 = (ulong *)local_2f8._24_8_;
        puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
        local_308 = local_280;
        local_228 = puVar22;
        puVar33 = (ulong *)local_2f8._24_8_;
        goto LAB_00316aeb;
      }
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 0x10);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)local_210 * (long)plVar39 + 0x10);
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
      *piVar1 = *piVar1 + 1;
      puVar22 = local_228;
      puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
      puVar24 = puVar33;
      puVar51 = local_228;
    }
    else {
      piVar1 = (int *)(local_190 + uVar42 * lVar15 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * lVar15) != '\0') {
        piVar1 = (int *)(local_190 + *local_158 * (long)plVar39 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_;
        if (*(char *)(lVar41 + 2 + lVar38) == '\0') {
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + lVar36);
        }
        else {
          piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar38 + 1 + lVar41);
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
            *piVar1 = *piVar1 + 1;
            puVar22 = local_210;
            puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
            goto LAB_003194b1;
          }
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
        }
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        puVar24 = (ulong *)local_2f8._24_8_;
        puVar51 = puVar22;
        local_308 = local_280;
        puVar33 = (ulong *)local_2f8._24_8_;
        puVar50 = local_218;
        puVar31 = (ulong *)((ulong)local_218 & 0xffffffff);
        local_228 = puVar22;
        goto LAB_003194b1;
      }
      piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_;
      if (*(char *)(lVar41 + 3 + lVar38 * lVar47 + local_208._24_8_) == '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar12 = *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36);
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36 + 8) = uVar12;
        goto LAB_0031a55c;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0x10 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 4 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar12 = *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36);
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36 + 8) = uVar12;
        puVar31 = local_138;
        puVar50 = local_228;
LAB_00318a70:
        iVar11 = (int)local_218;
        uVar10 = iVar11 + 2;
        local_228 = puVar50;
        if ((int)uVar10 < iVar29) {
          local_220 = local_248;
          local_138 = (ulong *)local_2f8._24_8_;
          puVar40 = (ulong *)(long)iVar11;
          lVar38 = (long)puVar40 + 2;
          lVar32 = (long)puVar40 << 0x20;
          lVar37 = *local_158 * lVar15 + (long)puVar40 * 4 + local_190;
          lVar36 = local_208._24_8_ + *(long *)local_208._80_8_ * lVar15;
          lVar28 = local_208._24_8_ + *(long *)local_208._80_8_ * lVar47;
          lVar27 = local_190 + 0xc + *local_158 * lVar47 + (long)puVar40 * 4;
          local_308 = local_280;
          local_228 = (ulong *)((long)local_280 + (long)puVar40 * 4);
          lVar41 = 0;
          while( true ) {
            piVar1 = (int *)(lVar27 + -4 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar33 = (ulong *)local_2f8._24_8_;
            plVar39 = local_230;
            local_210 = puVar40;
            if (*(char *)((long)puVar40 + lVar41 + lVar28 + 2) == '\0') {
              puVar31 = (ulong *)(lVar38 + lVar41);
              uVar42 = *local_158;
              lVar27 = lVar32 + 0x300000000 >> 0x20;
              piVar1 = (int *)((lVar32 + 0x300000000 >> 0x1e) + uVar42 * lVar47 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              if (*(char *)(lVar27 + lVar38 * lVar47 + local_208._24_8_) == '\0') {
                local_220 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)local_220 * lVar47 + 8);
                *piVar1 = *piVar1 + 1;
                local_140 = (ulong *)*local_2a8;
                puVar22 = local_140;
                puVar30 = puVar31;
                goto LAB_00315b88;
              }
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              puVar50 = puVar31;
              if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * lVar15) != '\0') {
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)puVar23 * (long)local_230 + 8)
                ;
                *piVar1 = *piVar1 + 1;
                puVar51 = (ulong *)*local_2a8;
                puVar40 = puVar31;
                local_228 = puVar51;
                local_210 = puVar51;
                goto LAB_00317e90;
              }
              piVar1 = (int *)((lVar32 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar38 = lVar32 + 0x400000000 >> 0x20;
              if (*(char *)(lVar38 + *(long *)local_208._80_8_ * lVar15 + local_208._24_8_) == '\0')
              {
                uVar10 = TTA::MemNewLabel();
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar41 * 4 + (long)local_210 * 4 + (long)puVar23 * lVar47 + 8);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                puVar24 = (ulong *)local_2f8._24_8_;
                local_308 = local_280;
                local_228 = puVar22;
                puVar33 = (ulong *)local_2f8._24_8_;
                goto LAB_00316aeb;
              }
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 + lVar38 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              puVar22 = (ulong *)*local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (long)puVar22 * (long)local_230);
              piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              puVar51 = puVar22;
              local_228 = puVar22;
              goto LAB_0031713b;
            }
            piVar1 = (int *)(lVar37 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar49 = lVar32 >> 0x1e;
            lVar52 = lVar32 >> 0x20;
            if (*(char *)((long)puVar40 + lVar41 + lVar36 + 3) != '\0') break;
            piVar1 = (int *)(lVar27 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)puVar40 + lVar41 + lVar28 + 3) == '\0') {
              uVar42 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar49 + uVar42 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar19 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar49 + uVar19 * lVar47);
              piVar1 = (int *)((long)local_280 +
                              lVar41 * 4 + (long)puVar40 * 4 + uVar42 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (local_2f8._24_8_ + lVar41 * 4 + (long)puVar40 * 4 + uVar19 * lVar47 + 8) = uVar12;
              puVar40 = (ulong *)(ulong)(uint)((int)lVar38 + (int)lVar41);
              goto LAB_0031a55c;
            }
            piVar1 = (int *)(lVar37 + 0x10 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)puVar40 + lVar41 + lVar36 + 4) != '\0') {
              piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar40 * 4 + 0xc +
                              lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              puVar50 = (ulong *)(lVar38 + lVar41);
              lVar27 = *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_;
              if (*(char *)((long)puVar50 + lVar27 + 1) == '\0') {
                uVar42 = *local_248;
                piVar1 = (int *)((long)local_228 + lVar41 * 4 + uVar42 * (long)local_230 + 0x10);
                *piVar1 = *piVar1 + 1;
                uVar19 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar41 * 4 + uVar19 * (long)local_230 + (long)puVar40 * 4 + 0x10);
                piVar1 = (int *)((long)local_280 + lVar49 + uVar42 * lVar47);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar49 + uVar19 * lVar47)
                                      );
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
                *piVar1 = *piVar1 + 1;
                local_228 = (ulong *)*local_2a8;
                goto LAB_00317129;
              }
              piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar40 * 4 + 8 +
                              lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              local_218 = puVar50;
              if (*(char *)(lVar41 + lVar27 + lVar38) == '\0') {
                uVar42 = *local_248;
                piVar1 = (int *)((long)local_228 + lVar41 * 4 + uVar42 * (long)local_230 + 8);
                *piVar1 = *piVar1 + 1;
                uVar19 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar41 * 4 + uVar19 * (long)local_230 + (long)puVar40 * 4 + 8);
                piVar1 = (int *)((long)local_280 + lVar49 + uVar42 * lVar47);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar49 + uVar19 * lVar47)
                                      );
                puVar23 = (ulong *)*local_248;
                puVar40 = (ulong *)((long)local_280 + (long)puVar40 * 4 + (long)puVar23 * lVar47);
                goto LAB_00319411;
              }
              piVar1 = (int *)(lVar49 + *local_158 * lVar15 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              if (*(char *)(lVar52 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
                uVar42 = *local_248;
                piVar1 = (int *)((long)local_228 + lVar41 * 4 + uVar42 * (long)local_230 + 8);
                *piVar1 = *piVar1 + 1;
                uVar19 = *local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar41 * 4 + uVar19 * (long)local_230 + (long)puVar40 * 4 + 8);
                piVar1 = (int *)((long)local_280 + lVar52 * 4 + uVar42 * lVar47);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                       lVar52 * 4 + uVar19 * lVar47));
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                puVar31 = (ulong *)((ulong)local_218 & 0xffffffff);
                puVar24 = (ulong *)local_2f8._24_8_;
                puVar51 = puVar22;
                local_308 = local_280;
                puVar33 = (ulong *)local_2f8._24_8_;
                plVar39 = local_230;
                puVar50 = local_218;
                local_228 = puVar22;
              }
              else {
                piVar1 = (int *)((lVar32 + 0x100000000 >> 0x1e) +
                                *local_158 * (long)local_230 + local_190);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)((lVar32 + 0x100000000 >> 0x20) +
                                  local_208._24_8_ + lVar38 * (long)local_230);
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 + lVar52 * 4 + (long)puVar23 * (long)local_230);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar52 * 4 + (long)puVar22 * (long)local_230);
                if (cVar25 == '\0') {
                  piVar1 = (int *)((long)local_228 +
                                  lVar41 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar41 * 4 +
                                                         (long)puVar22 * (long)local_230 +
                                                         (long)puVar40 * 4 + 8));
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
LAB_0031a4e1:
                  local_228 = (ulong *)*local_2a8;
                  puVar50 = local_218;
LAB_00317129:
                  puVar31 = (ulong *)((ulong)puVar50 & 0xffffffff);
                  puVar22 = local_228;
                  puVar24 = (ulong *)local_2f8._24_8_;
                  puVar51 = local_228;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  plVar39 = local_230;
                }
                else {
                  piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar31 = (ulong *)((ulong)puVar50 & 0xffffffff);
                  puVar51 = puVar22;
                  local_228 = puVar22;
                }
              }
              goto LAB_0031713b;
            }
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            local_210 = (ulong *)*local_2a8;
            lVar52 = (long)local_210 * lVar47 + (long)puVar40 * 4;
            uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + lVar52);
            piVar1 = (int *)((long)local_228 + lVar41 * 4 + (long)puVar23 * lVar47 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + lVar52 + 8) = uVar12;
            lVar32 = lVar32 + 0x200000000;
            lVar52 = lVar38 + lVar41;
            lVar41 = lVar41 + 2;
            if ((long)local_130 <= lVar52 + 2) {
              uVar10 = iVar11 + (int)lVar41 + 2;
              iVar11 = iVar11 + (int)lVar41;
              puVar31 = (ulong *)local_2f8._24_8_;
              local_228 = local_210;
              goto LAB_0031ae59;
            }
          }
          puVar50 = (ulong *)(lVar38 + lVar41);
          piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar40 * 4 + 8 +
                          lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          puVar31 = puVar50;
          if (*(char *)((long)puVar50 + lVar38 * (long)local_230 + local_208._24_8_) == '\0') {
            uVar42 = *local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar40 * 4 + uVar42 * (long)local_230 + 8);
            *piVar1 = *piVar1 + 1;
            uVar19 = *local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ +
                              lVar41 * 4 + (long)puVar40 * 4 + uVar19 * (long)local_230 + 8);
            piVar1 = (int *)((long)local_280 + lVar49 + uVar42 * lVar47);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar49 + uVar19 * lVar47));
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar51 = puVar22;
            local_308 = local_280;
            puVar33 = (ulong *)local_2f8._24_8_;
            local_228 = puVar22;
          }
          else {
            piVar1 = (int *)(lVar49 + *local_158 * lVar15 + local_190);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar52 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
              uVar42 = *local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar41 * 4 + (long)puVar40 * 4 + uVar42 * (long)local_230 + 8);
              *piVar1 = *piVar1 + 1;
              uVar19 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ +
                                lVar41 * 4 + (long)puVar40 * 4 + uVar19 * (long)local_230 + 8);
              piVar1 = (int *)((long)local_280 + lVar52 * 4 + uVar42 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + lVar52 * 4 + uVar19 * lVar47);
            }
            else {
              piVar1 = (int *)((lVar32 + 0x100000000 >> 0x1e) +
                              *local_158 * (long)local_230 + local_190);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((lVar32 + 0x100000000 >> 0x20) +
                                *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_);
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 + lVar52 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              puVar22 = (ulong *)*local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar52 * 4 + (long)puVar22 * (long)local_230);
              if (cVar25 != '\0') {
                piVar1 = (int *)((long)local_280 +
                                lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
                *piVar1 = *piVar1 + 1;
                puVar51 = puVar22;
                local_228 = puVar22;
                goto LAB_003194b1;
              }
              piVar1 = (int *)((long)local_280 +
                              lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * (long)local_230 + 8);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ +
                                lVar41 * 4 + (long)puVar40 * 4 + (long)puVar22 * (long)local_230 + 8
                                );
            }
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar40 * 4 + (long)puVar23 * lVar47 + 8);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar51 = puVar22;
            local_308 = local_280;
            puVar33 = (ulong *)local_2f8._24_8_;
            local_228 = puVar22;
          }
LAB_003194b1:
          *(uint *)((long)puVar24 + (long)puVar50 * 4 + (long)puVar51 * lVar47) = uVar10;
          iVar11 = (int)puVar31 + 2;
          local_140 = puVar51;
          if (iVar11 < iVar29) {
            puVar40 = (ulong *)(long)(int)puVar31;
            local_138 = (ulong *)((long)puVar40 + 2);
            lVar36 = (long)puVar40 << 0x20;
            lVar27 = (long)puVar40 * 4;
            lVar41 = 0;
            local_140 = local_228;
            local_228 = puVar40;
            local_218 = puVar31;
            do {
              puVar30 = local_228;
              piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 + 8 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              lVar28 = lVar38 * lVar47 + local_208._24_8_;
              uVar42 = *local_158;
              lVar37 = uVar42 * lVar47 + local_190;
              plVar39 = local_230;
              local_220 = puVar23;
              local_210 = puVar22;
              if (*(char *)((long)local_228 + lVar41 + 2 + lVar28) == '\0') {
                puVar31 = (ulong *)((long)local_138 + lVar41);
                piVar1 = (int *)(lVar37 + (lVar36 + 0x300000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar27 = lVar36 + 0x300000000 >> 0x20;
                puVar50 = (ulong *)((long)local_228 + lVar41 + 2);
                local_218 = puVar50;
                local_120 = lVar38;
                if (*(char *)(lVar28 + lVar27) == '\0') {
                  piVar1 = (int *)((long)local_308 +
                                  lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar30 = (ulong *)((ulong)puVar31 & 0xffffffff);
                  puVar31 = puVar50;
                  goto LAB_00315b88;
                }
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
                if (*(char *)(lVar27 + lVar38) != '\0') {
                  piVar1 = (int *)((long)local_308 +
                                  lVar41 * 4 +
                                  (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_228 = local_140;
                  puVar40 = (ulong *)((ulong)puVar31 & 0xffffffff);
                  puVar51 = puVar22;
                  goto LAB_00317e90;
                }
                piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
                *piVar1 = *piVar1 + 1;
                lVar36 = lVar36 + 0x400000000 >> 0x20;
                cVar25 = *(char *)(lVar38 + lVar36);
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_228 * 4 + 8 +
                                lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_;
                cVar34 = *(char *)((long)local_228 + lVar41 + 2 + lVar38 * lVar15 + local_208._24_8_
                                  );
                local_138 = puVar31;
                if (cVar25 == '\0') {
                  if (cVar34 == '\0') {
                    uVar10 = TTA::MemNewLabel();
                    puVar23 = (ulong *)*local_248;
                    piVar1 = (int *)((long)local_280 +
                                    lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    puVar22 = (ulong *)*local_2a8;
                    puVar31 = local_138;
                    goto LAB_0031a6d3;
                  }
                  piVar1 = (int *)((long)local_308 +
                                  lVar41 * 4 +
                                  (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_228 = local_140;
                  local_138 = puVar24;
                  puVar51 = puVar22;
                  puVar40 = puVar31;
                  goto LAB_00317801;
                }
                if (cVar34 == '\0') {
                  piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)puVar23 * (long)local_230);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = *(uint *)((long)puVar24 + lVar36 * 4 + (long)puVar22 * (long)local_230);
                  piVar1 = (int *)((long)local_308 +
                                  lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_228 = local_140;
                  puVar51 = puVar22;
                }
                else {
                  piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * (long)local_230) == '\0') {
                    piVar1 = (int *)((long)local_308 +
                                    lVar41 * 4 +
                                    (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar10 = *(uint *)((long)puVar24 +
                                      lVar41 * 4 +
                                      (long)local_228 * 4 + (long)puVar22 * (long)local_230 + 8);
                    piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)puVar23 * (long)local_230)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar24 +
                                                           lVar36 * 4 +
                                                           (long)puVar22 * (long)local_230));
                    puVar23 = (ulong *)*local_248;
                    piVar1 = (int *)((long)local_280 +
                                    lVar41 * 4 + (long)puVar30 * 4 + (long)puVar23 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_228 = (ulong *)*local_2a8;
                    puVar22 = local_228;
                    puVar31 = local_138;
                    puVar24 = (ulong *)local_2f8._24_8_;
                    puVar51 = local_228;
                    local_308 = local_280;
                    puVar33 = (ulong *)local_2f8._24_8_;
                    plVar39 = local_230;
                  }
                  else {
                    piVar1 = (int *)((long)local_308 +
                                    lVar41 * 4 +
                                    (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar10 = *(uint *)((long)puVar24 +
                                      lVar41 * 4 +
                                      (long)local_228 * 4 + (long)puVar22 * (long)local_230 + 8);
                    piVar1 = (int *)((long)local_308 +
                                    lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_228 = local_140;
                    puVar51 = puVar22;
                  }
                }
                goto LAB_0031713b;
              }
              piVar1 = (int *)(lVar37 + lVar27 + 4 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)((long)local_228 + lVar41 + 1 + lVar28);
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              lVar28 = lVar38 * lVar15 + local_208._24_8_;
              cVar34 = *(char *)((long)local_228 + lVar41 + 3 + lVar28);
              lVar37 = lVar36 >> 0x1e;
              if (cVar25 == '\0') {
                if (cVar34 == '\0') goto LAB_00319c08;
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 8 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_228 + lVar41 + 2 + lVar28) == '\0') {
                  piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 + 8 +
                                  lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)((long)local_228 +
                                    lVar41 + 2 +
                                    *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_);
                  puVar23 = (ulong *)*local_248;
                  lVar38 = lVar27 + (long)puVar23 * (long)local_230;
                  piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar38);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  lVar28 = lVar27 + (long)puVar22 * (long)local_230;
                  uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar28);
                  if (cVar25 != '\0') {
                    puVar40 = (ulong *)((long)puVar23 * lVar47 + (long)local_280);
                    goto LAB_00319832;
                  }
                  piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar38 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar28 + 8);
LAB_00319886:
                  uVar10 = TTA::MemMerge(uVar10,uVar13);
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar41 * 4 + lVar27 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                }
                else {
                  puVar23 = (ulong *)*local_248;
LAB_003196b4:
                  piVar1 = (int *)((long)local_280 +
                                  lVar41 * 4 + (long)puVar23 * (long)local_230 + lVar27 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar41 * 4 + lVar27 + (long)puVar22 * (long)local_230 + 8);
                  piVar1 = (int *)((long)local_280 +
                                  lVar41 * 4 + (long)puVar23 * lVar47 + lVar27 + 8);
                  *piVar1 = *piVar1 + 1;
                }
              }
              else {
                if (cVar34 == '\0') {
                  puVar31 = (ulong *)((long)local_138 + lVar41);
                  piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)local_228 * 4 + 0xc +
                                  lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((long)local_228 + local_208._24_8_ + lVar38 * lVar47 + lVar41 + 3)
                      == '\0') {
                    uVar42 = *local_248;
                    piVar1 = (int *)((long)local_280 + lVar37 + uVar42 * lVar47);
                    *piVar1 = *piVar1 + 1;
                    uVar19 = *local_2a8;
                    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar37 + uVar19 * lVar47);
                    piVar1 = (int *)((long)local_280 +
                                    lVar41 * 4 + (long)local_228 * 4 + uVar42 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)
                     (local_2f8._24_8_ + lVar41 * 4 + (long)local_228 * 4 + uVar19 * lVar47 + 8) =
                         uVar12;
                    puVar40 = (ulong *)((ulong)puVar31 & 0xffffffff);
                    goto LAB_0031a55c;
                  }
                  lVar27 = lVar36 + 0x400000000 >> 0x20;
                  piVar1 = (int *)((lVar36 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190)
                  ;
                  *piVar1 = *piVar1 + 1;
                  lVar38 = *(long *)local_208._80_8_;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  if (*(char *)(lVar27 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
                    puVar23 = (ulong *)*local_248;
                    piVar1 = (int *)((long)local_280 + lVar37 + (long)puVar23 * lVar47);
                    *piVar1 = *piVar1 + 1;
                    puVar50 = (ulong *)*local_2a8;
                    uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar37 + (long)puVar50 * lVar47);
                    piVar1 = (int *)((long)local_280 +
                                    lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)
                     (local_2f8._24_8_ +
                     lVar41 * 4 + (long)local_228 * 4 + (long)puVar50 * lVar47 + 8) = uVar12;
                    local_218 = (ulong *)((ulong)puVar31 & 0xffffffff);
                    puVar31 = (ulong *)local_2f8._24_8_;
                    local_210 = puVar50;
                    goto LAB_00318a70;
                  }
                  local_218 = (ulong *)((long)local_228 + lVar41 + 2);
                  piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)local_228 * 4 +
                                   0xc + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((long)local_228 +
                               lVar41 + 3 + lVar38 * (long)local_230 + local_208._24_8_) == '\0') {
                    uVar42 = *local_248;
                    piVar1 = (int *)((long)local_280 + lVar27 * 4 + uVar42 * (long)local_230);
                    *piVar1 = *piVar1 + 1;
                    uVar19 = *local_2a8;
                    uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + uVar19 * (long)local_230);
                    piVar1 = (int *)((long)local_280 + lVar37 + uVar42 * lVar47);
                    *piVar1 = *piVar1 + 1;
                    uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                           lVar37 + uVar19 * lVar47));
                    puVar23 = (ulong *)*local_248;
                    lVar38 = (long)local_280 + (long)puVar30 * 4 + (long)puVar23 * lVar47;
LAB_0031a0e6:
                    piVar1 = (int *)(lVar38 + 8 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    puVar22 = (ulong *)*local_2a8;
                    puVar24 = (ulong *)local_2f8._24_8_;
                    puVar51 = puVar22;
                    local_308 = local_280;
                    puVar33 = (ulong *)local_2f8._24_8_;
                    plVar39 = local_230;
                    puVar50 = local_218;
                    local_228 = puVar22;
                  }
                  else {
                    piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_228 * 4 + 8 +
                                    lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar38 = *(long *)local_208._80_8_;
                    if (*(char *)((long)local_228 + lVar41 + 2 + lVar38 * lVar15 + local_208._24_8_)
                        == '\0') {
                      piVar1 = (int *)(*local_158 * (long)local_230 + local_190 +
                                       (long)local_228 * 4 + 8 + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      puVar23 = (ulong *)*local_248;
                      if (*(char *)((long)local_228 +
                                   lVar41 + 2 + lVar38 * (long)local_230 + local_208._24_8_) == '\0'
                         ) {
                        piVar1 = (int *)((long)local_280 +
                                        lVar41 * 4 +
                                        (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                        *piVar1 = *piVar1 + 1;
                        uVar42 = *local_2a8;
                        uVar10 = *(uint *)(local_2f8._24_8_ +
                                          lVar41 * 4 +
                                          (long)local_228 * 4 + uVar42 * (long)local_230 + 8);
                        piVar1 = (int *)((long)local_280 + lVar37 + (long)puVar23 * lVar47);
                        *piVar1 = *piVar1 + 1;
                        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                               lVar37 + uVar42 * lVar47));
                        puVar23 = (ulong *)*local_248;
                        lVar38 = (long)local_280 + (long)puVar30 * 4 + (long)puVar23 * lVar47;
                        goto LAB_0031a0e6;
                      }
                      piVar1 = (int *)((long)local_280 + lVar37 + (long)puVar23 * (long)local_230);
                      *piVar1 = *piVar1 + 1;
                      puVar22 = (ulong *)*local_2a8;
                      uVar10 = *(uint *)(local_2f8._24_8_ + lVar37 + (long)puVar22 * (long)local_230
                                        );
                      lVar38 = (long)local_228 * 4 + (long)puVar23 * lVar47;
                    }
                    else {
                      puVar23 = (ulong *)*local_248;
                      piVar1 = (int *)((long)local_280 +
                                      lVar41 * 4 +
                                      (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
                      *piVar1 = *piVar1 + 1;
                      puVar22 = (ulong *)*local_2a8;
                      uVar10 = *(uint *)(local_2f8._24_8_ +
                                        lVar41 * 4 +
                                        (long)local_228 * 4 + (long)puVar22 * (long)local_230 + 8);
                      lVar38 = (long)local_228 * 4 + (long)puVar23 * lVar47;
                    }
                    piVar1 = (int *)((long)local_280 + lVar41 * 4 + lVar38 + 8);
                    *piVar1 = *piVar1 + 1;
                    puVar24 = (ulong *)local_2f8._24_8_;
                    puVar51 = puVar22;
                    puVar50 = local_218;
                    local_228 = puVar22;
                  }
                  goto LAB_0031713b;
                }
                piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 + 8 + lVar41 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_228 + lVar41 + 2 + lVar28) != '\0') {
                  puVar23 = (ulong *)*local_248;
                  goto LAB_003196b4;
                }
                piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 + 8 + lVar41 * 4)
                ;
                *piVar1 = *piVar1 + 1;
                puVar23 = (ulong *)*local_248;
                puVar40 = (ulong *)((long)puVar23 * lVar47 + (long)local_280);
                if (*(char *)((long)local_228 +
                             lVar41 + 2 +
                             *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_) == '\0'
                   ) {
                  piVar1 = (int *)((long)local_280 +
                                  lVar41 * 4 + lVar27 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar42 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar41 * 4 + uVar42 * (long)local_230 + lVar27 + 8);
                  piVar1 = (int *)((long)puVar40 + lVar41 * 4 + lVar27);
                  *piVar1 = *piVar1 + 1;
                  uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 * 4 + uVar42 * lVar47 + lVar27);
                  goto LAB_00319886;
                }
                piVar1 = (int *)((long)local_280 +
                                lVar41 * 4 + lVar27 + (long)puVar23 * (long)local_230);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar41 * 4 + lVar27 + (long)puVar22 * (long)local_230);
LAB_00319832:
                piVar1 = (int *)((long)puVar40 + lVar41 * 4 + lVar27 + 8);
                *piVar1 = *piVar1 + 1;
              }
              *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar27 + (long)puVar22 * lVar47 + 8) =
                   uVar10;
              lVar36 = lVar36 + 0x200000000;
              lVar38 = lVar41 + 4;
              lVar41 = lVar41 + 2;
              puVar24 = (ulong *)local_2f8._24_8_;
              puVar51 = puVar22;
              local_308 = local_280;
              puVar33 = (ulong *)local_2f8._24_8_;
              local_140 = puVar22;
              if ((long)local_130 <= (long)local_228 + lVar38) {
                iVar11 = (int)local_218 + (int)lVar41 + 2;
                puVar31 = (ulong *)(ulong)(uint)((int)local_218 + (int)lVar41);
                break;
              }
            } while( true );
          }
          lVar27 = (long)iVar11;
          piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_ * lVar47 + local_208._24_8_;
          iVar20 = (int)puVar31;
          if (iVar29 < iVar11) {
            if (*(char *)(lVar27 + lVar38) == '\0') {
LAB_0031b77b:
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)local_140 * lVar47) = 0;
              goto LAB_0031c09e;
            }
            lVar41 = (long)iVar20;
            piVar1 = (int *)(*local_158 * lVar47 + local_190 + 4 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + 1 + lVar41) != '\0') {
LAB_0031b552:
              piVar1 = (int *)((long)local_308 + (long)iVar20 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar24 + (long)iVar20 * 4 + (long)local_140 * lVar47);
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)local_140 * lVar47) = uVar12;
              goto LAB_0031c09e;
            }
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar27 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0') {
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)
                        ((long)puVar24 + lVar41 * 4 + (long)local_230 * (long)local_140);
            }
            else {
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)
                        ((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)local_140);
            }
LAB_0031c547:
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
LAB_0031c552:
            puVar40 = (ulong *)((long)local_140 * lVar47 + (long)puVar24);
          }
          else {
            lVar36 = *local_158 * lVar47 + local_190;
            lVar41 = (long)iVar20;
            if (*(char *)(lVar27 + lVar38) == '\0') {
              piVar1 = (int *)(lVar36 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar38 + 3 + lVar41) == '\0') goto LAB_0031b77b;
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
              if ((*(char *)(lVar41 + 3 + lVar38) != '\0') ||
                 (piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar27 * 4),
                 *piVar1 = *piVar1 + 1, *(char *)(lVar38 + lVar27) != '\0')) {
LAB_0031b91e:
                piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(undefined4 *)
                          ((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)local_140);
                piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
                *piVar1 = *piVar1 + 1;
                goto LAB_0031c552;
              }
              uVar10 = TTA::MemNewLabel();
LAB_0031c5d1:
              piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + lVar27 * 4 + lVar47 * *local_2a8) = uVar10;
              goto LAB_0031c09e;
            }
            piVar1 = (int *)(lVar36 + 4 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            cVar25 = *(char *)(lVar38 + 1 + lVar41);
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
            cVar34 = *(char *)(lVar41 + 3 + lVar38);
            if (cVar25 == '\0') {
              piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (cVar34 == '\0') {
                if (*(char *)(lVar38 + lVar27) == '\0') {
                  piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)local_230);
                  *piVar1 = *piVar1 + 1;
                  uVar12 = *(undefined4 *)
                            ((long)puVar24 + lVar41 * 4 + (long)local_230 * (long)local_140);
                }
                else {
                  piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
                  *piVar1 = *piVar1 + 1;
                  uVar12 = *(undefined4 *)
                            ((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)local_140);
                }
                goto LAB_0031c547;
              }
              if (*(char *)(lVar38 + lVar27) != '\0') goto LAB_0031b91e;
              piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar27 + *(long *)local_208._80_8_ * (long)local_230 +
                                          local_208._24_8_);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(uint *)((long)puVar24 + lVar41 * 4 + (long)local_230 * (long)local_140);
              if (cVar25 == '\0') {
                piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
                *piVar1 = *piVar1 + 1;
                uVar13 = *(uint *)((long)puVar24 + lVar27 * 4 + (long)local_230 * (long)local_140);
LAB_0031c5c9:
                uVar10 = TTA::MemMerge(uVar10,uVar13);
                goto LAB_0031c5d1;
              }
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(uint *)((long)puVar24 + lVar27 * 4 + (long)local_140 * lVar47) = uVar10;
              goto LAB_0031c09e;
            }
            if (cVar34 == '\0') goto LAB_0031b552;
            piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar38 + lVar27) != '\0') goto LAB_0031b91e;
            piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)((long)local_140 * lVar47 + (long)puVar24);
            if (*(char *)(lVar27 + *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_)
                == '\0') {
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(uint *)((long)puVar24 + lVar27 * 4 + (long)local_140 * (long)local_230);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)((long)puVar40 + lVar41 * 4);
              goto LAB_0031c5c9;
            }
            piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)local_230);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)local_140 * (long)local_230)
            ;
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
          }
          *(undefined4 *)((long)puVar40 + lVar27 * 4) = uVar12;
          goto LAB_0031c09e;
        }
LAB_0031ae59:
        puVar50 = local_228;
        puVar40 = (ulong *)(ulong)uVar10;
        if (iVar29 < (int)uVar10) goto LAB_0031ae76;
        lVar27 = (long)(int)uVar10;
        piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        lVar36 = lVar38 * lVar47 + local_208._24_8_;
        lVar41 = (long)iVar11;
        if (*(char *)(lVar27 + lVar36) == '\0') {
          piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 3 + lVar41) == '\0') {
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar31 + lVar27 * 4 + (long)local_210 * lVar47) = 0;
            goto LAB_0031c09e;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 3 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) != '\0')
          {
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
            *piVar1 = *piVar1 + 1;
            uVar10 = *(uint *)((long)puVar31 + lVar27 * 4 + (long)local_230 * (long)local_210);
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            puVar31 = (ulong *)((long)local_210 * lVar47 + (long)puVar31);
            goto LAB_00302c61;
          }
LAB_0031c065:
          uVar10 = TTA::MemNewLabel();
LAB_0031c06a:
          piVar1 = (int *)((long)local_280 + lVar27 * 4 + *local_248 * lVar47);
          *piVar1 = *piVar1 + 1;
          puVar31 = (ulong *)(lVar47 * *local_2a8 + local_2f8._24_8_);
        }
        else {
          piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * lVar15) != '\0') {
            piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_;
            if ((*(char *)(lVar27 + lVar38 * (long)local_230 + local_208._24_8_) == '\0') ||
               (piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar41 * 4),
               *piVar1 = *piVar1 + 1, *(char *)(lVar41 + local_208._24_8_ + lVar38 * lVar15) == '\0'
               )) {
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(uint *)((long)puVar31 + lVar27 * 4 + (long)local_230 * (long)local_210);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              puVar31 = (ulong *)((long)local_210 * lVar47 + (long)puVar31);
LAB_0031bcaa:
              uVar13 = *(uint *)((long)puVar31 + lVar41 * 4);
            }
            else {
              piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + 4 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar41 + 1 +
                                *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(uint *)((long)puVar31 + lVar41 * 4 + (long)local_230 * (long)local_210);
              if (cVar25 != '\0') {
                piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
                *piVar1 = *piVar1 + 1;
                *(uint *)((long)puVar31 + lVar27 * 4 + (long)local_210 * lVar47) = uVar10;
                goto LAB_0031c09e;
              }
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)((long)puVar31 + lVar27 * 4 + (long)local_230 * (long)local_210);
            }
LAB_0031bcb0:
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            goto LAB_0031c06a;
          }
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
          *piVar1 = *piVar1 + 1;
          puVar31 = (ulong *)((long)puVar31 + (long)local_210 * lVar47);
          uVar10 = *(uint *)((long)puVar31 + lVar41 * 4);
          piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
          *piVar1 = *piVar1 + 1;
        }
        *(uint *)((long)puVar31 + lVar27 * 4) = uVar10;
        goto LAB_0031c09e;
      }
      piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_;
      if (*(char *)(lVar41 + 3 + lVar38) == '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 0x10);
        *piVar1 = *piVar1 + 1;
        uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 0x10);
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)local_138 + lVar41 * 4 + lVar36));
        puVar23 = (ulong *)*local_248;
      }
      else {
        piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + 2 + lVar41) == '\0') {
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + lVar36);
        }
        else {
          piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)(lVar41 + 1 +
                            *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_);
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39);
          if (cVar25 != '\0') {
            piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
            *piVar1 = *piVar1 + 1;
            puVar22 = local_210;
            puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
            goto LAB_0031713b;
          }
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
        }
        uVar10 = TTA::MemMerge(uVar10,uVar13);
        puVar23 = (ulong *)*local_248;
      }
      puVar40 = (ulong *)((long)puVar23 * lVar47 + (long)local_280);
LAB_00319411:
      piVar1 = (int *)((long)puVar40 + lVar41 * 4 + 8);
      *piVar1 = *piVar1 + 1;
      local_228 = (ulong *)*local_2a8;
      puVar31 = (ulong *)((ulong)local_218 & 0xffffffff);
      puVar22 = local_228;
      puVar24 = (ulong *)local_2f8._24_8_;
      puVar51 = local_228;
      local_308 = local_280;
      puVar33 = (ulong *)local_2f8._24_8_;
      plVar39 = local_230;
      puVar50 = local_218;
    }
    goto LAB_0031713b;
  }
  puVar50 = local_228;
  if (iVar29 < (int)puVar40) goto LAB_0031ae76;
  piVar1 = (int *)(*local_158 * lVar47 + local_190 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar38 = *(long *)local_208._80_8_;
  lVar28 = lVar38 * lVar47 + local_208._24_8_;
  if (*(char *)(lVar41 + 2 + lVar28) == '\0') {
    piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar28 + 3 + lVar41) == '\0') {
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36 + 8) = 0;
      goto LAB_0031c09e;
    }
    piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 3 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) != '\0') {
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
      goto LAB_0031c5b2;
    }
    uVar10 = TTA::MemNewLabel();
  }
  else {
    piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36);
LAB_0031c5b2:
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)((long)local_138 + lVar41 * 4 + lVar36 + 8) = uVar12;
      goto LAB_0031c09e;
    }
    piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 8 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    lVar15 = *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_;
    if (*(char *)(lVar41 + 2 + lVar15) == '\0') {
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27);
      *piVar1 = *piVar1 + 1;
      uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + lVar36);
    }
    else {
      piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + 4 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar15 + 1 + lVar41);
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39);
      if (cVar25 != '\0') {
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar27 + 8);
        *piVar1 = *piVar1 + 1;
        *(uint *)((long)local_138 + lVar41 * 4 + lVar36 + 8) = uVar10;
        goto LAB_0031c09e;
      }
      piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39 + 8);
      *piVar1 = *piVar1 + 1;
      uVar13 = *(uint *)((long)local_138 + lVar41 * 4 + (long)puVar51 * (long)plVar39 + 8);
    }
    uVar10 = TTA::MemMerge(uVar10,uVar13);
  }
  piVar1 = (int *)((long)local_280 + lVar41 * 4 + *local_248 * lVar47 + 8);
  *piVar1 = *piVar1 + 1;
  *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar47 * *local_2a8 + 8) = uVar10;
  goto LAB_0031c09e;
LAB_00319c08:
  piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)local_228 * 4 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  puVar40 = (ulong *)((long)local_138 + lVar41);
  lVar27 = *local_158 * lVar15 + local_190;
  local_138 = puVar40;
  if (*(char *)((long)local_228 + local_208._24_8_ + lVar38 * lVar47 + lVar41 + 3) == '\0') {
    piVar1 = (int *)(lVar27 + (long)local_228 * 4 + 8 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)((long)local_228 +
                 lVar41 + 2 + *(long *)local_208._80_8_ * lVar15 + local_208._24_8_) == '\0') {
      piVar1 = (int *)((long)local_308 + lVar37 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)((long)puVar24 + lVar37 + (long)puVar22 * (long)local_230);
    }
    else {
      piVar1 = (int *)((long)local_308 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)
                ((long)puVar24 +
                lVar41 * 4 + (long)local_228 * 4 + (long)puVar22 * (long)local_230 + 8);
    }
    piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8
                    );
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)local_228 * 4 + (long)puVar22 * lVar47 + 8) =
         uVar12;
    goto LAB_0031a55c;
  }
  piVar1 = (int *)(lVar27 + (lVar36 + 0x400000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  lVar38 = lVar36 + 0x400000000 >> 0x20;
  lVar27 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
  cVar25 = *(char *)(lVar38 + lVar27);
  piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)local_228 * 4 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  puVar50 = (ulong *)((long)local_228 + lVar41 + 2);
  cVar34 = *(char *)((long)local_228 + lVar41 + 2 + lVar27);
  local_218 = puVar50;
  if (cVar25 == '\0') {
    if (cVar34 == '\0') {
      piVar1 = (int *)((long)local_308 + lVar37 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)puVar24 + lVar37 + (long)puVar22 * (long)local_230);
      piVar1 = (int *)((long)local_308 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
      *piVar1 = *piVar1 + 1;
      local_228 = local_140;
LAB_0031a72f:
      puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
      puVar50 = local_218;
LAB_00316aeb:
      *(uint *)((long)puVar24 + (long)puVar50 * 4 + (long)puVar22 * lVar47) = uVar10;
      uVar10 = (int)puVar31 + 2;
      local_218 = puVar31;
      if ((int)uVar10 < iVar29) {
        lVar28 = (long)(int)puVar31;
        lVar27 = lVar28 + 2;
        lVar37 = lVar28 << 0x20;
        lVar41 = lVar28 * 4;
        lVar36 = 0;
        while( true ) {
          piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar41 + 8 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_;
          lVar32 = lVar38 * lVar47 + local_208._24_8_ + lVar27;
          uVar42 = *local_158;
          plVar39 = local_230;
          local_220 = puVar23;
          if (*(char *)(lVar36 + lVar32) != '\0') {
            puVar40 = (ulong *)(lVar27 + lVar36);
            lVar27 = lVar37 + 0x300000000 >> 0x20;
            piVar1 = (int *)((lVar37 + 0x300000000 >> 0x1e) + local_190 + uVar42 * lVar15);
            *piVar1 = *piVar1 + 1;
            lVar41 = lVar37 >> 0x1e;
            if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * lVar15) != '\0') {
              uVar42 = *local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar36 * 4 + lVar28 * 4 + uVar42 * (long)local_230 + 8);
              *piVar1 = *piVar1 + 1;
              uVar19 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ +
                                lVar36 * 4 + lVar28 * 4 + uVar19 * (long)local_230 + 8);
              piVar1 = (int *)((long)local_280 + lVar41 + uVar42 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ + lVar41 + uVar19 * lVar47));
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar36 * 4 + lVar28 * 4 + (long)puVar23 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              puVar22 = (ulong *)*local_2a8;
              puVar24 = (ulong *)local_2f8._24_8_;
              puVar51 = puVar22;
              local_308 = local_280;
              puVar33 = (ulong *)local_2f8._24_8_;
              puVar50 = puVar40;
              puVar31 = (ulong *)((ulong)puVar40 & 0xffffffff);
              local_228 = puVar22;
              goto LAB_003194b1;
            }
            piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_;
            local_218 = puVar40;
            if (*(char *)(lVar27 + lVar38 * lVar47 + local_208._24_8_) == '\0') {
              uVar42 = *local_248;
              piVar1 = (int *)((long)local_280 + lVar41 + uVar42 * lVar47);
              *piVar1 = *piVar1 + 1;
              uVar19 = *local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 + uVar19 * lVar47);
              piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar28 * 4 + uVar42 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar36 * 4 + lVar28 * 4 + uVar19 * lVar47 + 8) =
                   uVar12;
              goto LAB_0031a55c;
            }
            lVar32 = lVar37 + 0x400000000 >> 0x20;
            piVar1 = (int *)((lVar37 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar32 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              puVar50 = (ulong *)*local_2a8;
              uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 + (long)puVar50 * lVar47);
              piVar1 = (int *)((long)local_280 +
                              lVar36 * 4 + lVar28 * 4 + (long)puVar23 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (local_2f8._24_8_ + lVar36 * 4 + lVar28 * 4 + (long)puVar50 * lVar47 + 8) = uVar12;
              puVar31 = (ulong *)local_2f8._24_8_;
              local_308 = local_280;
              puVar33 = (ulong *)local_2f8._24_8_;
              local_210 = puVar50;
              goto LAB_00318a70;
            }
            piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar41 = *local_248 * (long)local_230;
            lVar38 = *local_248 * lVar47;
            lVar37 = lVar37 >> 0x20;
            if (*(char *)(lVar27 + *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_)
                == '\0') {
              piVar1 = (int *)((long)local_280 + lVar32 * 4 + lVar41);
              *piVar1 = *piVar1 + 1;
              uVar42 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ + lVar32 * 4 + uVar42 * (long)local_230);
              piVar1 = (int *)((long)local_280 + lVar37 * 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + lVar37 * 4 + uVar42 * lVar47);
            }
            else {
              piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar28 * 4 + lVar41 + 8);
              *piVar1 = *piVar1 + 1;
              uVar42 = *local_2a8;
              uVar10 = *(uint *)(local_2f8._24_8_ +
                                lVar36 * 4 + lVar28 * 4 + uVar42 * (long)local_230 + 8);
              piVar1 = (int *)((long)local_280 + lVar37 * 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              uVar13 = *(uint *)(local_2f8._24_8_ + lVar37 * 4 + uVar42 * lVar47);
            }
            uVar10 = TTA::MemMerge(uVar10,uVar13);
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar28 * 4 + (long)puVar23 * lVar47 + 8)
            ;
            *piVar1 = *piVar1 + 1;
            goto LAB_0031a4e1;
          }
          piVar1 = (int *)(uVar42 * lVar47 + local_190 + lVar41 + 0xc + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 1 + lVar32) == '\0') {
            piVar1 = (int *)((long)local_308 + lVar36 * 4 + lVar28 * 4 + (long)puVar23 * lVar47 + 8)
            ;
            *piVar1 = *piVar1 + 1;
            puVar40 = (ulong *)(lVar27 + lVar36);
            goto LAB_00317c19;
          }
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar41 + 0xc + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_ + lVar28;
          if (*(char *)(lVar36 + 3 + lVar38) != '\0') break;
          piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar41 + 0x10 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 4 + lVar38) != '\0') {
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar36 * 4 + lVar28 * 4 + (long)puVar23 * (long)local_230 + 0x10);
            *piVar1 = *piVar1 + 1;
            puVar50 = (ulong *)(lVar27 + lVar36);
            local_228 = (ulong *)*local_2a8;
            uVar10 = *(uint *)(local_2f8._24_8_ +
                              lVar36 * 4 + lVar28 * 4 + (long)local_228 * (long)local_230 + 0x10);
            piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar28 * 4 + (long)puVar23 * lVar47 + 8)
            ;
            *piVar1 = *piVar1 + 1;
            goto LAB_00317129;
          }
          uVar10 = TTA::MemNewLabel();
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 + lVar36 * 4 + lVar41 + (long)puVar23 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          local_228 = (ulong *)*local_2a8;
          *(uint *)(local_2f8._24_8_ + lVar36 * 4 + lVar41 + (long)local_228 * lVar47 + 8) = uVar10;
          lVar37 = lVar37 + 0x200000000;
          lVar38 = lVar27 + lVar36;
          lVar36 = lVar36 + 2;
          local_308 = local_280;
          puVar33 = (ulong *)local_2f8._24_8_;
          if ((long)local_130 <= lVar38 + 2) {
            uVar10 = (int)local_218 + (int)lVar36 + 2;
            puVar31 = (ulong *)(ulong)(uint)((int)local_218 + (int)lVar36);
            goto LAB_0031adfe;
          }
        }
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar36 * 4 + lVar28 * 4 + (long)puVar23 * (long)local_230 + 8);
        *piVar1 = *piVar1 + 1;
        puVar50 = (ulong *)(lVar27 + lVar36);
        puVar51 = (ulong *)*local_2a8;
        puVar40 = (ulong *)((ulong)puVar50 & 0xffffffff);
        puVar24 = (ulong *)local_2f8._24_8_;
        local_308 = local_280;
        puVar33 = (ulong *)local_2f8._24_8_;
        local_228 = puVar51;
        local_210 = puVar51;
LAB_00317e90:
        uVar12 = *(undefined4 *)((long)puVar24 + (long)puVar50 * 4 + (long)puVar51 * (long)plVar39);
        piVar1 = (int *)((long)local_308 + (long)puVar50 * 4 + (long)puVar23 * lVar47);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)((long)puVar24 + (long)puVar50 * 4 + (long)puVar51 * lVar47) = uVar12;
        iVar11 = (int)puVar40;
        uVar10 = iVar11 + 2;
        puVar50 = local_228;
        puVar31 = puVar40;
        puVar22 = local_210;
        if ((int)uVar10 < iVar29) {
          uVar42 = *local_158;
          lVar38 = *(long *)local_208._80_8_;
          local_220 = local_248;
          local_228 = local_2a8;
          lVar37 = (long)iVar11;
          local_128 = (ulong *)(lVar37 + 2);
          lVar32 = lVar37 << 0x20;
          lVar27 = local_190 + uVar42 * lVar47 + lVar37 * 4;
          lVar41 = local_208._24_8_ + lVar38 * lVar47 + lVar37;
          local_210 = (ulong *)(local_208._24_8_ + lVar38 * lVar15 + lVar37 + 3);
          local_140 = (ulong *)(local_190 + 0xc + uVar42 * lVar15 + lVar37 * 4);
          local_138 = (ulong *)local_2f8._24_8_;
          lVar36 = lVar37 * 4 + 8;
          local_308 = local_280;
          lVar28 = lVar37 * 4 + 8;
          lVar52 = 0;
          do {
            piVar1 = (int *)(lVar27 + 8 + lVar52 * 4);
            *piVar1 = *piVar1 + 1;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar33 = (ulong *)local_2f8._24_8_;
            plVar39 = local_230;
            local_120 = lVar38;
            if (*(char *)(lVar41 + 2 + lVar52) != '\0') {
              puVar40 = (ulong *)((long)local_128 + lVar52);
              lVar27 = lVar32 + 0x300000000 >> 0x20;
              piVar1 = (int *)((lVar32 + 0x300000000 >> 0x1e) + *local_158 * lVar15 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar38 = *(long *)local_208._80_8_;
              lVar36 = lVar38 * lVar15 + local_208._24_8_;
              local_218 = (ulong *)(lVar37 + 2 + lVar52);
              lVar41 = lVar32 >> 0x1e;
              puVar31 = puVar40;
              puVar50 = local_218;
              if (*(char *)(lVar27 + lVar36) == '\0') {
                piVar1 = (int *)(local_190 + *local_158 * lVar47 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * lVar47) == '\0') {
                  uVar42 = *local_248;
                  piVar1 = (int *)((long)local_280 + lVar41 + uVar42 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 + uVar19 * lVar47);
                  piVar1 = (int *)((long)local_280 + lVar52 * 4 + lVar37 * 4 + uVar42 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_2f8._24_8_ + lVar52 * 4 + lVar37 * 4 + uVar19 * lVar47 + 8)
                       = uVar12;
                  local_128 = puVar40;
                  goto LAB_0031a55c;
                }
                lVar36 = lVar32 + 0x400000000 >> 0x20;
                piVar1 = (int *)((lVar32 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
                *piVar1 = *piVar1 + 1;
                lVar38 = *(long *)local_208._80_8_;
                if (*(char *)(lVar36 + lVar38 * lVar15 + local_208._24_8_) == '\0') {
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  puVar50 = (ulong *)*local_2a8;
                  uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar41 + (long)puVar50 * lVar47);
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (local_2f8._24_8_ + lVar52 * 4 + lVar37 * 4 + (long)puVar50 * lVar47 + 8) =
                       uVar12;
                  puVar31 = (ulong *)local_2f8._24_8_;
                  local_218 = puVar40;
                  local_210 = puVar50;
                  local_128 = puVar40;
                  goto LAB_00318a70;
                }
                piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * (long)local_230) == '\0') {
                  uVar42 = *local_248;
                  piVar1 = (int *)((long)local_280 + lVar36 * 4 + uVar42 * (long)local_230);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + lVar36 * 4 + uVar19 * (long)local_230);
                  piVar1 = (int *)((long)local_280 + lVar41 + uVar42 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  local_128 = puVar40;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar41 + uVar19 * lVar47));
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  puVar31 = local_128;
                  puVar24 = (ulong *)local_2f8._24_8_;
                  puVar51 = puVar22;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  plVar39 = local_230;
                  puVar50 = local_218;
                  local_228 = puVar22;
                }
                else {
                  piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar37 * 4 + 8 + lVar52 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar38 = *(long *)local_208._80_8_;
                  if (*(char *)(lVar52 + 2 + lVar38 * lVar15 + local_208._24_8_ + lVar37) == '\0') {
                    piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar37 * 4 + 8 +
                                    lVar52 * 4);
                    *piVar1 = *piVar1 + 1;
                    puVar23 = (ulong *)*local_248;
                    if (*(char *)(lVar52 + 2 + local_208._24_8_ + lVar37 + lVar38 * (long)local_230)
                        == '\0') {
                      piVar1 = (int *)((long)local_280 +
                                      lVar52 * 4 + lVar37 * 4 + (long)puVar23 * (long)local_230 + 8)
                      ;
                      *piVar1 = *piVar1 + 1;
                      uVar42 = *local_2a8;
                      uVar10 = *(uint *)(local_2f8._24_8_ +
                                        lVar52 * 4 + lVar37 * 4 + uVar42 * (long)local_230 + 8);
                      piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * lVar47);
                      *piVar1 = *piVar1 + 1;
                      uVar13 = *(uint *)(local_2f8._24_8_ + lVar41 + uVar42 * lVar47);
LAB_0031871e:
                      local_128 = (ulong *)((long)local_128 + lVar52);
                      uVar10 = TTA::MemMerge(uVar10,uVar13);
                      puVar23 = (ulong *)*local_248;
                      piVar1 = (int *)((long)local_280 +
                                      lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                      *piVar1 = *piVar1 + 1;
                      puVar22 = (ulong *)*local_2a8;
                      puVar31 = local_128;
                      puVar24 = (ulong *)local_2f8._24_8_;
                      puVar51 = puVar22;
                      local_308 = local_280;
                      puVar33 = (ulong *)local_2f8._24_8_;
                      plVar39 = local_230;
                      puVar50 = local_218;
                      local_228 = puVar22;
                    }
                    else {
                      piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * (long)local_230);
                      *piVar1 = *piVar1 + 1;
                      puVar22 = (ulong *)*local_2a8;
                      uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 + (long)puVar22 * (long)local_230
                                        );
                      piVar1 = (int *)((long)local_280 +
                                      lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                      *piVar1 = *piVar1 + 1;
                      puVar51 = puVar22;
                      local_228 = puVar22;
                      local_128 = puVar40;
                    }
                  }
                  else {
                    puVar23 = (ulong *)*local_248;
                    piVar1 = (int *)((long)local_280 +
                                    lVar52 * 4 + lVar37 * 4 + (long)puVar23 * (long)local_230 + 8);
                    *piVar1 = *piVar1 + 1;
                    puVar22 = (ulong *)*local_2a8;
                    uVar10 = *(uint *)(local_2f8._24_8_ +
                                      lVar52 * 4 + lVar37 * 4 + (long)puVar22 * (long)local_230 + 8)
                    ;
                    piVar1 = (int *)((long)local_280 +
                                    lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                    *piVar1 = *piVar1 + 1;
                    puVar51 = puVar22;
                    local_228 = puVar22;
                    local_128 = puVar40;
                  }
                }
                goto LAB_0031713b;
              }
              piVar1 = (int *)(local_190 + *local_158 * lVar15 + lVar37 * 4 + 8 + lVar52 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar52 + 2 + lVar36 + lVar37) == '\0') {
                piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar37 * 4 + 8 +
                                lVar52 * 4);
                *piVar1 = *piVar1 + 1;
                puVar23 = (ulong *)*local_248;
                if (*(char *)(lVar52 + 2 +
                             *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_ + lVar37
                             ) == '\0') {
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar42 = *local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar52 * 4 + lVar37 * 4 + uVar42 * (long)local_230 + 8);
                  piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * lVar47);
                  *piVar1 = *piVar1 + 1;
                  local_128 = puVar40;
                  uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                         lVar41 + uVar42 * lVar47));
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  puVar24 = (ulong *)local_2f8._24_8_;
                  puVar51 = puVar22;
                  local_308 = local_280;
                  puVar33 = (ulong *)local_2f8._24_8_;
                  puVar50 = local_218;
                  puVar31 = local_128;
                  local_228 = puVar22;
                  goto LAB_003194b1;
                }
                piVar1 = (int *)((long)local_280 + lVar41 + (long)puVar23 * (long)local_230);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ + lVar41 + (long)puVar22 * (long)local_230);
              }
              else {
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar52 * 4 + lVar37 * 4 + (long)puVar23 * (long)local_230 + 8);
                *piVar1 = *piVar1 + 1;
                puVar22 = (ulong *)*local_2a8;
                uVar10 = *(uint *)(local_2f8._24_8_ +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar22 * (long)local_230 + 8);
              }
              piVar1 = (int *)((long)local_280 +
                              lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              puVar51 = puVar22;
              local_228 = puVar22;
              local_128 = puVar40;
              goto LAB_003194b1;
            }
            piVar1 = (int *)(lVar27 + 0xc + lVar52 * 4);
            *piVar1 = *piVar1 + 1;
            local_218 = puVar40;
            if (*(char *)(lVar41 + 3 + lVar52) == '\0') goto LAB_00318192;
            piVar1 = (int *)((long)local_140 + lVar52 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)local_210 + lVar52) == '\0') {
              puVar40 = (ulong *)((long)local_128 + lVar52);
              piVar1 = (int *)((lVar32 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
              *piVar1 = *piVar1 + 1;
              lVar27 = lVar32 + 0x400000000 >> 0x20;
              lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
              cVar25 = *(char *)(lVar27 + lVar38);
              piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar37 * 4 + 8 + lVar52 * 4);
              *piVar1 = *piVar1 + 1;
              cVar34 = *(char *)(lVar37 + lVar52 + 2 + lVar38);
              puVar50 = (ulong *)(lVar37 + lVar52 + 2);
              local_218 = puVar50;
              if (cVar25 != '\0') {
                puVar31 = puVar40;
                if (cVar34 == '\0') {
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 + lVar27 * 4 + (long)puVar23 * (long)local_230);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (long)puVar22 * (long)local_230
                                    );
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + (long)puVar23 * lVar47 + lVar37 * 4 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar51 = puVar22;
                  local_228 = puVar22;
                  local_128 = puVar40;
                }
                else {
                  piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar37 * 4 + 0xc +
                                  lVar52 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar25 = *(char *)(lVar52 + 3 +
                                    *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_ +
                                    lVar37);
                  puVar23 = (ulong *)*local_248;
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + lVar37 * 4 + (long)puVar23 * (long)local_230 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar22 = (ulong *)*local_2a8;
                  uVar10 = *(uint *)(local_2f8._24_8_ +
                                    lVar52 * 4 + lVar37 * 4 + (long)puVar22 * (long)local_230 + 8);
                  if (cVar25 == '\0') {
                    piVar1 = (int *)((long)local_280 + lVar27 * 4 + (long)puVar23 * (long)local_230)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar13 = *(uint *)(local_2f8._24_8_ +
                                      lVar27 * 4 + (long)puVar22 * (long)local_230);
                    goto LAB_0031871e;
                  }
                  piVar1 = (int *)((long)local_280 +
                                  lVar52 * 4 + (long)puVar23 * lVar47 + lVar37 * 4 + 8);
                  *piVar1 = *piVar1 + 1;
                  puVar51 = puVar22;
                  local_228 = puVar22;
                  local_128 = puVar40;
                }
                goto LAB_0031713b;
              }
              if (cVar34 != '\0') {
                puVar23 = (ulong *)*local_248;
                piVar1 = (int *)((long)local_280 +
                                lVar52 * 4 + (long)puVar23 * (long)local_230 + lVar37 * 4 + 8);
                *piVar1 = *piVar1 + 1;
                local_228 = (ulong *)*local_2a8;
                puVar51 = local_228;
                local_210 = local_228;
                goto LAB_00317801;
              }
              uVar10 = TTA::MemNewLabel();
              puVar23 = (ulong *)*local_248;
              piVar1 = (int *)((long)local_280 +
                              lVar52 * 4 + lVar37 * 4 + (long)puVar23 * lVar47 + 8);
              *piVar1 = *piVar1 + 1;
              puVar22 = (ulong *)*local_2a8;
              puVar24 = (ulong *)local_2f8._24_8_;
              local_308 = local_280;
              local_228 = puVar22;
              puVar33 = (ulong *)local_2f8._24_8_;
              goto LAB_0031a72f;
            }
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 + lVar52 * 4 + (long)puVar23 * (long)local_230 + lVar28
                            );
            *piVar1 = *piVar1 + 1;
            puVar50 = (ulong *)*local_2a8;
            uVar12 = *(undefined4 *)
                      (local_2f8._24_8_ + lVar52 * 4 + (long)puVar50 * (long)local_230 + lVar36);
            piVar1 = (int *)((long)local_280 + lVar52 * 4 + (long)puVar23 * lVar47 + lVar28);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2f8._24_8_ + lVar52 * 4 + (long)puVar50 * lVar47 + lVar36) =
                 uVar12;
            lVar32 = lVar32 + 0x200000000;
            lVar49 = lVar37 + lVar52;
            lVar52 = lVar52 + 2;
            if ((long)local_130 <= lVar49 + 4) {
              uVar10 = iVar11 + (int)lVar52 + 2;
              puVar31 = (ulong *)(ulong)(uint)(iVar11 + (int)lVar52);
              puVar22 = puVar50;
              break;
            }
          } while( true );
        }
        puVar40 = (ulong *)(ulong)uVar10;
        if (iVar29 < (int)uVar10) goto LAB_0031ae76;
        lVar41 = (long)(int)uVar10;
        piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        lVar36 = lVar38 * lVar47 + local_208._24_8_;
        lVar27 = (long)(int)puVar31;
        local_210 = puVar22;
        if (*(char *)(lVar41 + lVar36) == '\0') {
          piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar36 + 3 + lVar27) == '\0') {
            piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * lVar47) = 0;
          }
          else {
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
            if ((*(char *)(lVar27 + 3 + lVar38) == '\0') &&
               (piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar41 * 4),
               *piVar1 = *piVar1 + 1, *(char *)(lVar38 + lVar41) == '\0')) {
              uVar10 = TTA::MemNewLabel();
LAB_0031c56c:
              piVar1 = (int *)((long)local_280 + lVar41 * 4 + *local_248 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + lVar41 * 4 + lVar47 * *local_2a8) = uVar10;
            }
            else {
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)plVar39 * (long)puVar22);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * lVar47) = uVar12;
            }
          }
        }
        else {
          piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar27 + 3 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
            piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            uVar12 = *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)puVar22 * lVar47);
            piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * lVar47) = uVar12;
          }
          else {
            piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar38 = *(long *)local_208._80_8_;
            if (*(char *)(lVar41 + lVar15 * lVar38 + local_208._24_8_) == '\0') {
              piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar41 + local_208._24_8_ + lVar38 * (long)plVar39) == '\0') {
                piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
                *piVar1 = *piVar1 + 1;
                uVar10 = *(uint *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * (long)plVar39);
                piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
                *piVar1 = *piVar1 + 1;
                uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar24 +
                                                       lVar27 * 4 + (long)puVar22 * lVar47));
                goto LAB_0031c56c;
              }
              piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)plVar39);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar24 + lVar27 * 4 + (long)puVar22 * (long)plVar39);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
              *piVar1 = *piVar1 + 1;
            }
            else {
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * (long)plVar39);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * (long)plVar39);
              piVar1 = (int *)((long)local_308 + lVar41 * 4 + lVar47 * (long)puVar23);
              *piVar1 = *piVar1 + 1;
            }
            *(undefined4 *)((long)puVar24 + lVar41 * 4 + (long)puVar22 * lVar47) = uVar12;
          }
        }
        goto LAB_0031c09e;
      }
LAB_0031adfe:
      puVar50 = local_228;
      puVar40 = (ulong *)(ulong)uVar10;
      if (iVar29 < (int)uVar10) goto LAB_0031ae76;
      lVar27 = (long)(int)uVar10;
      piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_;
      lVar36 = lVar38 * lVar47 + local_208._24_8_;
      lVar41 = (long)(int)puVar31;
      if (*(char *)(lVar27 + lVar36) != '\0') {
        piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 3 + local_208._24_8_ + lVar38 * lVar15) != '\0') {
          piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)puVar33 + lVar27 * 4 + (long)local_230 * (long)local_228);
          piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
          *piVar1 = *piVar1 + 1;
          puVar31 = (ulong *)((long)local_228 * lVar47 + (long)puVar33);
          goto LAB_0031bcaa;
        }
        piVar1 = (int *)((long)local_308 + lVar41 * 4 + (long)puVar23 * lVar47);
        *piVar1 = *piVar1 + 1;
        uVar12 = *(undefined4 *)((long)puVar33 + lVar41 * 4 + (long)local_228 * lVar47);
        piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)((long)puVar33 + lVar27 * 4 + (long)local_228 * lVar47) = uVar12;
        goto LAB_0031c09e;
      }
      piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar36 + 3 + lVar41) == '\0') {
        piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)((long)puVar33 + lVar27 * 4 + (long)local_228 * lVar47) = 0;
        goto LAB_0031c09e;
      }
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 3 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0')
      goto LAB_0031c065;
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)puVar33 + lVar27 * 4 + (long)local_230 * (long)local_228);
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)puVar23 * lVar47);
      *piVar1 = *piVar1 + 1;
      puVar31 = (ulong *)((long)local_228 * lVar47 + (long)puVar33);
      goto LAB_00302c61;
    }
    piVar1 = (int *)((long)local_308 +
                    lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
    *piVar1 = *piVar1 + 1;
    local_228 = local_140;
    local_138 = puVar24;
    puVar51 = puVar22;
    goto LAB_00317801;
  }
  piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)local_228 * 4 + 0xc + lVar41 * 4
                  );
  *piVar1 = *piVar1 + 1;
  lVar27 = *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_;
  cVar25 = *(char *)((long)local_228 + lVar41 + 3 + lVar27);
  puVar31 = puVar40;
  if (cVar34 == '\0') {
    if (cVar25 == '\0') {
      piVar1 = (int *)((long)local_308 + lVar37 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)puVar24 + lVar37 + (long)puVar22 * (long)local_230);
      piVar1 = (int *)((long)local_308 + lVar38 * 4 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar24 +
                                             lVar38 * 4 + (long)puVar22 * (long)local_230));
      puVar23 = (ulong *)*local_248;
      lVar38 = (long)local_280 + (long)local_228 * 4 + (long)puVar23 * lVar47;
    }
    else {
      piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)local_228 * 4 + 8 +
                      lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = lVar36 >> 0x20;
      if (*(char *)((long)local_228 + lVar41 + 2 + lVar27) != '\0') {
        piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)puVar23 * (long)local_230);
        *piVar1 = *piVar1 + 1;
        uVar10 = *(uint *)((long)puVar24 + lVar36 * 4 + (long)puVar22 * (long)local_230);
        piVar1 = (int *)((long)local_308 +
                        lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
        local_228 = local_140;
        puVar51 = puVar22;
        goto LAB_0031713b;
      }
      piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)puVar24 + lVar36 * 4 + (long)puVar22 * (long)local_230);
      piVar1 = (int *)((long)local_308 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
      *piVar1 = *piVar1 + 1;
      uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar24 +
                                             lVar41 * 4 +
                                             (long)local_228 * 4 + (long)puVar22 * (long)local_230 +
                                             8));
      puVar23 = (ulong *)*local_248;
      lVar38 = (long)local_280 + (long)puVar30 * 4 + (long)puVar23 * lVar47;
    }
  }
  else {
    if (cVar25 != '\0') {
      piVar1 = (int *)((long)local_308 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)puVar24 +
                        lVar41 * 4 + (long)local_228 * 4 + (long)puVar51 * (long)local_230 + 8);
      piVar1 = (int *)((long)local_308 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * lVar47 + 8);
      *piVar1 = *piVar1 + 1;
      local_228 = local_140;
      puVar51 = puVar22;
      goto LAB_0031713b;
    }
    piVar1 = (int *)((long)local_308 +
                    lVar41 * 4 + (long)local_228 * 4 + (long)puVar23 * (long)local_230 + 8);
    *piVar1 = *piVar1 + 1;
    uVar10 = *(uint *)((long)puVar24 +
                      lVar41 * 4 + (long)local_228 * 4 + (long)puVar22 * (long)local_230 + 8);
    piVar1 = (int *)((long)local_308 + lVar38 * 4 + (long)puVar23 * (long)local_230);
    *piVar1 = *piVar1 + 1;
    uVar10 = TTA::MemMerge(uVar10,*(uint *)((long)puVar24 +
                                           lVar38 * 4 + (long)puVar22 * (long)local_230));
    puVar23 = (ulong *)*local_248;
    lVar38 = (long)local_280 + (long)puVar30 * 4 + (long)puVar23 * lVar47;
  }
  piVar1 = (int *)(lVar38 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  puVar22 = (ulong *)*local_2a8;
  puVar31 = local_138;
  puVar24 = (ulong *)local_2f8._24_8_;
  puVar51 = puVar22;
  local_308 = local_280;
  puVar33 = (ulong *)local_2f8._24_8_;
  plVar39 = local_230;
  puVar50 = local_218;
  local_228 = puVar22;
  goto LAB_0031713b;
LAB_00318192:
  local_220 = (ulong *)*local_248;
  piVar1 = (int *)((long)local_280 + lVar52 * 4 + (long)local_220 * lVar47 + lVar37 * 4 + 8);
  *piVar1 = *piVar1 + 1;
  local_140 = (ulong *)*local_2a8;
  puVar22 = local_140;
  puVar30 = (ulong *)(ulong)(uint)((int)local_128 + (int)lVar52);
  puVar31 = (ulong *)(lVar37 + lVar52 + 2);
LAB_00315b88:
  *(undefined4 *)((long)puVar24 + (long)puVar31 * 4 + (long)puVar22 * lVar47) = 0;
  iVar11 = (int)puVar30;
  iVar20 = iVar11 + 2;
  local_138 = puVar33;
  if (iVar20 < iVar29) {
    local_228 = local_158;
    puVar51 = (ulong *)(long)iVar11;
    puVar40 = (ulong *)((long)puVar51 + 2);
    lVar27 = (long)puVar51 << 0x20;
    local_138 = (ulong *)local_2f8._24_8_;
    local_308 = local_280;
    lVar41 = 0;
    while (piVar1 = (int *)(local_190 + uVar42 * lVar47 + (long)puVar51 * 4 + 8 + lVar41 * 4),
          *piVar1 = *piVar1 + 1, puVar24 = (ulong *)local_2f8._24_8_,
          puVar33 = (ulong *)local_2f8._24_8_, plVar39 = local_230, local_218 = puVar30,
          local_220 = puVar51,
          *(char *)((long)puVar51 + lVar41 + local_208._24_8_ + lVar38 * lVar47 + 2) == '\0') {
      piVar1 = (int *)(*local_158 * lVar47 + local_190 + (long)puVar51 * 4 + 0xc + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)puVar51 +
                   lVar41 + *(long *)local_208._80_8_ * lVar47 + local_208._24_8_ + 3) != '\0')
      goto LAB_00315e27;
      local_220 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 +
                      lVar41 * 4 + (long)local_220 * lVar47 + (long)puVar51 * 4 + 8);
      *piVar1 = *piVar1 + 1;
      local_140 = (ulong *)*local_2a8;
      *(undefined4 *)
       (local_2f8._24_8_ + lVar41 * 4 + (long)local_140 * lVar47 + (long)puVar51 * 4 + 8) = 0;
      lVar27 = lVar27 + 0x200000000;
      lVar36 = lVar41 + 4;
      lVar41 = lVar41 + 2;
      if ((long)local_130 <= (long)puVar51 + lVar36) {
        iVar20 = iVar11 + (int)lVar41 + 2;
        puVar30 = (ulong *)(ulong)(uint)(iVar11 + (int)lVar41);
        goto LAB_0031aaf8;
      }
    }
    puVar31 = (ulong *)((long)puVar40 + lVar41);
    lVar36 = lVar27 + 0x300000000 >> 0x20;
    piVar1 = (int *)((lVar27 + 0x300000000 >> 0x1e) + *local_158 * lVar15 + local_190);
    *piVar1 = *piVar1 + 1;
    lVar38 = *(long *)local_208._80_8_;
    lVar37 = lVar38 * lVar15 + local_208._24_8_;
    puVar50 = (ulong *)((long)puVar51 + lVar41 + 2);
    lVar28 = lVar27 >> 0x1e;
    local_218 = puVar50;
    local_140 = puVar31;
    if (*(char *)(lVar36 + lVar37) != '\0') {
      piVar1 = (int *)(local_190 + *local_158 * lVar15 + (long)puVar51 * 4 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)puVar51 + lVar41 + 2 + lVar37) == '\0') {
        piVar1 = (int *)((lVar27 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
        *piVar1 = *piVar1 + 1;
        lVar38 = *(long *)local_208._80_8_;
        if (*(char *)((lVar27 + 0x100000000 >> 0x20) + lVar38 * lVar15 + local_208._24_8_) != '\0')
        {
          piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar51 * 4 + 8 +
                          lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          cVar25 = *(char *)((long)puVar51 +
                            lVar41 + 2 + lVar38 * (long)local_230 + local_208._24_8_);
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 + lVar28 + (long)puVar23 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          puVar22 = (ulong *)*local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 + (long)puVar22 * (long)local_230);
          if (cVar25 == '\0') {
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
            *piVar1 = *piVar1 + 1;
            uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                   lVar41 * 4 +
                                                   (long)puVar51 * 4 +
                                                   (long)puVar22 * (long)local_230 + 8));
            puVar23 = (ulong *)*local_248;
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
            *piVar1 = *piVar1 + 1;
            puVar22 = (ulong *)*local_2a8;
            puVar24 = (ulong *)local_2f8._24_8_;
            puVar51 = puVar22;
            local_308 = local_280;
            puVar33 = (ulong *)local_2f8._24_8_;
            puVar50 = local_218;
            puVar31 = local_140;
            local_228 = puVar22;
          }
          else {
            piVar1 = (int *)((long)local_280 +
                            lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
            *piVar1 = *piVar1 + 1;
            puVar51 = puVar22;
            local_228 = puVar22;
          }
          goto LAB_003194b1;
        }
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar22 * (long)local_230 + 8);
      }
      else {
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar22 * (long)local_230 + 8);
      }
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8
                      );
      *piVar1 = *piVar1 + 1;
      puVar51 = puVar22;
      local_228 = puVar22;
      local_218 = puVar30;
      goto LAB_003194b1;
    }
    piVar1 = (int *)(local_190 + *local_158 * lVar47 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    lVar37 = *local_158 * lVar15 + local_190;
    if (*(char *)(lVar36 + local_208._24_8_ + lVar38 * lVar47) == '\0') {
      piVar1 = (int *)(lVar37 + (long)puVar51 * 4 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
      if (*(char *)((long)puVar51 + lVar41 + 2 + lVar38) == '\0') {
        piVar1 = (int *)((lVar27 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar38 + (lVar27 + 0x100000000 >> 0x20)) == '\0') {
          local_218 = puVar30;
          uVar10 = TTA::MemNewLabel();
          piVar1 = (int *)((long)local_280 +
                          lVar41 * 4 + (long)puVar51 * 4 + *local_248 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar51 * 4 + *local_2a8 * lVar47 + 8) =
               uVar10;
          puVar40 = local_140;
          plVar39 = local_230;
        }
        else {
          uVar42 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar28 + uVar42 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar12 = *(undefined4 *)(local_2f8._24_8_ + lVar28 + uVar19 * (long)local_230);
          piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + uVar42 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar51 * 4 + uVar19 * lVar47 + 8) =
               uVar12;
          puVar40 = puVar31;
          local_218 = puVar30;
        }
      }
      else {
        uVar42 = *local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + uVar42 * (long)local_230 + 8);
        *piVar1 = *piVar1 + 1;
        uVar19 = *local_2a8;
        uVar12 = *(undefined4 *)
                  (local_2f8._24_8_ + lVar41 * 4 + (long)puVar51 * 4 + uVar19 * (long)local_230 + 8)
        ;
        piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + uVar42 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2f8._24_8_ + lVar41 * 4 + (long)puVar51 * 4 + uVar19 * lVar47 + 8) =
             uVar12;
        puVar40 = puVar31;
        local_218 = puVar30;
      }
      goto LAB_0031a55c;
    }
    piVar1 = (int *)(lVar37 + (lVar27 + 0x400000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    lVar38 = lVar27 + 0x400000000 >> 0x20;
    lVar37 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
    cVar25 = *(char *)(lVar38 + lVar37);
    piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)puVar51 * 4 + 8 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    cVar34 = *(char *)((long)puVar51 + lVar41 + 2 + lVar37);
    if (cVar25 != '\0') {
      if (cVar34 == '\0') {
        piVar1 = (int *)((lVar27 + 0x100000000 >> 0x1e) + local_190 + *local_158 * lVar15);
        *piVar1 = *piVar1 + 1;
        lVar37 = *(long *)local_208._80_8_;
        if (*(char *)((lVar27 + 0x100000000 >> 0x20) + lVar37 * lVar15 + local_208._24_8_) == '\0')
        {
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + (long)puVar23 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          local_228 = (ulong *)*local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (long)local_228 * (long)local_230);
          piVar1 = (int *)((long)local_280 +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          puVar22 = local_228;
          puVar51 = local_228;
          local_218 = puVar30;
          goto LAB_0031713b;
        }
        piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar36 + local_208._24_8_ + lVar37 * (long)local_230) == '\0') {
          uVar42 = *local_248;
          piVar1 = (int *)((long)local_280 + lVar28 + uVar42 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          uVar19 = *local_2a8;
          uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 + uVar19 * (long)local_230);
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + uVar42 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          local_218 = puVar30;
          uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                                 lVar38 * 4 + uVar19 * (long)local_230));
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          local_228 = (ulong *)*local_2a8;
          puVar22 = local_228;
          puVar31 = local_140;
          puVar24 = (ulong *)local_2f8._24_8_;
          puVar51 = local_228;
          local_308 = local_280;
          puVar33 = (ulong *)local_2f8._24_8_;
          plVar39 = local_230;
          goto LAB_0031713b;
        }
        piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar51 * 4 + 8 +
                        lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)((long)puVar51 +
                          lVar41 + 2 +
                          *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_);
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 + lVar28 + (long)puVar23 * (long)local_230);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 + (long)puVar22 * (long)local_230);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ +
                            lVar41 * 4 + (long)puVar51 * 4 + (long)puVar22 * (long)local_230 + 8);
          goto LAB_00316803;
        }
      }
      else {
        piVar1 = (int *)(local_190 + *local_158 * (long)local_230 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar36 + *(long *)local_208._80_8_ * (long)local_230 + local_208._24_8_);
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        uVar10 = *(uint *)(local_2f8._24_8_ +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar22 * (long)local_230 + 8);
        if (cVar25 == '\0') {
          piVar1 = (int *)((long)local_280 + lVar38 * 4 + (long)puVar23 * (long)local_230);
          *piVar1 = *piVar1 + 1;
          uVar13 = *(uint *)(local_2f8._24_8_ + lVar38 * 4 + (long)puVar22 * (long)local_230);
LAB_00316803:
          uVar10 = TTA::MemMerge(uVar10,uVar13);
          puVar23 = (ulong *)*local_248;
          piVar1 = (int *)((long)local_280 +
                          lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
          *piVar1 = *piVar1 + 1;
          puVar22 = (ulong *)*local_2a8;
          puVar31 = local_140;
          puVar24 = (ulong *)local_2f8._24_8_;
          puVar51 = puVar22;
          local_308 = local_280;
          puVar33 = (ulong *)local_2f8._24_8_;
          plVar39 = local_230;
          puVar50 = local_218;
          local_228 = puVar22;
          goto LAB_0031713b;
        }
      }
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8
                      );
      *piVar1 = *piVar1 + 1;
      goto LAB_003161c0;
    }
    if (cVar34 != '\0') {
      puVar23 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 +
                      lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
      *piVar1 = *piVar1 + 1;
      local_228 = (ulong *)*local_2a8;
      puVar51 = local_228;
      puVar40 = puVar31;
      local_210 = local_228;
      goto LAB_00317801;
    }
    piVar1 = (int *)((lVar27 + 0x100000000 >> 0x1e) + *local_158 * lVar15 + local_190);
    *piVar1 = *piVar1 + 1;
    if (*(char *)((lVar27 + 0x100000000 >> 0x20) +
                 *(long *)local_208._80_8_ * lVar15 + local_208._24_8_) == '\0') {
      local_218 = puVar30;
      uVar10 = TTA::MemNewLabel();
      puVar23 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 +
                      lVar41 * 4 + (long)local_220 * 4 + (long)puVar23 * lVar47 + 8);
      *piVar1 = *piVar1 + 1;
      puVar22 = (ulong *)*local_2a8;
      puVar31 = local_140;
    }
    else {
      puVar23 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 + lVar28 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      puVar22 = (ulong *)*local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar28 + (long)puVar22 * (long)local_230);
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8
                      );
      *piVar1 = *piVar1 + 1;
    }
LAB_0031a6d3:
    puVar24 = (ulong *)local_2f8._24_8_;
    puVar31 = (ulong *)((ulong)puVar31 & 0xffffffff);
    local_308 = local_280;
    local_228 = puVar22;
    puVar33 = (ulong *)local_2f8._24_8_;
    goto LAB_00316aeb;
  }
LAB_0031aaf8:
  lVar27 = (long)iVar20;
  piVar1 = (int *)(*local_158 * lVar47 + local_190 + lVar27 * 4);
  *piVar1 = *piVar1 + 1;
  lVar38 = *(long *)local_208._80_8_;
  lVar41 = lVar38 * lVar47 + local_208._24_8_;
  cVar25 = *(char *)(lVar27 + lVar41);
  if (iVar29 < iVar20) {
    if (cVar25 == '\0') {
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
      *piVar1 = *piVar1 + 1;
LAB_0031bd27:
      puVar40 = (ulong *)((long)local_138 + (long)local_140 * lVar47);
      goto LAB_00302db4;
    }
    piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar27 + local_208._24_8_ + lVar38 * lVar15) == '\0') {
      lVar38 = (long)(int)puVar30;
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + 4 + lVar38 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar38 + 1 + lVar15 * *(long *)local_208._80_8_ + local_208._24_8_) == '\0')
      goto LAB_0031c065;
      piVar1 = (int *)((long)local_308 + lVar38 * 4 + (long)local_220 * (long)plVar39);
      *piVar1 = *piVar1 + 1;
      uVar12 = *(undefined4 *)((long)local_138 + lVar38 * 4 + (long)plVar39 * (long)local_140);
      goto LAB_0031b6e9;
    }
  }
  else {
    lVar36 = (long)(int)puVar30;
    if (cVar25 != '\0') {
      piVar1 = (int *)(local_190 + *local_158 * lVar15 + 0xc + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)(lVar36 + 3 + local_208._24_8_ + lVar38 * lVar15);
      piVar1 = (int *)(*local_158 * lVar15 + local_190 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
      if (cVar25 == '\0') {
        if (*(char *)(lVar27 + lVar38) == '\0') {
          piVar1 = (int *)(lVar15 * *local_158 + local_190 + 4 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar38 + 1 + lVar36) == '\0') goto LAB_0031c065;
          piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)local_220 * (long)plVar39);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(uint *)((long)local_138 + lVar36 * 4 + (long)plVar39 * (long)local_140);
          piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
          *piVar1 = *piVar1 + 1;
          puVar31 = (ulong *)((long)local_140 * lVar47 + (long)local_138);
          goto LAB_00302c61;
        }
      }
      else if ((*(char *)(lVar27 + lVar38) == '\0') &&
              (piVar1 = (int *)(lVar15 * *local_158 + local_190 + 4 + lVar36 * 4),
              *piVar1 = *piVar1 + 1, *(char *)(lVar38 + 1 + lVar36) != '\0')) {
        piVar1 = (int *)(*local_158 * (long)plVar39 + local_190 + lVar27 * 4);
        *piVar1 = *piVar1 + 1;
        cVar25 = *(char *)(lVar27 + *(long *)local_208._80_8_ * (long)plVar39 + local_208._24_8_);
        piVar1 = (int *)((long)local_308 + lVar36 * 4 + (long)local_220 * (long)plVar39);
        *piVar1 = *piVar1 + 1;
        uVar10 = *(uint *)((long)local_138 + lVar36 * 4 + (long)plVar39 * (long)local_140);
        if (cVar25 != '\0') {
          piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
          *piVar1 = *piVar1 + 1;
          *(uint *)((long)local_138 + lVar27 * 4 + (long)local_140 * lVar47) = uVar10;
          goto LAB_0031c09e;
        }
        piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * (long)plVar39);
        *piVar1 = *piVar1 + 1;
        uVar13 = *(uint *)((long)local_138 + lVar27 * 4 + (long)plVar39 * (long)local_140);
        goto LAB_0031bcb0;
      }
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * (long)plVar39);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(uint *)((long)local_138 + lVar27 * 4 + (long)plVar39 * (long)local_140);
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
      *piVar1 = *piVar1 + 1;
      puVar40 = (ulong *)((long)local_140 * lVar47 + (long)local_138);
      goto LAB_0031b8ea;
    }
    piVar1 = (int *)(local_190 + *local_158 * lVar47 + 0xc + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 3 + lVar36) == '\0') {
      piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
      *piVar1 = *piVar1 + 1;
      goto LAB_0031bd27;
    }
    piVar1 = (int *)(*local_158 * lVar15 + local_190 + 0xc + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
    if ((*(char *)(lVar36 + 3 + lVar38) == '\0') &&
       (piVar1 = (int *)(lVar15 * *local_158 + local_190 + lVar27 * 4), *piVar1 = *piVar1 + 1,
       *(char *)(lVar38 + lVar27) == '\0')) goto LAB_0031c065;
  }
  piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * (long)plVar39);
  *piVar1 = *piVar1 + 1;
  uVar12 = *(undefined4 *)((long)local_138 + lVar27 * 4 + (long)plVar39 * (long)local_140);
LAB_0031b6e9:
  piVar1 = (int *)((long)local_308 + lVar27 * 4 + (long)local_220 * lVar47);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)((long)local_138 + lVar27 * 4 + (long)local_140 * lVar47) = uVar12;
  goto LAB_0031c09e;
LAB_00315e27:
  puVar31 = (ulong *)((long)puVar40 + lVar41);
  piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)puVar51 * 4 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar38 = *(long *)local_208._80_8_ * lVar15 + local_208._24_8_;
  puVar50 = (ulong *)((long)puVar51 + lVar41 + 2);
  local_140 = puVar40;
  if (*(char *)((long)puVar51 + lVar38 + lVar41 + 3) == '\0') goto LAB_00316077;
  puVar23 = (ulong *)*local_248;
  piVar1 = (int *)((long)local_280 +
                  lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
  *piVar1 = *piVar1 + 1;
  puVar51 = (ulong *)*local_2a8;
  puVar40 = puVar31;
  local_228 = puVar51;
  local_210 = puVar51;
  goto LAB_00317e90;
LAB_00316077:
  piVar1 = (int *)((lVar27 + 0x400000000 >> 0x1e) + *local_158 * lVar15 + local_190);
  *piVar1 = *piVar1 + 1;
  lVar27 = lVar27 + 0x400000000 >> 0x20;
  cVar25 = *(char *)(lVar38 + lVar27);
  piVar1 = (int *)(*local_158 * lVar15 + local_190 + (long)puVar51 * 4 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar38 = *(long *)local_208._80_8_;
  cVar34 = *(char *)((long)puVar51 + lVar41 + 2 + lVar38 * lVar15 + local_208._24_8_);
  if (cVar25 != '\0') {
    if (cVar34 == '\0') {
      puVar23 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 + lVar27 * 4 + (long)puVar23 * (long)local_230);
      *piVar1 = *piVar1 + 1;
      local_228 = (ulong *)*local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ + lVar27 * 4 + (long)local_228 * (long)local_230);
      piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8
                      );
      *piVar1 = *piVar1 + 1;
      puVar22 = local_228;
      puVar51 = local_228;
    }
    else {
      piVar1 = (int *)(*local_158 * (long)local_230 + local_190 + (long)puVar51 * 4 + 0xc +
                      lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      cVar25 = *(char *)((long)puVar51 + lVar41 + 3 + lVar38 * (long)local_230 + local_208._24_8_);
      puVar23 = (ulong *)*local_248;
      piVar1 = (int *)((long)local_280 +
                      lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
      *piVar1 = *piVar1 + 1;
      puVar22 = (ulong *)*local_2a8;
      uVar10 = *(uint *)(local_2f8._24_8_ +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar22 * (long)local_230 + 8);
      local_218 = puVar50;
      if (cVar25 == '\0') {
        piVar1 = (int *)((long)local_280 + lVar27 * 4 + (long)puVar23 * (long)local_230);
        *piVar1 = *piVar1 + 1;
        uVar10 = TTA::MemMerge(uVar10,*(uint *)(local_2f8._24_8_ +
                                               lVar27 * 4 + (long)puVar22 * (long)local_230));
        puVar23 = (ulong *)*local_248;
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
        puVar22 = (ulong *)*local_2a8;
        puVar24 = (ulong *)local_2f8._24_8_;
        puVar51 = puVar22;
        local_308 = local_280;
        puVar33 = (ulong *)local_2f8._24_8_;
        plVar39 = local_230;
        puVar50 = local_218;
        local_228 = puVar22;
      }
      else {
        piVar1 = (int *)((long)local_280 +
                        lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * lVar47 + 8);
        *piVar1 = *piVar1 + 1;
LAB_003161c0:
        puVar31 = (ulong *)((long)puVar40 + lVar41);
        puVar51 = puVar22;
        puVar50 = local_218;
        local_228 = puVar22;
      }
    }
    goto LAB_0031713b;
  }
  if (cVar34 != '\0') {
    puVar23 = (ulong *)*local_248;
    piVar1 = (int *)((long)local_280 +
                    lVar41 * 4 + (long)puVar51 * 4 + (long)puVar23 * (long)local_230 + 8);
    *piVar1 = *piVar1 + 1;
    local_228 = (ulong *)*local_2a8;
    puVar51 = local_228;
    puVar40 = (ulong *)((ulong)puVar31 & 0xffffffff);
    local_210 = local_228;
    goto LAB_00317801;
  }
  uVar10 = TTA::MemNewLabel();
  puVar23 = (ulong *)*local_248;
  piVar1 = (int *)((long)local_280 + lVar41 * 4 + (long)local_220 * 4 + (long)puVar23 * lVar47 + 8);
  *piVar1 = *piVar1 + 1;
  puVar22 = (ulong *)*local_2a8;
  puVar24 = (ulong *)local_2f8._24_8_;
  local_308 = local_280;
  local_228 = puVar22;
  puVar33 = (ulong *)local_2f8._24_8_;
  goto LAB_00316aeb;
LAB_00302487:
  piVar1 = (int *)((long)puVar50 + (long)(iVar11 + iVar43) * 4);
  *piVar1 = *piVar1 + 1;
  uVar12 = *(undefined4 *)((long)puVar40 + (long)(iVar11 + iVar43) * 4);
  piVar1 = (int *)((long)puVar50 + lVar15 * 4 + uVar19 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)((long)puVar40 + lVar15 * 4 + uVar19 * 4) = uVar12;
LAB_003024e5:
  iVar20 = iVar11 + iVar43 + 2;
LAB_003024ef:
  iVar11 = iVar20 + 2;
  if (iVar29 <= iVar11) goto code_r0x003024fa;
  goto LAB_0030235f;
code_r0x003024fa:
  lVar47 = (long)(iVar20 + 3);
LAB_00302b44:
  lVar27 = (long)iVar11;
  piVar1 = (int *)(local_190 + lVar27 * 4);
  *piVar1 = *piVar1 + 1;
  cVar25 = *(char *)(local_208._24_8_ + lVar27);
  if (iVar29 < iVar11) {
joined_r0x00302c46:
    if (cVar25 == '\0') {
      piVar1 = (int *)((long)local_280 + lVar27 * 4);
      *piVar1 = *piVar1 + 1;
      puVar40 = (ulong *)local_2f8._24_8_;
LAB_00302db4:
      *(undefined4 *)((long)puVar40 + lVar27 * 4) = 0;
      goto LAB_0031c09e;
    }
  }
  else {
    piVar1 = (int *)(local_190 + lVar47 * 4);
    *piVar1 = *piVar1 + 1;
    if (cVar25 == '\0') {
      cVar25 = *(char *)(local_208._24_8_ + lVar47);
      goto joined_r0x00302c46;
    }
  }
  uVar10 = TTA::MemNewLabel();
  piVar1 = (int *)((long)local_280 + lVar27 * 4);
  *piVar1 = *piVar1 + 1;
  puVar31 = (ulong *)local_2f8._24_8_;
LAB_00302c61:
  *(uint *)((long)puVar31 + lVar27 * 4) = uVar10;
LAB_0031c09e:
  uVar10 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  if (0 < iVar3) {
    local_228 = local_280;
    local_210 = local_248;
    local_140 = (ulong *)local_2f8._24_8_;
    local_218 = local_2a8;
    local_220 = (ulong *)0x1;
    uVar42 = 0;
    do {
      piVar8 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar18 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        uVar19 = uVar42 | 1;
        local_130 = TTA::mem_rtable_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_230 = (long *)local_208._80_8_;
        lVar15 = *local_248 * (long)local_220;
        lVar41 = *local_2a8 * (long)local_220;
        lVar27 = *local_2a8 * uVar42;
        lVar38 = *local_248 * uVar42;
        lVar47 = 1;
        do {
          iVar3 = *(int *)((long)local_280 + lVar47 * 4 + lVar38 + -4);
          *(int *)((long)local_280 + lVar47 * 4 + lVar38 + -4) = iVar3 + 1;
          lVar36 = (long)*(int *)(local_2f8._24_8_ + lVar47 * 4 + lVar27 + -4);
          if (lVar36 < 1) {
            *(int *)((long)local_280 + lVar47 * 4 + lVar38 + -4) = iVar3 + 2;
            *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar27 + -4) = 0;
            if (lVar47 < lVar44) {
              piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar27) = 0;
              if (uVar19 < uVar26) {
                piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15 + -4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar41 + -4) = 0;
                piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar41) = 0;
              }
            }
            else if (uVar19 < uVar26) {
              piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15 + -4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar41 + -4) = 0;
            }
          }
          else {
            piVar8[lVar36] = piVar8[lVar36] + 1;
            uVar10 = puVar18[lVar36];
            uVar17 = *local_158;
            lVar37 = uVar42 * uVar17 + local_190;
            piVar1 = (int *)(lVar37 + -4 + lVar47 * 4);
            *piVar1 = *piVar1 + 1;
            lVar36 = *(long *)local_208._80_8_;
            lVar28 = uVar42 * lVar36 + local_208._24_8_;
            uVar13 = uVar10;
            if (*(char *)(lVar47 + -1 + lVar28) == '\0') {
              uVar13 = 0;
            }
            piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar38 + -4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2f8._24_8_ + lVar47 * 4 + lVar27 + -4) = uVar13;
            if (lVar47 < lVar44) {
              piVar1 = (int *)(lVar37 + lVar47 * 4);
              *piVar1 = *piVar1 + 1;
              uVar13 = uVar10;
              if (*(char *)(lVar47 + lVar28) == '\0') {
                uVar13 = 0;
              }
              piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar38);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2f8._24_8_ + lVar47 * 4 + lVar27) = uVar13;
              if (uVar19 < uVar26) {
                lVar28 = uVar17 * (long)local_220 + local_190;
                piVar1 = (int *)(lVar28 + -4 + lVar47 * 4);
                *piVar1 = *piVar1 + 1;
                lVar36 = lVar36 * (long)local_220 + local_208._24_8_;
                uVar13 = uVar10;
                if (*(char *)(lVar47 + -1 + lVar36) == '\0') {
                  uVar13 = 0;
                }
                piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15 + -4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(local_2f8._24_8_ + lVar47 * 4 + lVar41 + -4) = uVar13;
                piVar1 = (int *)(lVar28 + lVar47 * 4);
                *piVar1 = *piVar1 + 1;
                cVar25 = *(char *)(lVar47 + lVar36);
                piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15);
                *piVar1 = *piVar1 + 1;
                if (cVar25 == '\0') {
                  *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar41) = 0;
                }
                else {
                  *(uint *)(local_2f8._24_8_ + lVar47 * 4 + lVar41) = uVar10;
                }
              }
            }
            else if (uVar19 < uVar26) {
              piVar1 = (int *)(uVar17 * (long)local_220 + local_190 + -4 + lVar47 * 4);
              *piVar1 = *piVar1 + 1;
              cVar25 = *(char *)(lVar47 + -1 + lVar36 * (long)local_220 + local_208._24_8_);
              piVar1 = (int *)((long)local_280 + lVar47 * 4 + lVar15 + -4);
              *piVar1 = *piVar1 + 1;
              if (cVar25 == '\0') {
                *(undefined4 *)(local_2f8._24_8_ + lVar47 * 4 + lVar41 + -4) = 0;
              }
              else {
                *(uint *)(local_2f8._24_8_ + lVar47 * 4 + lVar41 + -4) = uVar10;
              }
            }
          }
          lVar36 = lVar47 + 1;
          lVar47 = lVar47 + 2;
        } while (lVar36 < lVar44);
      }
      uVar42 = uVar42 + 2;
      local_220 = (ulong *)((long)local_220 + 2);
    } while (uVar42 < uVar26);
  }
  pauVar16 = (undefined1 (*) [16])operator_new(0x20);
  pvVar9 = local_118;
  pauVar16[1] = (undefined1  [16])0x0;
  *pauVar16 = (undefined1  [16])0x0;
  puVar6 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar16;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar16 + 2);
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar16 + 2);
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar7 - (long)puVar6);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_1a0;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_290;
  cv::sum((_InputArray *)&local_f0);
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_f0._0_8_ >> 0x3f & (long)((double)local_f0._0_8_ - 9.223372036854776e+18)
       | (long)(double)local_f0._0_8_;
  dVar53 = TTA::MemTotalAccesses();
  (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar53 >> 0x3f & (long)(dVar53 - 9.223372036854776e+18) | (long)dVar53;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2f8);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_290);
  cv::Mat::~Mat((Mat *)(local_2f8 + 8));
  cv::Mat::~Mat(local_1a0);
  cv::Mat::~Mat((Mat *)(local_208 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }